

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp_x86::forward
          (BinaryOp_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *this_00;
  float *pfVar1;
  undefined1 (*pauVar2) [12];
  undefined4 uVar3;
  int _elempack;
  int iVar4;
  Mat *this_01;
  Mat *this_02;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [12];
  undefined8 uVar21;
  int y;
  int iVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  undefined1 (*pauVar27) [16];
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  long lVar32;
  undefined8 *puVar33;
  long lVar34;
  uint uVar35;
  float *pfVar36;
  undefined1 (*pauVar37) [16];
  float *pfVar38;
  ulong uVar39;
  undefined1 (*pauVar40) [16];
  uint uVar41;
  uint uVar42;
  ulong uVar43;
  ulong uVar44;
  bool bVar45;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined8 extraout_XMM0_Qb_07;
  undefined8 extraout_XMM0_Qb_08;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined8 extraout_XMM0_Qb_09;
  undefined8 extraout_XMM0_Qb_10;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined8 extraout_XMM0_Qb_11;
  undefined8 extraout_XMM0_Qb_12;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined8 extraout_XMM0_Qb_13;
  undefined8 extraout_XMM0_Qb_14;
  undefined8 extraout_XMM0_Qb_15;
  undefined8 extraout_XMM0_Qb_16;
  undefined8 extraout_XMM0_Qb_17;
  undefined8 extraout_XMM0_Qb_18;
  undefined8 extraout_XMM0_Qb_19;
  undefined8 extraout_XMM0_Qb_20;
  undefined8 extraout_XMM0_Qb_21;
  float fVar56;
  undefined1 in_XMM1 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar121;
  float fVar122;
  float fVar126;
  float fVar128;
  undefined1 in_XMM3 [16];
  float fVar130;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar127;
  float fVar129;
  undefined1 auVar125 [16];
  __m128 afVar131;
  int local_e8;
  binary_op_pow_pack4 op;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  __m128 _b0;
  int local_58;
  __m128 _p;
  
  this_01 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar22 = this_01->elempack;
  _elempack = this_01[1].elempack;
  if ((_elempack != 4 && iVar22 != 4) ||
     (8 < *(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86[-3]))) {
    iVar22 = BinaryOp::forward((BinaryOp *)
                               ((long)&this->_vptr_BinaryOp_x86 + (long)this->_vptr_BinaryOp_x86[-3]
                               ),bottom_blobs,top_blobs,opt);
    return iVar22;
  }
  this_00 = this_01 + 1;
  this_02 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  switch(*(uint *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86[-3])) {
  case 0:
    uVar35 = this_01->w;
    sVar5 = this_01->elemsize;
    uVar29 = this_01[1].w;
    uVar31 = this_01[1].h;
    uVar30 = this_01[1].c;
    uVar23 = uVar31 * uVar29;
    sVar6 = this_01[1].elemsize;
    iVar4 = this_01->dims;
    if (iVar4 == 1) {
      iVar4 = this_01[1].dims;
      if (iVar22 != 1 || uVar35 != 1) {
        if (iVar4 == 1) {
          ncnn::Mat::create(this_02,uVar35,sVar5,iVar22,opt->blob_allocator);
          pvVar9 = this_02->data;
          if (pvVar9 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (_elempack == 1 && this_01[1].w == 1) {
            pvVar7 = this_01->data;
            fVar56 = *this_01[1].data;
            if ((int)uVar35 < 1) {
              uVar35 = 0;
            }
            lVar25 = 0;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              pfVar36 = (float *)((long)pvVar7 + lVar25);
              fVar122 = pfVar36[1];
              fVar127 = pfVar36[2];
              fVar129 = pfVar36[3];
              pfVar38 = (float *)((long)pvVar9 + lVar25);
              *pfVar38 = *pfVar36 + fVar56;
              pfVar38[1] = fVar122 + fVar56;
              pfVar38[2] = fVar127 + fVar56;
              pfVar38[3] = fVar129 + fVar56;
              lVar25 = lVar25 + 0x10;
            }
            return 0;
          }
          pvVar7 = this_01->data;
          pvVar8 = this_01[1].data;
          if ((int)uVar35 < 1) {
            uVar35 = 0;
          }
          lVar25 = 0;
          while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
            pfVar36 = (float *)((long)pvVar7 + lVar25);
            fVar56 = pfVar36[1];
            fVar122 = pfVar36[2];
            fVar127 = pfVar36[3];
            pfVar38 = (float *)((long)pvVar8 + lVar25);
            fVar129 = pfVar38[1];
            fVar121 = pfVar38[2];
            fVar126 = pfVar38[3];
            pfVar1 = (float *)((long)pvVar9 + lVar25);
            *pfVar1 = *pfVar38 + *pfVar36;
            pfVar1[1] = fVar129 + fVar56;
            pfVar1[2] = fVar121 + fVar122;
            pfVar1[3] = fVar126 + fVar127;
            lVar25 = lVar25 + 0x10;
          }
          return 0;
        }
        if (iVar4 != 2) {
          if (iVar4 != 3) {
            return 0;
          }
          ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar23 < 1) {
            uVar23 = 0;
          }
          uVar44 = (ulong)uVar30;
          if ((int)uVar30 < 1) {
            uVar44 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            puVar33 = (undefined8 *)((long)this_01->data + uVar26 * 0x10);
            uVar10 = *puVar33;
            uVar11 = puVar33[1];
            local_d8 = (float)uVar10;
            fStack_d4 = (float)((ulong)uVar10 >> 0x20);
            fStack_d0 = (float)uVar11;
            fStack_cc = (float)((ulong)uVar11 >> 0x20);
            ncnn::Mat::channel((Mat *)_b0,this_00,(int)uVar26);
            uVar10 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
            uVar11 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            lVar25 = 0;
            uVar35 = uVar23;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              pfVar36 = (float *)(uVar10 + lVar25);
              fVar56 = pfVar36[1];
              fVar122 = pfVar36[2];
              fVar127 = pfVar36[3];
              pfVar38 = (float *)(uVar11 + lVar25);
              *pfVar38 = *pfVar36 + local_d8;
              pfVar38[1] = fVar56 + fStack_d4;
              pfVar38[2] = fVar122 + fStack_d0;
              pfVar38[3] = fVar127 + fStack_cc;
              lVar25 = lVar25 + 0x10;
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar29,uVar31,sVar6,_elempack,opt->blob_allocator);
        pauVar27 = (undefined1 (*) [16])this_02->data;
        if (pauVar27 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pfVar36 = (float *)this_01->data;
        pfVar38 = (float *)this_01[1].data;
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        if ((int)uVar31 < 1) {
          uVar31 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          fVar56 = *pfVar36;
          fVar122 = pfVar36[1];
          fVar127 = pfVar36[2];
          fVar129 = pfVar36[3];
          uVar30 = uVar29;
          while (bVar45 = uVar30 != 0, uVar30 = uVar30 - 1, bVar45) {
            auVar83._0_4_ = *pfVar38 + fVar56;
            auVar83._4_4_ = pfVar38[1] + fVar122;
            auVar83._8_4_ = pfVar38[2] + fVar127;
            auVar83._12_4_ = pfVar38[3] + fVar129;
            *pauVar27 = auVar83;
            pfVar38 = pfVar38 + 4;
            pauVar27 = pauVar27 + 1;
          }
          pfVar36 = pfVar36 + 4;
        }
        return 0;
      }
      if (iVar4 == 1) {
        ncnn::Mat::create(this_02,uVar29,sVar6,_elempack,opt->blob_allocator);
        pvVar9 = this_02->data;
        if (pvVar9 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar7 = this_01[1].data;
        fVar56 = *this_01->data;
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        lVar25 = 0;
        while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
          pfVar36 = (float *)((long)pvVar7 + lVar25);
          fVar122 = pfVar36[1];
          fVar127 = pfVar36[2];
          fVar129 = pfVar36[3];
          pfVar38 = (float *)((long)pvVar9 + lVar25);
          *pfVar38 = *pfVar36 + fVar56;
          pfVar38[1] = fVar122 + fVar56;
          pfVar38[2] = fVar127 + fVar56;
          pfVar38[3] = fVar129 + fVar56;
          lVar25 = lVar25 + 0x10;
        }
        return 0;
      }
      if (iVar4 != 2) {
        if (iVar4 != 3) {
          return 0;
        }
        ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        fVar56 = *this_01->data;
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar30 < 1) {
          uVar30 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar10 + lVar25);
            fVar122 = pfVar36[1];
            fVar127 = pfVar36[2];
            fVar129 = pfVar36[3];
            pfVar38 = (float *)(uVar11 + lVar25);
            *pfVar38 = *pfVar36 + fVar56;
            pfVar38[1] = fVar122 + fVar56;
            pfVar38[2] = fVar127 + fVar56;
            pfVar38[3] = fVar129 + fVar56;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar29,uVar31,sVar6,_elempack,opt->blob_allocator);
      pvVar9 = this_02->data;
      if (pvVar9 == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      pvVar7 = this_01[1].data;
      fVar56 = *this_01->data;
      if ((int)uVar23 < 1) {
        uVar23 = 0;
      }
      lVar25 = 0;
      while (bVar45 = uVar23 != 0, uVar23 = uVar23 - 1, bVar45) {
        pfVar36 = (float *)((long)pvVar7 + lVar25);
        fVar122 = pfVar36[1];
        fVar127 = pfVar36[2];
        fVar129 = pfVar36[3];
        pfVar38 = (float *)((long)pvVar9 + lVar25);
        *pfVar38 = *pfVar36 + fVar56;
        pfVar38[1] = fVar122 + fVar56;
        pfVar38[2] = fVar127 + fVar56;
        pfVar38[3] = fVar129 + fVar56;
        lVar25 = lVar25 + 0x10;
      }
      return 0;
    }
    uVar42 = this_01->h;
    uVar28 = uVar42 * uVar35;
    if (iVar4 != 2) {
      if (iVar4 != 3) {
        return 0;
      }
      uVar41 = this_01->c;
      uVar44 = (ulong)uVar41;
      if (this_01[1].dims != 3) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims == 1) {
          if (_elempack == 1 && this_01[1].w == 1) {
            fVar56 = *this_00->data;
            if ((int)uVar28 < 1) {
              uVar28 = 0;
            }
            if ((int)uVar41 < 1) {
              uVar41 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
              ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
              uVar10 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
              uVar11 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              lVar25 = 0;
              uVar29 = uVar28;
              while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
                pfVar36 = (float *)(uVar10 + lVar25);
                fVar122 = pfVar36[1];
                fVar127 = pfVar36[2];
                fVar129 = pfVar36[3];
                pfVar38 = (float *)(uVar11 + lVar25);
                *pfVar38 = *pfVar36 + fVar56;
                pfVar38[1] = fVar122 + fVar56;
                pfVar38[2] = fVar127 + fVar56;
                pfVar38[3] = fVar129 + fVar56;
                lVar25 = lVar25 + 0x10;
              }
            }
            return 0;
          }
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          if ((int)uVar41 < 1) {
            uVar44 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            ncnn::Mat::channel((Mat *)_b0,this_01,(int)uVar26);
            uVar21 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            puVar33 = (undefined8 *)((long)this_01[1].data + uVar26 * 0x10);
            uVar10 = *puVar33;
            uVar11 = puVar33[1];
            local_d8 = (float)uVar10;
            fStack_d4 = (float)((ulong)uVar10 >> 0x20);
            fStack_d0 = (float)uVar11;
            fStack_cc = (float)((ulong)uVar11 >> 0x20);
            ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
            uVar10 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            lVar25 = 0;
            uVar35 = uVar28;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              pfVar36 = (float *)(uVar21 + lVar25);
              fVar56 = pfVar36[1];
              fVar122 = pfVar36[2];
              fVar127 = pfVar36[3];
              pfVar38 = (float *)(uVar10 + lVar25);
              *pfVar38 = *pfVar36 + local_d8;
              pfVar38[1] = fVar56 + fStack_d4;
              pfVar38[2] = fVar122 + fStack_d0;
              pfVar38[3] = fVar127 + fStack_cc;
              lVar25 = lVar25 + 0x10;
            }
          }
          return 0;
        }
        if (this_01[1].dims != 2) {
          return 0;
        }
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar44 = 0;
        }
        for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,(int)uVar26);
          pfVar36 = (float *)_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          pfVar38 = (float *)((long)this_01[1].w * uVar26 * this_01[1].elemsize +
                             (long)this_01[1].data);
          ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar29 = 0; uVar29 != uVar42; uVar29 = uVar29 + 1) {
            fVar56 = *pfVar38;
            fVar122 = pfVar38[1];
            fVar127 = pfVar38[2];
            fVar129 = pfVar38[3];
            uVar31 = uVar35;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar68._0_4_ = *pfVar36 + fVar56;
              auVar68._4_4_ = pfVar36[1] + fVar122;
              auVar68._8_4_ = pfVar36[2] + fVar127;
              auVar68._12_4_ = pfVar36[3] + fVar129;
              *pauVar27 = auVar68;
              pfVar36 = pfVar36 + 4;
              pauVar27 = pauVar27 + 1;
            }
            pfVar38 = pfVar38 + 4;
          }
        }
        return 0;
      }
      uVar24 = uVar30 ^ uVar41;
      if (((uVar29 ^ 1) == 0 && (uVar31 ^ 1) == 0) && uVar24 == 0) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          fVar56 = *(float *)uVar21;
          fVar122 = *(float *)(uVar21 + 4);
          fVar127 = *(float *)(uVar21 + 8);
          fVar129 = *(float *)(uVar21 + 0xc);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar10 + lVar25);
            auVar57._0_4_ = *pfVar36 + fVar56;
            auVar57._4_4_ = pfVar36[1] + fVar122;
            auVar57._8_4_ = pfVar36[2] + fVar127;
            auVar57._12_4_ = pfVar36[3] + fVar129;
            *(undefined1 (*) [16])(uVar11 + lVar25) = auVar57;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      if ((uVar29 == uVar35) && (_elempack == 1 && (uVar30 == 1 && uVar31 == uVar42))) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          pvVar9 = this_01[1].data;
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar10 + lVar25 * 4);
            fVar56 = *(float *)((long)pvVar9 + lVar25);
            auVar75._0_4_ = fVar56 + *pfVar36;
            auVar75._4_4_ = fVar56 + pfVar36[1];
            auVar75._8_4_ = fVar56 + pfVar36[2];
            auVar75._12_4_ = fVar56 + pfVar36[3];
            *(undefined1 (*) [16])(uVar11 + lVar25 * 4) = auVar75;
            lVar25 = lVar25 + 4;
          }
        }
        return 0;
      }
      if (((uVar35 ^ 1) == 0 && (uVar42 ^ 1) == 0) && uVar24 == 0) {
        ncnn::Mat::create(this_02,uVar29,uVar31,uVar41,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          fVar56 = *(float *)uVar10;
          fVar122 = *(float *)(uVar10 + 4);
          fVar127 = *(float *)(uVar10 + 8);
          fVar129 = *(float *)(uVar10 + 0xc);
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar21 + lVar25);
            auVar80._0_4_ = *pfVar36 + fVar56;
            auVar80._4_4_ = pfVar36[1] + fVar122;
            auVar80._8_4_ = pfVar36[2] + fVar127;
            auVar80._12_4_ = pfVar36[3] + fVar129;
            *(undefined1 (*) [16])(uVar11 + lVar25) = auVar80;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      if ((((uVar29 == uVar35) && (iVar22 == 1)) && (uVar31 == uVar42)) && (uVar41 == 1)) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar30,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar30 < 1) {
          uVar30 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
          pvVar9 = this_01->data;
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            fVar56 = *(float *)((long)pvVar9 + lVar25);
            pfVar36 = (float *)(uVar10 + lVar25 * 4);
            auVar86._0_4_ = *pfVar36 + fVar56;
            auVar86._4_4_ = pfVar36[1] + fVar56;
            auVar86._8_4_ = pfVar36[2] + fVar56;
            auVar86._12_4_ = pfVar36[3] + fVar56;
            *(undefined1 (*) [16])(uVar11 + lVar25 * 4) = auVar86;
            lVar25 = lVar25 + 4;
          }
        }
        return 0;
      }
      if ((((uVar29 ^ 1) == 0 && (uVar31 ^ uVar42) == 0) && uVar24 == 0) && uVar35 != 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        uVar44 = (ulong)uVar42;
        if ((int)uVar42 < 1) {
          uVar44 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar29 = 0; uVar29 != uVar41; uVar29 = uVar29 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar29);
          pfVar36 = (float *)_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar29);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar29);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            pfVar38 = (float *)(uVar10 + uVar26 * 0x10);
            fVar56 = *pfVar38;
            fVar122 = pfVar38[1];
            fVar127 = pfVar38[2];
            fVar129 = pfVar38[3];
            uVar31 = uVar35;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar89._0_4_ = *pfVar36 + fVar56;
              auVar89._4_4_ = pfVar36[1] + fVar122;
              auVar89._8_4_ = pfVar36[2] + fVar127;
              auVar89._12_4_ = pfVar36[3] + fVar129;
              *pauVar27 = auVar89;
              pfVar36 = pfVar36 + 4;
              pauVar27 = pauVar27 + 1;
            }
          }
        }
        return 0;
      }
      if ((((uVar31 ^ 1) == 0 && (uVar29 ^ uVar35) == 0) && uVar24 == 0) && uVar42 != 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar26 = (ulong)uVar35;
        if ((int)uVar35 < 1) {
          uVar26 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar44 = 0;
        }
        for (iVar22 = 0; iVar22 != (int)uVar44; iVar22 = iVar22 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,iVar22);
          lVar25 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,iVar22);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,iVar22);
          lVar34 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar35 = 0; uVar35 != uVar42; uVar35 = uVar35 + 1) {
            for (lVar32 = 0; uVar26 * 0x10 != lVar32; lVar32 = lVar32 + 0x10) {
              pfVar36 = (float *)(lVar25 + lVar32);
              pfVar38 = (float *)(uVar10 + lVar32);
              auVar94._0_4_ = *pfVar38 + *pfVar36;
              auVar94._4_4_ = pfVar38[1] + pfVar36[1];
              auVar94._8_4_ = pfVar38[2] + pfVar36[2];
              auVar94._12_4_ = pfVar38[3] + pfVar36[3];
              *(undefined1 (*) [16])(lVar34 + lVar32) = auVar94;
            }
            lVar25 = lVar25 + lVar32;
            lVar34 = lVar34 + lVar32;
          }
        }
        return 0;
      }
      if ((((uVar35 ^ 1) == 0 && (uVar31 ^ uVar42) == 0) && uVar24 == 0) && uVar29 != 1) {
        ncnn::Mat::create(this_02,uVar29,uVar42,uVar41,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        uVar44 = (ulong)uVar42;
        if ((int)uVar42 < 1) {
          uVar44 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          pfVar36 = (float *)_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            pfVar38 = (float *)(uVar10 + uVar26 * 0x10);
            fVar56 = *pfVar38;
            fVar122 = pfVar38[1];
            fVar127 = pfVar38[2];
            fVar129 = pfVar38[3];
            uVar31 = uVar29;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar98._0_4_ = *pfVar36 + fVar56;
              auVar98._4_4_ = pfVar36[1] + fVar122;
              auVar98._8_4_ = pfVar36[2] + fVar127;
              auVar98._12_4_ = pfVar36[3] + fVar129;
              *pauVar27 = auVar98;
              pfVar36 = pfVar36 + 4;
              pauVar27 = pauVar27 + 1;
            }
          }
        }
        return 0;
      }
      if ((((uVar29 ^ uVar35) != 0 || (uVar42 ^ 1) != 0) || uVar24 != 0) || uVar31 == 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar10 + lVar25);
            pfVar38 = (float *)(uVar11 + lVar25);
            auVar108._0_4_ = *pfVar38 + *pfVar36;
            auVar108._4_4_ = pfVar38[1] + pfVar36[1];
            auVar108._8_4_ = pfVar38[2] + pfVar36[2];
            auVar108._12_4_ = pfVar38[3] + pfVar36[3];
            *(undefined1 (*) [16])(uVar21 + lVar25) = auVar108;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar35,uVar31,uVar41,sVar6,_elempack,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      uVar26 = (ulong)uVar35;
      if ((int)uVar35 < 1) {
        uVar26 = 0;
      }
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      if ((int)uVar41 < 1) {
        uVar44 = 0;
      }
      for (iVar22 = 0; local_e8 = (int)uVar44, iVar22 != local_e8; iVar22 = iVar22 + 1) {
        ncnn::Mat::channel((Mat *)_b0,this_01,iVar22);
        uVar10 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_00,iVar22);
        lVar25 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_02,iVar22);
        lVar34 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          for (lVar32 = 0; uVar26 * 0x10 != lVar32; lVar32 = lVar32 + 0x10) {
            pfVar36 = (float *)(uVar10 + lVar32);
            pfVar38 = (float *)(lVar25 + lVar32);
            auVar105._0_4_ = *pfVar38 + *pfVar36;
            auVar105._4_4_ = pfVar38[1] + pfVar36[1];
            auVar105._8_4_ = pfVar38[2] + pfVar36[2];
            auVar105._12_4_ = pfVar38[3] + pfVar36[3];
            *(undefined1 (*) [16])(lVar34 + lVar32) = auVar105;
          }
          lVar25 = lVar25 + lVar32;
          lVar34 = lVar34 + lVar32;
        }
      }
      return 0;
    }
    if (this_01[1].dims == 3) {
      ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      if ((int)uVar29 < 1) {
        uVar29 = 0;
      }
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      uVar44 = (ulong)uVar30;
      if ((int)uVar30 < 1) {
        uVar44 = 0;
      }
      for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
        pfVar38 = (float *)((long)this_01->w * uVar26 * this_01->elemsize + (long)this_01->data);
        ncnn::Mat::channel((Mat *)_b0,this_00,(int)uVar26);
        pfVar36 = (float *)_b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
        pauVar27 = (undefined1 (*) [16])_b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          fVar56 = *pfVar38;
          fVar122 = pfVar38[1];
          fVar127 = pfVar38[2];
          fVar129 = pfVar38[3];
          uVar30 = uVar29;
          while (bVar45 = uVar30 != 0, uVar30 = uVar30 - 1, bVar45) {
            auVar62._0_4_ = *pfVar36 + fVar56;
            auVar62._4_4_ = pfVar36[1] + fVar122;
            auVar62._8_4_ = pfVar36[2] + fVar127;
            auVar62._12_4_ = pfVar36[3] + fVar129;
            *pauVar27 = auVar62;
            pfVar36 = pfVar36 + 4;
            pauVar27 = pauVar27 + 1;
          }
          pfVar38 = pfVar38 + 4;
        }
      }
      return 0;
    }
    ncnn::Mat::create(this_02,uVar35,uVar42,sVar5,iVar22,opt->blob_allocator);
    pvVar9 = this_02->data;
    if ((pvVar9 != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) {
      if (this_01[1].dims != 1) {
        if (this_01[1].dims != 2) {
          return 0;
        }
        pvVar7 = this_01->data;
        pvVar8 = this_01[1].data;
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        lVar25 = 0;
        while (bVar45 = uVar28 != 0, uVar28 = uVar28 - 1, bVar45) {
          pfVar36 = (float *)((long)pvVar7 + lVar25);
          fVar56 = pfVar36[1];
          fVar122 = pfVar36[2];
          fVar127 = pfVar36[3];
          pfVar38 = (float *)((long)pvVar8 + lVar25);
          fVar129 = pfVar38[1];
          fVar121 = pfVar38[2];
          fVar126 = pfVar38[3];
          pfVar1 = (float *)((long)pvVar9 + lVar25);
          *pfVar1 = *pfVar38 + *pfVar36;
          pfVar1[1] = fVar129 + fVar56;
          pfVar1[2] = fVar121 + fVar122;
          pfVar1[3] = fVar126 + fVar127;
          lVar25 = lVar25 + 0x10;
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar35,uVar42,sVar5,iVar22,opt->blob_allocator);
      pauVar27 = (undefined1 (*) [16])this_02->data;
      if (pauVar27 != (undefined1 (*) [16])0x0) {
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (_elempack == 1 && this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar56 = *this_01[1].data;
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          lVar25 = 0;
          while (bVar45 = uVar28 != 0, uVar28 = uVar28 - 1, bVar45) {
            pfVar36 = (float *)((long)pvVar9 + lVar25);
            fVar122 = pfVar36[1];
            fVar127 = pfVar36[2];
            fVar129 = pfVar36[3];
            pfVar38 = (float *)((long)*pauVar27 + lVar25);
            *pfVar38 = *pfVar36 + fVar56;
            pfVar38[1] = fVar122 + fVar56;
            pfVar38[2] = fVar127 + fVar56;
            pfVar38[3] = fVar129 + fVar56;
            lVar25 = lVar25 + 0x10;
          }
          return 0;
        }
        pfVar36 = (float *)this_01->data;
        pfVar38 = (float *)this_01[1].data;
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        for (uVar29 = 0; uVar29 != uVar42; uVar29 = uVar29 + 1) {
          fVar56 = *pfVar38;
          fVar122 = pfVar38[1];
          fVar127 = pfVar38[2];
          fVar129 = pfVar38[3];
          uVar31 = uVar35;
          while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
            auVar101._0_4_ = *pfVar36 + fVar56;
            auVar101._4_4_ = pfVar36[1] + fVar122;
            auVar101._8_4_ = pfVar36[2] + fVar127;
            auVar101._12_4_ = pfVar36[3] + fVar129;
            *pauVar27 = auVar101;
            pfVar36 = pfVar36 + 4;
            pauVar27 = pauVar27 + 1;
          }
          pfVar38 = pfVar38 + 4;
        }
        return 0;
      }
    }
    break;
  case 1:
    uVar35 = this_01->w;
    sVar5 = this_01->elemsize;
    uVar29 = this_01[1].w;
    uVar31 = this_01[1].h;
    uVar30 = this_01[1].c;
    uVar23 = uVar31 * uVar29;
    sVar6 = this_01[1].elemsize;
    iVar4 = this_01->dims;
    if (iVar4 == 1) {
      iVar4 = this_01[1].dims;
      if (iVar22 != 1 || uVar35 != 1) {
        if (iVar4 == 1) {
          ncnn::Mat::create(this_02,uVar35,sVar5,iVar22,opt->blob_allocator);
          pvVar9 = this_02->data;
          if (pvVar9 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (_elempack == 1 && this_01[1].w == 1) {
            pvVar7 = this_01->data;
            fVar56 = *this_01[1].data;
            if ((int)uVar35 < 1) {
              uVar35 = 0;
            }
            lVar25 = 0;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              pfVar36 = (float *)((long)pvVar7 + lVar25);
              fVar122 = pfVar36[1];
              fVar127 = pfVar36[2];
              fVar129 = pfVar36[3];
              pfVar38 = (float *)((long)pvVar9 + lVar25);
              *pfVar38 = *pfVar36 - fVar56;
              pfVar38[1] = fVar122 - fVar56;
              pfVar38[2] = fVar127 - fVar56;
              pfVar38[3] = fVar129 - fVar56;
              lVar25 = lVar25 + 0x10;
            }
            return 0;
          }
          pvVar7 = this_01->data;
          pvVar8 = this_01[1].data;
          if ((int)uVar35 < 1) {
            uVar35 = 0;
          }
          lVar25 = 0;
          while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
            pfVar36 = (float *)((long)pvVar7 + lVar25);
            fVar56 = pfVar36[1];
            fVar122 = pfVar36[2];
            fVar127 = pfVar36[3];
            pfVar38 = (float *)((long)pvVar8 + lVar25);
            fVar129 = pfVar38[1];
            fVar121 = pfVar38[2];
            fVar126 = pfVar38[3];
            pfVar1 = (float *)((long)pvVar9 + lVar25);
            *pfVar1 = *pfVar36 - *pfVar38;
            pfVar1[1] = fVar56 - fVar129;
            pfVar1[2] = fVar122 - fVar121;
            pfVar1[3] = fVar127 - fVar126;
            lVar25 = lVar25 + 0x10;
          }
          return 0;
        }
        if (iVar4 != 2) {
          if (iVar4 != 3) {
            return 0;
          }
          ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar23 < 1) {
            uVar23 = 0;
          }
          uVar44 = (ulong)uVar30;
          if ((int)uVar30 < 1) {
            uVar44 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            puVar33 = (undefined8 *)((long)this_01->data + uVar26 * 0x10);
            uVar10 = *puVar33;
            uVar11 = puVar33[1];
            local_d8 = (float)uVar10;
            fStack_d4 = (float)((ulong)uVar10 >> 0x20);
            fStack_d0 = (float)uVar11;
            fStack_cc = (float)((ulong)uVar11 >> 0x20);
            ncnn::Mat::channel((Mat *)_b0,this_00,(int)uVar26);
            uVar10 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
            uVar11 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            lVar25 = 0;
            uVar35 = uVar23;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              pfVar36 = (float *)(uVar10 + lVar25);
              auVar67._0_4_ = local_d8 - *pfVar36;
              auVar67._4_4_ = fStack_d4 - pfVar36[1];
              auVar67._8_4_ = fStack_d0 - pfVar36[2];
              auVar67._12_4_ = fStack_cc - pfVar36[3];
              *(undefined1 (*) [16])(uVar11 + lVar25) = auVar67;
              lVar25 = lVar25 + 0x10;
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar29,uVar31,sVar6,_elempack,opt->blob_allocator);
        pauVar27 = (undefined1 (*) [16])this_02->data;
        if (pauVar27 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pfVar36 = (float *)this_01->data;
        pauVar40 = (undefined1 (*) [16])this_01[1].data;
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        if ((int)uVar31 < 1) {
          uVar31 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          fVar56 = *pfVar36;
          fVar122 = pfVar36[1];
          fVar127 = pfVar36[2];
          fVar129 = pfVar36[3];
          uVar30 = uVar29;
          while (bVar45 = uVar30 != 0, uVar30 = uVar30 - 1, bVar45) {
            auVar77 = *pauVar40;
            auVar114._0_4_ = fVar56 - auVar77._0_4_;
            auVar114._4_4_ = fVar122 - auVar77._4_4_;
            auVar114._8_4_ = fVar127 - auVar77._8_4_;
            auVar114._12_4_ = fVar129 - auVar77._12_4_;
            *pauVar27 = auVar114;
            pauVar40 = pauVar40 + 1;
            pauVar27 = pauVar27 + 1;
          }
          pfVar36 = pfVar36 + 4;
        }
        return 0;
      }
      if (iVar4 == 1) {
        ncnn::Mat::create(this_02,uVar29,sVar6,_elempack,opt->blob_allocator);
        pvVar9 = this_02->data;
        if (pvVar9 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar7 = this_01[1].data;
        fVar56 = *this_01->data;
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        lVar25 = 0;
        while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
          pfVar36 = (float *)((long)pvVar7 + lVar25);
          fVar122 = pfVar36[1];
          fVar127 = pfVar36[2];
          fVar129 = pfVar36[3];
          pfVar38 = (float *)((long)pvVar9 + lVar25);
          *pfVar38 = fVar56 - *pfVar36;
          pfVar38[1] = fVar56 - fVar122;
          pfVar38[2] = fVar56 - fVar127;
          pfVar38[3] = fVar56 - fVar129;
          lVar25 = lVar25 + 0x10;
        }
        return 0;
      }
      if (iVar4 != 2) {
        if (iVar4 != 3) {
          return 0;
        }
        ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        fVar56 = *this_01->data;
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar30 < 1) {
          uVar30 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar10 + lVar25);
            auVar63._0_4_ = fVar56 - *pfVar36;
            auVar63._4_4_ = fVar56 - pfVar36[1];
            auVar63._8_4_ = fVar56 - pfVar36[2];
            auVar63._12_4_ = fVar56 - pfVar36[3];
            *(undefined1 (*) [16])(uVar11 + lVar25) = auVar63;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar29,uVar31,sVar6,_elempack,opt->blob_allocator);
      pvVar9 = this_02->data;
      if (pvVar9 == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      pvVar7 = this_01[1].data;
      fVar56 = *this_01->data;
      if ((int)uVar23 < 1) {
        uVar23 = 0;
      }
      lVar25 = 0;
      while (bVar45 = uVar23 != 0, uVar23 = uVar23 - 1, bVar45) {
        pfVar36 = (float *)((long)pvVar7 + lVar25);
        fVar122 = pfVar36[1];
        fVar127 = pfVar36[2];
        fVar129 = pfVar36[3];
        pfVar38 = (float *)((long)pvVar9 + lVar25);
        *pfVar38 = fVar56 - *pfVar36;
        pfVar38[1] = fVar56 - fVar122;
        pfVar38[2] = fVar56 - fVar127;
        pfVar38[3] = fVar56 - fVar129;
        lVar25 = lVar25 + 0x10;
      }
      return 0;
    }
    uVar42 = this_01->h;
    uVar28 = uVar42 * uVar35;
    if (iVar4 != 2) {
      if (iVar4 != 3) {
        return 0;
      }
      uVar41 = this_01->c;
      uVar44 = (ulong)uVar41;
      if (this_01[1].dims != 3) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims == 1) {
          if (_elempack == 1 && this_01[1].w == 1) {
            fVar56 = *this_00->data;
            if ((int)uVar28 < 1) {
              uVar28 = 0;
            }
            if ((int)uVar41 < 1) {
              uVar41 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
              ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
              uVar10 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
              uVar11 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              lVar25 = 0;
              uVar29 = uVar28;
              while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
                pfVar36 = (float *)(uVar10 + lVar25);
                fVar122 = pfVar36[1];
                fVar127 = pfVar36[2];
                fVar129 = pfVar36[3];
                pfVar38 = (float *)(uVar11 + lVar25);
                *pfVar38 = *pfVar36 - fVar56;
                pfVar38[1] = fVar122 - fVar56;
                pfVar38[2] = fVar127 - fVar56;
                pfVar38[3] = fVar129 - fVar56;
                lVar25 = lVar25 + 0x10;
              }
            }
            return 0;
          }
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          if ((int)uVar41 < 1) {
            uVar44 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            ncnn::Mat::channel((Mat *)_b0,this_01,(int)uVar26);
            uVar21 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            puVar33 = (undefined8 *)((long)this_01[1].data + uVar26 * 0x10);
            uVar10 = *puVar33;
            uVar11 = puVar33[1];
            local_d8 = (float)uVar10;
            fStack_d4 = (float)((ulong)uVar10 >> 0x20);
            fStack_d0 = (float)uVar11;
            fStack_cc = (float)((ulong)uVar11 >> 0x20);
            ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
            uVar10 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            lVar25 = 0;
            uVar35 = uVar28;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              pfVar36 = (float *)(uVar21 + lVar25);
              fVar56 = pfVar36[1];
              fVar122 = pfVar36[2];
              fVar127 = pfVar36[3];
              pfVar38 = (float *)(uVar10 + lVar25);
              *pfVar38 = *pfVar36 - local_d8;
              pfVar38[1] = fVar56 - fStack_d4;
              pfVar38[2] = fVar122 - fStack_d0;
              pfVar38[3] = fVar127 - fStack_cc;
              lVar25 = lVar25 + 0x10;
            }
          }
          return 0;
        }
        if (this_01[1].dims != 2) {
          return 0;
        }
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar44 = 0;
        }
        for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,(int)uVar26);
          pfVar36 = (float *)_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          pfVar38 = (float *)((long)this_01[1].w * uVar26 * this_01[1].elemsize +
                             (long)this_01[1].data);
          ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar29 = 0; uVar29 != uVar42; uVar29 = uVar29 + 1) {
            fVar56 = *pfVar38;
            fVar122 = pfVar38[1];
            fVar127 = pfVar38[2];
            fVar129 = pfVar38[3];
            uVar31 = uVar35;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar69._0_4_ = *pfVar36 - fVar56;
              auVar69._4_4_ = pfVar36[1] - fVar122;
              auVar69._8_4_ = pfVar36[2] - fVar127;
              auVar69._12_4_ = pfVar36[3] - fVar129;
              *pauVar27 = auVar69;
              pfVar36 = pfVar36 + 4;
              pauVar27 = pauVar27 + 1;
            }
            pfVar38 = pfVar38 + 4;
          }
        }
        return 0;
      }
      uVar24 = uVar30 ^ uVar41;
      if (((uVar29 ^ 1) == 0 && (uVar31 ^ 1) == 0) && uVar24 == 0) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          fVar56 = *(float *)uVar21;
          fVar122 = *(float *)(uVar21 + 4);
          fVar127 = *(float *)(uVar21 + 8);
          fVar129 = *(float *)(uVar21 + 0xc);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar10 + lVar25);
            auVar59._0_4_ = *pfVar36 - fVar56;
            auVar59._4_4_ = pfVar36[1] - fVar122;
            auVar59._8_4_ = pfVar36[2] - fVar127;
            auVar59._12_4_ = pfVar36[3] - fVar129;
            *(undefined1 (*) [16])(uVar11 + lVar25) = auVar59;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      if ((uVar29 == uVar35) && (_elempack == 1 && (uVar30 == 1 && uVar31 == uVar42))) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          pvVar9 = this_01[1].data;
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar10 + lVar25 * 4);
            fVar122 = pfVar36[1];
            fVar127 = pfVar36[2];
            fVar129 = pfVar36[3];
            fVar56 = *(float *)((long)pvVar9 + lVar25);
            pfVar38 = (float *)(uVar11 + lVar25 * 4);
            *pfVar38 = *pfVar36 - fVar56;
            pfVar38[1] = fVar122 - fVar56;
            pfVar38[2] = fVar127 - fVar56;
            pfVar38[3] = fVar129 - fVar56;
            lVar25 = lVar25 + 4;
          }
        }
        return 0;
      }
      if (((uVar35 ^ 1) == 0 && (uVar42 ^ 1) == 0) && uVar24 == 0) {
        ncnn::Mat::create(this_02,uVar29,uVar31,uVar41,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          fVar56 = *(float *)uVar10;
          fVar122 = *(float *)(uVar10 + 4);
          fVar127 = *(float *)(uVar10 + 8);
          fVar129 = *(float *)(uVar10 + 0xc);
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            auVar77 = *(undefined1 (*) [16])(uVar21 + lVar25);
            auVar113._0_4_ = fVar56 - auVar77._0_4_;
            auVar113._4_4_ = fVar122 - auVar77._4_4_;
            auVar113._8_4_ = fVar127 - auVar77._8_4_;
            auVar113._12_4_ = fVar129 - auVar77._12_4_;
            *(undefined1 (*) [16])(uVar11 + lVar25) = auVar113;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      if ((((uVar29 == uVar35) && (iVar22 == 1)) && (uVar31 == uVar42)) && (uVar41 == 1)) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar30,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar30 < 1) {
          uVar30 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
          pvVar9 = this_01->data;
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            fVar56 = *(float *)((long)pvVar9 + lVar25);
            auVar77 = *(undefined1 (*) [16])(uVar10 + lVar25 * 4);
            pfVar36 = (float *)(uVar11 + lVar25 * 4);
            *pfVar36 = fVar56 - auVar77._0_4_;
            pfVar36[1] = fVar56 - auVar77._4_4_;
            pfVar36[2] = fVar56 - auVar77._8_4_;
            pfVar36[3] = fVar56 - auVar77._12_4_;
            lVar25 = lVar25 + 4;
          }
        }
        return 0;
      }
      if ((((uVar29 ^ 1) == 0 && (uVar31 ^ uVar42) == 0) && uVar24 == 0) && uVar35 != 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        uVar44 = (ulong)uVar42;
        if ((int)uVar42 < 1) {
          uVar44 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar29 = 0; uVar29 != uVar41; uVar29 = uVar29 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar29);
          pfVar36 = (float *)_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar29);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar29);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            pfVar38 = (float *)(uVar10 + uVar26 * 0x10);
            fVar56 = *pfVar38;
            fVar122 = pfVar38[1];
            fVar127 = pfVar38[2];
            fVar129 = pfVar38[3];
            uVar31 = uVar35;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar90._0_4_ = *pfVar36 - fVar56;
              auVar90._4_4_ = pfVar36[1] - fVar122;
              auVar90._8_4_ = pfVar36[2] - fVar127;
              auVar90._12_4_ = pfVar36[3] - fVar129;
              *pauVar27 = auVar90;
              pfVar36 = pfVar36 + 4;
              pauVar27 = pauVar27 + 1;
            }
          }
        }
        return 0;
      }
      if ((((uVar31 ^ 1) == 0 && (uVar29 ^ uVar35) == 0) && uVar24 == 0) && uVar42 != 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar26 = (ulong)uVar35;
        if ((int)uVar35 < 1) {
          uVar26 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar44 = 0;
        }
        for (iVar22 = 0; iVar22 != (int)uVar44; iVar22 = iVar22 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,iVar22);
          lVar25 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,iVar22);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,iVar22);
          lVar34 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar35 = 0; uVar35 != uVar42; uVar35 = uVar35 + 1) {
            for (lVar32 = 0; uVar26 * 0x10 != lVar32; lVar32 = lVar32 + 0x10) {
              pfVar36 = (float *)(lVar25 + lVar32);
              fVar56 = pfVar36[1];
              fVar122 = pfVar36[2];
              fVar127 = pfVar36[3];
              auVar77 = *(undefined1 (*) [16])(uVar10 + lVar32);
              pfVar38 = (float *)(lVar34 + lVar32);
              *pfVar38 = *pfVar36 - auVar77._0_4_;
              pfVar38[1] = fVar56 - auVar77._4_4_;
              pfVar38[2] = fVar122 - auVar77._8_4_;
              pfVar38[3] = fVar127 - auVar77._12_4_;
            }
            lVar25 = lVar25 + lVar32;
            lVar34 = lVar34 + lVar32;
          }
        }
        return 0;
      }
      if ((((uVar35 ^ 1) == 0 && (uVar31 ^ uVar42) == 0) && uVar24 == 0) && uVar29 != 1) {
        ncnn::Mat::create(this_02,uVar29,uVar42,uVar41,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        uVar44 = (ulong)uVar42;
        if ((int)uVar42 < 1) {
          uVar44 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          pauVar40 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            pfVar36 = (float *)(uVar10 + uVar26 * 0x10);
            fVar56 = *pfVar36;
            fVar122 = pfVar36[1];
            fVar127 = pfVar36[2];
            fVar129 = pfVar36[3];
            uVar31 = uVar29;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar77 = *pauVar27;
              auVar117._0_4_ = fVar56 - auVar77._0_4_;
              auVar117._4_4_ = fVar122 - auVar77._4_4_;
              auVar117._8_4_ = fVar127 - auVar77._8_4_;
              auVar117._12_4_ = fVar129 - auVar77._12_4_;
              *pauVar40 = auVar117;
              pauVar27 = pauVar27 + 1;
              pauVar40 = pauVar40 + 1;
            }
          }
        }
        return 0;
      }
      if ((((uVar29 ^ uVar35) != 0 || (uVar42 ^ 1) != 0) || uVar24 != 0) || uVar31 == 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar10 + lVar25);
            fVar56 = pfVar36[1];
            fVar122 = pfVar36[2];
            fVar127 = pfVar36[3];
            auVar77 = *(undefined1 (*) [16])(uVar11 + lVar25);
            pfVar38 = (float *)(uVar21 + lVar25);
            *pfVar38 = *pfVar36 - auVar77._0_4_;
            pfVar38[1] = fVar56 - auVar77._4_4_;
            pfVar38[2] = fVar122 - auVar77._8_4_;
            pfVar38[3] = fVar127 - auVar77._12_4_;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar35,uVar31,uVar41,sVar6,_elempack,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      uVar26 = (ulong)uVar35;
      if ((int)uVar35 < 1) {
        uVar26 = 0;
      }
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      if ((int)uVar41 < 1) {
        uVar44 = 0;
      }
      for (iVar22 = 0; local_e8 = (int)uVar44, iVar22 != local_e8; iVar22 = iVar22 + 1) {
        ncnn::Mat::channel((Mat *)_b0,this_01,iVar22);
        uVar10 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_00,iVar22);
        lVar25 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_02,iVar22);
        lVar34 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          for (lVar32 = 0; uVar26 * 0x10 != lVar32; lVar32 = lVar32 + 0x10) {
            pfVar36 = (float *)(uVar10 + lVar32);
            fVar56 = pfVar36[1];
            fVar122 = pfVar36[2];
            fVar127 = pfVar36[3];
            auVar77 = *(undefined1 (*) [16])(lVar25 + lVar32);
            pfVar38 = (float *)(lVar34 + lVar32);
            *pfVar38 = *pfVar36 - auVar77._0_4_;
            pfVar38[1] = fVar56 - auVar77._4_4_;
            pfVar38[2] = fVar122 - auVar77._8_4_;
            pfVar38[3] = fVar127 - auVar77._12_4_;
          }
          lVar25 = lVar25 + lVar32;
          lVar34 = lVar34 + lVar32;
        }
      }
      return 0;
    }
    if (this_01[1].dims == 3) {
      ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      if ((int)uVar29 < 1) {
        uVar29 = 0;
      }
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      uVar44 = (ulong)uVar30;
      if ((int)uVar30 < 1) {
        uVar44 = 0;
      }
      for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
        pfVar36 = (float *)((long)this_01->w * uVar26 * this_01->elemsize + (long)this_01->data);
        ncnn::Mat::channel((Mat *)_b0,this_00,(int)uVar26);
        pauVar27 = (undefined1 (*) [16])_b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
        pauVar40 = (undefined1 (*) [16])_b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          fVar56 = *pfVar36;
          fVar122 = pfVar36[1];
          fVar127 = pfVar36[2];
          fVar129 = pfVar36[3];
          uVar30 = uVar29;
          while (bVar45 = uVar30 != 0, uVar30 = uVar30 - 1, bVar45) {
            auVar77 = *pauVar27;
            auVar110._0_4_ = fVar56 - auVar77._0_4_;
            auVar110._4_4_ = fVar122 - auVar77._4_4_;
            auVar110._8_4_ = fVar127 - auVar77._8_4_;
            auVar110._12_4_ = fVar129 - auVar77._12_4_;
            *pauVar40 = auVar110;
            pauVar27 = pauVar27 + 1;
            pauVar40 = pauVar40 + 1;
          }
          pfVar36 = pfVar36 + 4;
        }
      }
      return 0;
    }
    ncnn::Mat::create(this_02,uVar35,uVar42,sVar5,iVar22,opt->blob_allocator);
    pvVar9 = this_02->data;
    if ((pvVar9 != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) {
      if (this_01[1].dims != 1) {
        if (this_01[1].dims != 2) {
          return 0;
        }
        pvVar7 = this_01->data;
        pvVar8 = this_01[1].data;
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        lVar25 = 0;
        while (bVar45 = uVar28 != 0, uVar28 = uVar28 - 1, bVar45) {
          pfVar36 = (float *)((long)pvVar7 + lVar25);
          fVar56 = pfVar36[1];
          fVar122 = pfVar36[2];
          fVar127 = pfVar36[3];
          pfVar38 = (float *)((long)pvVar8 + lVar25);
          fVar129 = pfVar38[1];
          fVar121 = pfVar38[2];
          fVar126 = pfVar38[3];
          pfVar1 = (float *)((long)pvVar9 + lVar25);
          *pfVar1 = *pfVar36 - *pfVar38;
          pfVar1[1] = fVar56 - fVar129;
          pfVar1[2] = fVar122 - fVar121;
          pfVar1[3] = fVar127 - fVar126;
          lVar25 = lVar25 + 0x10;
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar35,uVar42,sVar5,iVar22,opt->blob_allocator);
      pauVar27 = (undefined1 (*) [16])this_02->data;
      if (pauVar27 != (undefined1 (*) [16])0x0) {
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (_elempack == 1 && this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar56 = *this_01[1].data;
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          lVar25 = 0;
          while (bVar45 = uVar28 != 0, uVar28 = uVar28 - 1, bVar45) {
            pfVar36 = (float *)((long)pvVar9 + lVar25);
            fVar122 = pfVar36[1];
            fVar127 = pfVar36[2];
            fVar129 = pfVar36[3];
            pfVar38 = (float *)((long)*pauVar27 + lVar25);
            *pfVar38 = *pfVar36 - fVar56;
            pfVar38[1] = fVar122 - fVar56;
            pfVar38[2] = fVar127 - fVar56;
            pfVar38[3] = fVar129 - fVar56;
            lVar25 = lVar25 + 0x10;
          }
          return 0;
        }
        pfVar36 = (float *)this_01->data;
        pfVar38 = (float *)this_01[1].data;
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        for (uVar29 = 0; uVar29 != uVar42; uVar29 = uVar29 + 1) {
          fVar56 = *pfVar38;
          fVar122 = pfVar38[1];
          fVar127 = pfVar38[2];
          fVar129 = pfVar38[3];
          uVar31 = uVar35;
          while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
            auVar102._0_4_ = *pfVar36 - fVar56;
            auVar102._4_4_ = pfVar36[1] - fVar122;
            auVar102._8_4_ = pfVar36[2] - fVar127;
            auVar102._12_4_ = pfVar36[3] - fVar129;
            *pauVar27 = auVar102;
            pfVar36 = pfVar36 + 4;
            pauVar27 = pauVar27 + 1;
          }
          pfVar38 = pfVar38 + 4;
        }
        return 0;
      }
    }
    break;
  case 2:
    uVar35 = this_01->w;
    sVar5 = this_01->elemsize;
    uVar29 = this_01[1].w;
    uVar31 = this_01[1].h;
    uVar30 = this_01[1].c;
    uVar23 = uVar31 * uVar29;
    sVar6 = this_01[1].elemsize;
    iVar4 = this_01->dims;
    if (iVar4 == 1) {
      iVar4 = this_01[1].dims;
      if (iVar22 != 1 || uVar35 != 1) {
        if (iVar4 == 1) {
          ncnn::Mat::create(this_02,uVar35,sVar5,iVar22,opt->blob_allocator);
          pvVar9 = this_02->data;
          if (pvVar9 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (_elempack == 1 && this_01[1].w == 1) {
            pvVar7 = this_01->data;
            fVar56 = *this_01[1].data;
            if ((int)uVar35 < 1) {
              uVar35 = 0;
            }
            lVar25 = 0;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              pfVar36 = (float *)((long)pvVar7 + lVar25);
              fVar122 = pfVar36[1];
              fVar127 = pfVar36[2];
              fVar129 = pfVar36[3];
              pfVar38 = (float *)((long)pvVar9 + lVar25);
              *pfVar38 = *pfVar36 * fVar56;
              pfVar38[1] = fVar122 * fVar56;
              pfVar38[2] = fVar127 * fVar56;
              pfVar38[3] = fVar129 * fVar56;
              lVar25 = lVar25 + 0x10;
            }
            return 0;
          }
          pvVar7 = this_01->data;
          pvVar8 = this_01[1].data;
          if ((int)uVar35 < 1) {
            uVar35 = 0;
          }
          lVar25 = 0;
          while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
            pfVar36 = (float *)((long)pvVar7 + lVar25);
            fVar56 = pfVar36[1];
            fVar122 = pfVar36[2];
            fVar127 = pfVar36[3];
            pfVar38 = (float *)((long)pvVar8 + lVar25);
            fVar129 = pfVar38[1];
            fVar121 = pfVar38[2];
            fVar126 = pfVar38[3];
            pfVar1 = (float *)((long)pvVar9 + lVar25);
            *pfVar1 = *pfVar38 * *pfVar36;
            pfVar1[1] = fVar129 * fVar56;
            pfVar1[2] = fVar121 * fVar122;
            pfVar1[3] = fVar126 * fVar127;
            lVar25 = lVar25 + 0x10;
          }
          return 0;
        }
        if (iVar4 != 2) {
          if (iVar4 != 3) {
            return 0;
          }
          ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar23 < 1) {
            uVar23 = 0;
          }
          uVar44 = (ulong)uVar30;
          if ((int)uVar30 < 1) {
            uVar44 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            puVar33 = (undefined8 *)((long)this_01->data + uVar26 * 0x10);
            uVar10 = *puVar33;
            uVar11 = puVar33[1];
            local_d8 = (float)uVar10;
            fStack_d4 = (float)((ulong)uVar10 >> 0x20);
            fStack_d0 = (float)uVar11;
            fStack_cc = (float)((ulong)uVar11 >> 0x20);
            ncnn::Mat::channel((Mat *)_b0,this_00,(int)uVar26);
            uVar10 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
            uVar11 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            lVar25 = 0;
            uVar35 = uVar23;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              pfVar36 = (float *)(uVar10 + lVar25);
              fVar56 = pfVar36[1];
              fVar122 = pfVar36[2];
              fVar127 = pfVar36[3];
              pfVar38 = (float *)(uVar11 + lVar25);
              *pfVar38 = *pfVar36 * local_d8;
              pfVar38[1] = fVar56 * fStack_d4;
              pfVar38[2] = fVar122 * fStack_d0;
              pfVar38[3] = fVar127 * fStack_cc;
              lVar25 = lVar25 + 0x10;
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar29,uVar31,sVar6,_elempack,opt->blob_allocator);
        pauVar27 = (undefined1 (*) [16])this_02->data;
        if (pauVar27 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pfVar36 = (float *)this_01->data;
        pfVar38 = (float *)this_01[1].data;
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        if ((int)uVar31 < 1) {
          uVar31 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          fVar56 = *pfVar36;
          fVar122 = pfVar36[1];
          fVar127 = pfVar36[2];
          fVar129 = pfVar36[3];
          uVar30 = uVar29;
          while (bVar45 = uVar30 != 0, uVar30 = uVar30 - 1, bVar45) {
            auVar81._0_4_ = *pfVar38 * fVar56;
            auVar81._4_4_ = pfVar38[1] * fVar122;
            auVar81._8_4_ = pfVar38[2] * fVar127;
            auVar81._12_4_ = pfVar38[3] * fVar129;
            *pauVar27 = auVar81;
            pfVar38 = pfVar38 + 4;
            pauVar27 = pauVar27 + 1;
          }
          pfVar36 = pfVar36 + 4;
        }
        return 0;
      }
      if (iVar4 == 1) {
        ncnn::Mat::create(this_02,uVar29,sVar6,_elempack,opt->blob_allocator);
        pvVar9 = this_02->data;
        if (pvVar9 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar7 = this_01[1].data;
        fVar56 = *this_01->data;
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        lVar25 = 0;
        while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
          pfVar36 = (float *)((long)pvVar7 + lVar25);
          fVar122 = pfVar36[1];
          fVar127 = pfVar36[2];
          fVar129 = pfVar36[3];
          pfVar38 = (float *)((long)pvVar9 + lVar25);
          *pfVar38 = *pfVar36 * fVar56;
          pfVar38[1] = fVar122 * fVar56;
          pfVar38[2] = fVar127 * fVar56;
          pfVar38[3] = fVar129 * fVar56;
          lVar25 = lVar25 + 0x10;
        }
        return 0;
      }
      if (iVar4 != 2) {
        if (iVar4 != 3) {
          return 0;
        }
        ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        fVar56 = *this_01->data;
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar30 < 1) {
          uVar30 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar10 + lVar25);
            fVar122 = pfVar36[1];
            fVar127 = pfVar36[2];
            fVar129 = pfVar36[3];
            pfVar38 = (float *)(uVar11 + lVar25);
            *pfVar38 = *pfVar36 * fVar56;
            pfVar38[1] = fVar122 * fVar56;
            pfVar38[2] = fVar127 * fVar56;
            pfVar38[3] = fVar129 * fVar56;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar29,uVar31,sVar6,_elempack,opt->blob_allocator);
      pvVar9 = this_02->data;
      if (pvVar9 == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      pvVar7 = this_01[1].data;
      fVar56 = *this_01->data;
      if ((int)uVar23 < 1) {
        uVar23 = 0;
      }
      lVar25 = 0;
      while (bVar45 = uVar23 != 0, uVar23 = uVar23 - 1, bVar45) {
        pfVar36 = (float *)((long)pvVar7 + lVar25);
        fVar122 = pfVar36[1];
        fVar127 = pfVar36[2];
        fVar129 = pfVar36[3];
        pfVar38 = (float *)((long)pvVar9 + lVar25);
        *pfVar38 = *pfVar36 * fVar56;
        pfVar38[1] = fVar122 * fVar56;
        pfVar38[2] = fVar127 * fVar56;
        pfVar38[3] = fVar129 * fVar56;
        lVar25 = lVar25 + 0x10;
      }
      return 0;
    }
    uVar42 = this_01->h;
    uVar28 = uVar42 * uVar35;
    if (iVar4 != 2) {
      if (iVar4 != 3) {
        return 0;
      }
      uVar41 = this_01->c;
      uVar44 = (ulong)uVar41;
      if (this_01[1].dims != 3) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims == 1) {
          if (_elempack == 1 && this_01[1].w == 1) {
            fVar56 = *this_00->data;
            if ((int)uVar28 < 1) {
              uVar28 = 0;
            }
            if ((int)uVar41 < 1) {
              uVar41 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
              ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
              uVar10 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
              uVar11 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              lVar25 = 0;
              uVar29 = uVar28;
              while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
                pfVar36 = (float *)(uVar10 + lVar25);
                fVar122 = pfVar36[1];
                fVar127 = pfVar36[2];
                fVar129 = pfVar36[3];
                pfVar38 = (float *)(uVar11 + lVar25);
                *pfVar38 = *pfVar36 * fVar56;
                pfVar38[1] = fVar122 * fVar56;
                pfVar38[2] = fVar127 * fVar56;
                pfVar38[3] = fVar129 * fVar56;
                lVar25 = lVar25 + 0x10;
              }
            }
            return 0;
          }
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          if ((int)uVar41 < 1) {
            uVar44 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            ncnn::Mat::channel((Mat *)_b0,this_01,(int)uVar26);
            uVar21 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            puVar33 = (undefined8 *)((long)this_01[1].data + uVar26 * 0x10);
            uVar10 = *puVar33;
            uVar11 = puVar33[1];
            local_d8 = (float)uVar10;
            fStack_d4 = (float)((ulong)uVar10 >> 0x20);
            fStack_d0 = (float)uVar11;
            fStack_cc = (float)((ulong)uVar11 >> 0x20);
            ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
            uVar10 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            lVar25 = 0;
            uVar35 = uVar28;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              pfVar36 = (float *)(uVar21 + lVar25);
              fVar56 = pfVar36[1];
              fVar122 = pfVar36[2];
              fVar127 = pfVar36[3];
              pfVar38 = (float *)(uVar10 + lVar25);
              *pfVar38 = *pfVar36 * local_d8;
              pfVar38[1] = fVar56 * fStack_d4;
              pfVar38[2] = fVar122 * fStack_d0;
              pfVar38[3] = fVar127 * fStack_cc;
              lVar25 = lVar25 + 0x10;
            }
          }
          return 0;
        }
        if (this_01[1].dims != 2) {
          return 0;
        }
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar44 = 0;
        }
        for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,(int)uVar26);
          pfVar36 = (float *)_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          pfVar38 = (float *)((long)this_01[1].w * uVar26 * this_01[1].elemsize +
                             (long)this_01[1].data);
          ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar29 = 0; uVar29 != uVar42; uVar29 = uVar29 + 1) {
            fVar56 = *pfVar38;
            fVar122 = pfVar38[1];
            fVar127 = pfVar38[2];
            fVar129 = pfVar38[3];
            uVar31 = uVar35;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar65._0_4_ = *pfVar36 * fVar56;
              auVar65._4_4_ = pfVar36[1] * fVar122;
              auVar65._8_4_ = pfVar36[2] * fVar127;
              auVar65._12_4_ = pfVar36[3] * fVar129;
              *pauVar27 = auVar65;
              pfVar36 = pfVar36 + 4;
              pauVar27 = pauVar27 + 1;
            }
            pfVar38 = pfVar38 + 4;
          }
        }
        return 0;
      }
      uVar24 = uVar30 ^ uVar41;
      if (((uVar29 ^ 1) == 0 && (uVar31 ^ 1) == 0) && uVar24 == 0) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          fVar56 = *(float *)uVar21;
          fVar122 = *(float *)(uVar21 + 4);
          fVar127 = *(float *)(uVar21 + 8);
          fVar129 = *(float *)(uVar21 + 0xc);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar10 + lVar25);
            auVar58._0_4_ = *pfVar36 * fVar56;
            auVar58._4_4_ = pfVar36[1] * fVar122;
            auVar58._8_4_ = pfVar36[2] * fVar127;
            auVar58._12_4_ = pfVar36[3] * fVar129;
            *(undefined1 (*) [16])(uVar11 + lVar25) = auVar58;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      if ((uVar29 == uVar35) && (_elempack == 1 && (uVar30 == 1 && uVar31 == uVar42))) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          pvVar9 = this_01[1].data;
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar10 + lVar25 * 4);
            fVar56 = *(float *)((long)pvVar9 + lVar25);
            auVar72._0_4_ = fVar56 * *pfVar36;
            auVar72._4_4_ = fVar56 * pfVar36[1];
            auVar72._8_4_ = fVar56 * pfVar36[2];
            auVar72._12_4_ = fVar56 * pfVar36[3];
            *(undefined1 (*) [16])(uVar11 + lVar25 * 4) = auVar72;
            lVar25 = lVar25 + 4;
          }
        }
        return 0;
      }
      if (((uVar35 ^ 1) == 0 && (uVar42 ^ 1) == 0) && uVar24 == 0) {
        ncnn::Mat::create(this_02,uVar29,uVar31,uVar41,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          fVar56 = *(float *)uVar10;
          fVar122 = *(float *)(uVar10 + 4);
          fVar127 = *(float *)(uVar10 + 8);
          fVar129 = *(float *)(uVar10 + 0xc);
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar21 + lVar25);
            auVar78._0_4_ = *pfVar36 * fVar56;
            auVar78._4_4_ = pfVar36[1] * fVar122;
            auVar78._8_4_ = pfVar36[2] * fVar127;
            auVar78._12_4_ = pfVar36[3] * fVar129;
            *(undefined1 (*) [16])(uVar11 + lVar25) = auVar78;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      if ((((uVar29 == uVar35) && (iVar22 == 1)) && (uVar31 == uVar42)) && (uVar41 == 1)) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar30,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar30 < 1) {
          uVar30 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
          pvVar9 = this_01->data;
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            fVar56 = *(float *)((long)pvVar9 + lVar25);
            pfVar36 = (float *)(uVar10 + lVar25 * 4);
            auVar84._0_4_ = *pfVar36 * fVar56;
            auVar84._4_4_ = pfVar36[1] * fVar56;
            auVar84._8_4_ = pfVar36[2] * fVar56;
            auVar84._12_4_ = pfVar36[3] * fVar56;
            *(undefined1 (*) [16])(uVar11 + lVar25 * 4) = auVar84;
            lVar25 = lVar25 + 4;
          }
        }
        return 0;
      }
      if ((((uVar29 ^ 1) == 0 && (uVar31 ^ uVar42) == 0) && uVar24 == 0) && uVar35 != 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        uVar44 = (ulong)uVar42;
        if ((int)uVar42 < 1) {
          uVar44 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar29 = 0; uVar29 != uVar41; uVar29 = uVar29 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar29);
          pfVar36 = (float *)_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar29);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar29);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            pfVar38 = (float *)(uVar10 + uVar26 * 0x10);
            fVar56 = *pfVar38;
            fVar122 = pfVar38[1];
            fVar127 = pfVar38[2];
            fVar129 = pfVar38[3];
            uVar31 = uVar35;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar87._0_4_ = *pfVar36 * fVar56;
              auVar87._4_4_ = pfVar36[1] * fVar122;
              auVar87._8_4_ = pfVar36[2] * fVar127;
              auVar87._12_4_ = pfVar36[3] * fVar129;
              *pauVar27 = auVar87;
              pfVar36 = pfVar36 + 4;
              pauVar27 = pauVar27 + 1;
            }
          }
        }
        return 0;
      }
      if ((((uVar31 ^ 1) == 0 && (uVar29 ^ uVar35) == 0) && uVar24 == 0) && uVar42 != 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar26 = (ulong)uVar35;
        if ((int)uVar35 < 1) {
          uVar26 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar44 = 0;
        }
        for (iVar22 = 0; iVar22 != (int)uVar44; iVar22 = iVar22 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,iVar22);
          lVar25 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,iVar22);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,iVar22);
          lVar34 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar35 = 0; uVar35 != uVar42; uVar35 = uVar35 + 1) {
            for (lVar32 = 0; uVar26 * 0x10 != lVar32; lVar32 = lVar32 + 0x10) {
              pfVar36 = (float *)(lVar25 + lVar32);
              pfVar38 = (float *)(uVar10 + lVar32);
              auVar92._0_4_ = *pfVar38 * *pfVar36;
              auVar92._4_4_ = pfVar38[1] * pfVar36[1];
              auVar92._8_4_ = pfVar38[2] * pfVar36[2];
              auVar92._12_4_ = pfVar38[3] * pfVar36[3];
              *(undefined1 (*) [16])(lVar34 + lVar32) = auVar92;
            }
            lVar25 = lVar25 + lVar32;
            lVar34 = lVar34 + lVar32;
          }
        }
        return 0;
      }
      if ((((uVar35 ^ 1) == 0 && (uVar31 ^ uVar42) == 0) && uVar24 == 0) && uVar29 != 1) {
        ncnn::Mat::create(this_02,uVar29,uVar42,uVar41,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        uVar44 = (ulong)uVar42;
        if ((int)uVar42 < 1) {
          uVar44 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          pfVar36 = (float *)_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            pfVar38 = (float *)(uVar10 + uVar26 * 0x10);
            fVar56 = *pfVar38;
            fVar122 = pfVar38[1];
            fVar127 = pfVar38[2];
            fVar129 = pfVar38[3];
            uVar31 = uVar29;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar96._0_4_ = *pfVar36 * fVar56;
              auVar96._4_4_ = pfVar36[1] * fVar122;
              auVar96._8_4_ = pfVar36[2] * fVar127;
              auVar96._12_4_ = pfVar36[3] * fVar129;
              *pauVar27 = auVar96;
              pfVar36 = pfVar36 + 4;
              pauVar27 = pauVar27 + 1;
            }
          }
        }
        return 0;
      }
      if ((((uVar29 ^ uVar35) != 0 || (uVar42 ^ 1) != 0) || uVar24 != 0) || uVar31 == 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar10 + lVar25);
            pfVar38 = (float *)(uVar11 + lVar25);
            auVar106._0_4_ = *pfVar38 * *pfVar36;
            auVar106._4_4_ = pfVar38[1] * pfVar36[1];
            auVar106._8_4_ = pfVar38[2] * pfVar36[2];
            auVar106._12_4_ = pfVar38[3] * pfVar36[3];
            *(undefined1 (*) [16])(uVar21 + lVar25) = auVar106;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar35,uVar31,uVar41,sVar6,_elempack,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      uVar26 = (ulong)uVar35;
      if ((int)uVar35 < 1) {
        uVar26 = 0;
      }
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      if ((int)uVar41 < 1) {
        uVar44 = 0;
      }
      for (iVar22 = 0; local_e8 = (int)uVar44, iVar22 != local_e8; iVar22 = iVar22 + 1) {
        ncnn::Mat::channel((Mat *)_b0,this_01,iVar22);
        uVar10 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_00,iVar22);
        lVar25 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_02,iVar22);
        lVar34 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          for (lVar32 = 0; uVar26 * 0x10 != lVar32; lVar32 = lVar32 + 0x10) {
            pfVar36 = (float *)(uVar10 + lVar32);
            pfVar38 = (float *)(lVar25 + lVar32);
            auVar103._0_4_ = *pfVar38 * *pfVar36;
            auVar103._4_4_ = pfVar38[1] * pfVar36[1];
            auVar103._8_4_ = pfVar38[2] * pfVar36[2];
            auVar103._12_4_ = pfVar38[3] * pfVar36[3];
            *(undefined1 (*) [16])(lVar34 + lVar32) = auVar103;
          }
          lVar25 = lVar25 + lVar32;
          lVar34 = lVar34 + lVar32;
        }
      }
      return 0;
    }
    if (this_01[1].dims == 3) {
      ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      if ((int)uVar29 < 1) {
        uVar29 = 0;
      }
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      uVar44 = (ulong)uVar30;
      if ((int)uVar30 < 1) {
        uVar44 = 0;
      }
      for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
        pfVar38 = (float *)((long)this_01->w * uVar26 * this_01->elemsize + (long)this_01->data);
        ncnn::Mat::channel((Mat *)_b0,this_00,(int)uVar26);
        pfVar36 = (float *)_b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
        pauVar27 = (undefined1 (*) [16])_b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          fVar56 = *pfVar38;
          fVar122 = pfVar38[1];
          fVar127 = pfVar38[2];
          fVar129 = pfVar38[3];
          uVar30 = uVar29;
          while (bVar45 = uVar30 != 0, uVar30 = uVar30 - 1, bVar45) {
            auVar60._0_4_ = *pfVar36 * fVar56;
            auVar60._4_4_ = pfVar36[1] * fVar122;
            auVar60._8_4_ = pfVar36[2] * fVar127;
            auVar60._12_4_ = pfVar36[3] * fVar129;
            *pauVar27 = auVar60;
            pfVar36 = pfVar36 + 4;
            pauVar27 = pauVar27 + 1;
          }
          pfVar38 = pfVar38 + 4;
        }
      }
      return 0;
    }
    ncnn::Mat::create(this_02,uVar35,uVar42,sVar5,iVar22,opt->blob_allocator);
    pvVar9 = this_02->data;
    if ((pvVar9 != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) {
      if (this_01[1].dims != 1) {
        if (this_01[1].dims != 2) {
          return 0;
        }
        pvVar7 = this_01->data;
        pvVar8 = this_01[1].data;
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        lVar25 = 0;
        while (bVar45 = uVar28 != 0, uVar28 = uVar28 - 1, bVar45) {
          pfVar36 = (float *)((long)pvVar7 + lVar25);
          fVar56 = pfVar36[1];
          fVar122 = pfVar36[2];
          fVar127 = pfVar36[3];
          pfVar38 = (float *)((long)pvVar8 + lVar25);
          fVar129 = pfVar38[1];
          fVar121 = pfVar38[2];
          fVar126 = pfVar38[3];
          pfVar1 = (float *)((long)pvVar9 + lVar25);
          *pfVar1 = *pfVar38 * *pfVar36;
          pfVar1[1] = fVar129 * fVar56;
          pfVar1[2] = fVar121 * fVar122;
          pfVar1[3] = fVar126 * fVar127;
          lVar25 = lVar25 + 0x10;
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar35,uVar42,sVar5,iVar22,opt->blob_allocator);
      pauVar27 = (undefined1 (*) [16])this_02->data;
      if (pauVar27 != (undefined1 (*) [16])0x0) {
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (_elempack == 1 && this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar56 = *this_01[1].data;
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          lVar25 = 0;
          while (bVar45 = uVar28 != 0, uVar28 = uVar28 - 1, bVar45) {
            pfVar36 = (float *)((long)pvVar9 + lVar25);
            fVar122 = pfVar36[1];
            fVar127 = pfVar36[2];
            fVar129 = pfVar36[3];
            pfVar38 = (float *)((long)*pauVar27 + lVar25);
            *pfVar38 = *pfVar36 * fVar56;
            pfVar38[1] = fVar122 * fVar56;
            pfVar38[2] = fVar127 * fVar56;
            pfVar38[3] = fVar129 * fVar56;
            lVar25 = lVar25 + 0x10;
          }
          return 0;
        }
        pfVar36 = (float *)this_01->data;
        pfVar38 = (float *)this_01[1].data;
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        for (uVar29 = 0; uVar29 != uVar42; uVar29 = uVar29 + 1) {
          fVar56 = *pfVar38;
          fVar122 = pfVar38[1];
          fVar127 = pfVar38[2];
          fVar129 = pfVar38[3];
          uVar31 = uVar35;
          while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
            auVar100._0_4_ = *pfVar36 * fVar56;
            auVar100._4_4_ = pfVar36[1] * fVar122;
            auVar100._8_4_ = pfVar36[2] * fVar127;
            auVar100._12_4_ = pfVar36[3] * fVar129;
            *pauVar27 = auVar100;
            pfVar36 = pfVar36 + 4;
            pauVar27 = pauVar27 + 1;
          }
          pfVar38 = pfVar38 + 4;
        }
        return 0;
      }
    }
    break;
  case 3:
    uVar35 = this_01->w;
    sVar5 = this_01->elemsize;
    uVar29 = this_01[1].w;
    uVar31 = this_01[1].h;
    uVar30 = this_01[1].c;
    uVar23 = uVar31 * uVar29;
    sVar6 = this_01[1].elemsize;
    iVar4 = this_01->dims;
    if (iVar4 == 1) {
      iVar4 = this_01[1].dims;
      if (iVar22 != 1 || uVar35 != 1) {
        if (iVar4 == 1) {
          ncnn::Mat::create(this_02,uVar35,sVar5,iVar22,opt->blob_allocator);
          pvVar9 = this_02->data;
          if (pvVar9 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (_elempack == 1 && this_01[1].w == 1) {
            pvVar7 = this_01->data;
            fVar56 = 1.0 / *this_01[1].data;
            if ((int)uVar35 < 1) {
              uVar35 = 0;
            }
            lVar25 = 0;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              pfVar36 = (float *)((long)pvVar7 + lVar25);
              fVar122 = pfVar36[1];
              fVar127 = pfVar36[2];
              fVar129 = pfVar36[3];
              pfVar38 = (float *)((long)pvVar9 + lVar25);
              *pfVar38 = *pfVar36 * fVar56;
              pfVar38[1] = fVar122 * fVar56;
              pfVar38[2] = fVar127 * fVar56;
              pfVar38[3] = fVar129 * fVar56;
              lVar25 = lVar25 + 0x10;
            }
            return 0;
          }
          pvVar7 = this_01->data;
          pvVar8 = this_01[1].data;
          if ((int)uVar35 < 1) {
            uVar35 = 0;
          }
          lVar25 = 0;
          while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
            pfVar36 = (float *)((long)pvVar7 + lVar25);
            fVar56 = pfVar36[1];
            fVar122 = pfVar36[2];
            fVar127 = pfVar36[3];
            auVar77 = *(undefined1 (*) [16])((long)pvVar8 + lVar25);
            in_XMM2 = rcpps(in_XMM2,auVar77);
            fVar129 = *pfVar36 * in_XMM2._0_4_;
            fVar121 = fVar56 * in_XMM2._4_4_;
            fVar126 = fVar122 * in_XMM2._8_4_;
            fVar128 = fVar127 * in_XMM2._12_4_;
            pfVar38 = (float *)((long)pvVar9 + lVar25);
            *pfVar38 = (*pfVar36 - auVar77._0_4_ * fVar129) * in_XMM2._0_4_ + fVar129;
            pfVar38[1] = (fVar56 - auVar77._4_4_ * fVar121) * in_XMM2._4_4_ + fVar121;
            pfVar38[2] = (fVar122 - auVar77._8_4_ * fVar126) * in_XMM2._8_4_ + fVar126;
            pfVar38[3] = (fVar127 - auVar77._12_4_ * fVar128) * in_XMM2._12_4_ + fVar128;
            lVar25 = lVar25 + 0x10;
          }
          return 0;
        }
        if (iVar4 != 2) {
          if (iVar4 != 3) {
            return 0;
          }
          ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar23 < 1) {
            uVar23 = 0;
          }
          uVar44 = (ulong)uVar30;
          if ((int)uVar30 < 1) {
            uVar44 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            puVar33 = (undefined8 *)((long)this_01->data + uVar26 * 0x10);
            uVar10 = *puVar33;
            uVar11 = puVar33[1];
            local_d8 = (float)uVar10;
            fStack_d4 = (float)((ulong)uVar10 >> 0x20);
            fStack_d0 = (float)uVar11;
            fStack_cc = (float)((ulong)uVar11 >> 0x20);
            ncnn::Mat::channel((Mat *)_b0,this_00,(int)uVar26);
            uVar10 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
            uVar11 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            lVar25 = 0;
            uVar35 = uVar23;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              auVar77 = *(undefined1 (*) [16])(uVar10 + lVar25);
              in_XMM1 = rcpps(in_XMM1,auVar77);
              fVar56 = local_d8 * in_XMM1._0_4_;
              fVar122 = fStack_d4 * in_XMM1._4_4_;
              fVar127 = fStack_d0 * in_XMM1._8_4_;
              fVar129 = fStack_cc * in_XMM1._12_4_;
              auVar124._0_4_ = (local_d8 - auVar77._0_4_ * fVar56) * in_XMM1._0_4_ + fVar56;
              auVar124._4_4_ = (fStack_d4 - auVar77._4_4_ * fVar122) * in_XMM1._4_4_ + fVar122;
              auVar124._8_4_ = (fStack_d0 - auVar77._8_4_ * fVar127) * in_XMM1._8_4_ + fVar127;
              auVar124._12_4_ = (fStack_cc - auVar77._12_4_ * fVar129) * in_XMM1._12_4_ + fVar129;
              *(undefined1 (*) [16])(uVar11 + lVar25) = auVar124;
              lVar25 = lVar25 + 0x10;
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar29,uVar31,sVar6,_elempack,opt->blob_allocator);
        pfVar36 = (float *)this_02->data;
        if (pfVar36 == (float *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pfVar38 = (float *)this_01->data;
        pauVar27 = (undefined1 (*) [16])this_01[1].data;
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        if ((int)uVar31 < 1) {
          uVar31 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          fVar56 = *pfVar38;
          fVar122 = pfVar38[1];
          fVar127 = pfVar38[2];
          fVar129 = pfVar38[3];
          uVar30 = uVar29;
          while (bVar45 = uVar30 != 0, uVar30 = uVar30 - 1, bVar45) {
            auVar77 = *pauVar27;
            in_XMM2 = rcpps(in_XMM2,auVar77);
            fVar121 = fVar56 * in_XMM2._0_4_;
            fVar126 = fVar122 * in_XMM2._4_4_;
            fVar128 = fVar127 * in_XMM2._8_4_;
            fVar130 = fVar129 * in_XMM2._12_4_;
            *pfVar36 = (fVar56 - auVar77._0_4_ * fVar121) * in_XMM2._0_4_ + fVar121;
            pfVar36[1] = (fVar122 - auVar77._4_4_ * fVar126) * in_XMM2._4_4_ + fVar126;
            pfVar36[2] = (fVar127 - auVar77._8_4_ * fVar128) * in_XMM2._8_4_ + fVar128;
            pfVar36[3] = (fVar129 - auVar77._12_4_ * fVar130) * in_XMM2._12_4_ + fVar130;
            pauVar27 = pauVar27 + 1;
            pfVar36 = pfVar36 + 4;
          }
          pfVar38 = pfVar38 + 4;
        }
        return 0;
      }
      if (iVar4 == 1) {
        ncnn::Mat::create(this_02,uVar29,sVar6,_elempack,opt->blob_allocator);
        pvVar9 = this_02->data;
        if (pvVar9 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar7 = this_01[1].data;
        fVar56 = *this_01->data;
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        lVar25 = 0;
        while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
          auVar77 = *(undefined1 (*) [16])((long)pvVar7 + lVar25);
          in_XMM2 = rcpps(in_XMM2,auVar77);
          fVar122 = fVar56 * in_XMM2._0_4_;
          fVar127 = fVar56 * in_XMM2._4_4_;
          fVar129 = fVar56 * in_XMM2._8_4_;
          fVar121 = fVar56 * in_XMM2._12_4_;
          pfVar36 = (float *)((long)pvVar9 + lVar25);
          *pfVar36 = (fVar56 - auVar77._0_4_ * fVar122) * in_XMM2._0_4_ + fVar122;
          pfVar36[1] = (fVar56 - auVar77._4_4_ * fVar127) * in_XMM2._4_4_ + fVar127;
          pfVar36[2] = (fVar56 - auVar77._8_4_ * fVar129) * in_XMM2._8_4_ + fVar129;
          pfVar36[3] = (fVar56 - auVar77._12_4_ * fVar121) * in_XMM2._12_4_ + fVar121;
          lVar25 = lVar25 + 0x10;
        }
        return 0;
      }
      if (iVar4 != 2) {
        if (iVar4 != 3) {
          return 0;
        }
        ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        fVar56 = *this_01->data;
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar30 < 1) {
          uVar30 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            auVar77 = *(undefined1 (*) [16])(uVar10 + lVar25);
            in_XMM1 = rcpps(in_XMM1,auVar77);
            fVar122 = fVar56 * in_XMM1._0_4_;
            fVar127 = fVar56 * in_XMM1._4_4_;
            fVar129 = fVar56 * in_XMM1._8_4_;
            fVar121 = fVar56 * in_XMM1._12_4_;
            auVar123._0_4_ = (fVar56 - auVar77._0_4_ * fVar122) * in_XMM1._0_4_ + fVar122;
            auVar123._4_4_ = (fVar56 - auVar77._4_4_ * fVar127) * in_XMM1._4_4_ + fVar127;
            auVar123._8_4_ = (fVar56 - auVar77._8_4_ * fVar129) * in_XMM1._8_4_ + fVar129;
            auVar123._12_4_ = (fVar56 - auVar77._12_4_ * fVar121) * in_XMM1._12_4_ + fVar121;
            *(undefined1 (*) [16])(uVar11 + lVar25) = auVar123;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar29,uVar31,sVar6,_elempack,opt->blob_allocator);
      pvVar9 = this_02->data;
      if (pvVar9 == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      pvVar7 = this_01[1].data;
      fVar56 = *this_01->data;
      if ((int)uVar23 < 1) {
        uVar23 = 0;
      }
      lVar25 = 0;
      while (bVar45 = uVar23 != 0, uVar23 = uVar23 - 1, bVar45) {
        auVar77 = *(undefined1 (*) [16])((long)pvVar7 + lVar25);
        in_XMM2 = rcpps(in_XMM2,auVar77);
        fVar122 = fVar56 * in_XMM2._0_4_;
        fVar127 = fVar56 * in_XMM2._4_4_;
        fVar129 = fVar56 * in_XMM2._8_4_;
        fVar121 = fVar56 * in_XMM2._12_4_;
        pfVar36 = (float *)((long)pvVar9 + lVar25);
        *pfVar36 = (fVar56 - auVar77._0_4_ * fVar122) * in_XMM2._0_4_ + fVar122;
        pfVar36[1] = (fVar56 - auVar77._4_4_ * fVar127) * in_XMM2._4_4_ + fVar127;
        pfVar36[2] = (fVar56 - auVar77._8_4_ * fVar129) * in_XMM2._8_4_ + fVar129;
        pfVar36[3] = (fVar56 - auVar77._12_4_ * fVar121) * in_XMM2._12_4_ + fVar121;
        lVar25 = lVar25 + 0x10;
      }
      return 0;
    }
    uVar42 = this_01->h;
    uVar28 = uVar42 * uVar35;
    if (iVar4 != 2) {
      if (iVar4 != 3) {
        return 0;
      }
      uVar41 = this_01->c;
      uVar44 = (ulong)uVar41;
      if (this_01[1].dims != 3) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims == 1) {
          if (_elempack == 1 && this_01[1].w == 1) {
            fVar56 = 1.0 / *this_00->data;
            if ((int)uVar28 < 1) {
              uVar28 = 0;
            }
            if ((int)uVar41 < 1) {
              uVar41 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
              ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
              uVar10 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
              uVar11 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              lVar25 = 0;
              uVar29 = uVar28;
              while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
                pfVar36 = (float *)(uVar10 + lVar25);
                fVar122 = pfVar36[1];
                fVar127 = pfVar36[2];
                fVar129 = pfVar36[3];
                pfVar38 = (float *)(uVar11 + lVar25);
                *pfVar38 = *pfVar36 * fVar56;
                pfVar38[1] = fVar122 * fVar56;
                pfVar38[2] = fVar127 * fVar56;
                pfVar38[3] = fVar129 * fVar56;
                lVar25 = lVar25 + 0x10;
              }
            }
            return 0;
          }
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          if ((int)uVar41 < 1) {
            uVar44 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            ncnn::Mat::channel((Mat *)_b0,this_01,(int)uVar26);
            uVar10 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            auVar77 = *(undefined1 (*) [16])((long)this_01[1].data + uVar26 * 0x10);
            auVar70 = rcpps(in_XMM1,auVar77);
            fVar56 = auVar70._0_4_;
            fVar122 = auVar70._4_4_;
            fVar127 = auVar70._8_4_;
            fVar129 = auVar70._12_4_;
            fVar56 = (1.0 - auVar77._0_4_ * fVar56) * fVar56 + fVar56;
            fVar122 = (1.0 - auVar77._4_4_ * fVar122) * fVar122 + fVar122;
            fVar127 = (1.0 - auVar77._8_4_ * fVar127) * fVar127 + fVar127;
            fVar129 = (1.0 - auVar77._12_4_ * fVar129) * fVar129 + fVar129;
            ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
            uVar11 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            in_XMM1._4_4_ = fVar122;
            in_XMM1._0_4_ = fVar56;
            in_XMM1._8_4_ = fVar127;
            in_XMM1._12_4_ = fVar129;
            lVar25 = 0;
            uVar35 = uVar28;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              pfVar36 = (float *)(uVar10 + lVar25);
              fVar121 = pfVar36[1];
              fVar126 = pfVar36[2];
              fVar128 = pfVar36[3];
              pfVar38 = (float *)(uVar11 + lVar25);
              *pfVar38 = *pfVar36 * fVar56;
              pfVar38[1] = fVar121 * fVar122;
              pfVar38[2] = fVar126 * fVar127;
              pfVar38[3] = fVar128 * fVar129;
              lVar25 = lVar25 + 0x10;
            }
          }
          return 0;
        }
        if (this_01[1].dims != 2) {
          return 0;
        }
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar44 = 0;
        }
        for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,(int)uVar26);
          pfVar36 = (float *)_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          pauVar40 = (undefined1 (*) [16])
                     ((long)this_01[1].w * uVar26 * this_01[1].elemsize + (long)this_01[1].data);
          ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar29 = 0; uVar29 != uVar42; uVar29 = uVar29 + 1) {
            auVar77 = *pauVar40;
            in_XMM2 = rcpps(in_XMM2,auVar77);
            fVar56 = in_XMM2._0_4_;
            fVar122 = in_XMM2._4_4_;
            fVar127 = in_XMM2._8_4_;
            fVar129 = in_XMM2._12_4_;
            uVar31 = uVar35;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar66._0_4_ = *pfVar36 * ((1.0 - auVar77._0_4_ * fVar56) * fVar56 + fVar56);
              auVar66._4_4_ = pfVar36[1] * ((1.0 - auVar77._4_4_ * fVar122) * fVar122 + fVar122);
              auVar66._8_4_ = pfVar36[2] * ((1.0 - auVar77._8_4_ * fVar127) * fVar127 + fVar127);
              auVar66._12_4_ = pfVar36[3] * ((1.0 - auVar77._12_4_ * fVar129) * fVar129 + fVar129);
              *pauVar27 = auVar66;
              pfVar36 = pfVar36 + 4;
              pauVar27 = pauVar27 + 1;
            }
            pauVar40 = pauVar40 + 1;
          }
        }
        return 0;
      }
      uVar24 = uVar30 ^ uVar41;
      if (((uVar29 ^ 1) == 0 && (uVar31 ^ 1) == 0) && uVar24 == 0) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          auVar77 = *(undefined1 (*) [16])uVar21;
          in_XMM2 = rcpps(in_XMM2,auVar77);
          fVar56 = in_XMM2._0_4_;
          fVar122 = in_XMM2._4_4_;
          fVar127 = in_XMM2._8_4_;
          fVar129 = in_XMM2._12_4_;
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar10 + lVar25);
            fVar121 = pfVar36[1];
            fVar126 = pfVar36[2];
            fVar128 = pfVar36[3];
            pfVar38 = (float *)(uVar11 + lVar25);
            *pfVar38 = *pfVar36 * ((1.0 - auVar77._0_4_ * fVar56) * fVar56 + fVar56);
            pfVar38[1] = fVar121 * ((1.0 - auVar77._4_4_ * fVar122) * fVar122 + fVar122);
            pfVar38[2] = fVar126 * ((1.0 - auVar77._8_4_ * fVar127) * fVar127 + fVar127);
            pfVar38[3] = fVar128 * ((1.0 - auVar77._12_4_ * fVar129) * fVar129 + fVar129);
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      if ((uVar29 == uVar35) && (_elempack == 1 && (uVar30 == 1 && uVar31 == uVar42))) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          pvVar9 = this_01[1].data;
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar10 + lVar25 * 4);
            fVar56 = 1.0 / *(float *)((long)pvVar9 + lVar25);
            auVar73._0_4_ = fVar56 * *pfVar36;
            auVar73._4_4_ = fVar56 * pfVar36[1];
            auVar73._8_4_ = fVar56 * pfVar36[2];
            auVar73._12_4_ = fVar56 * pfVar36[3];
            *(undefined1 (*) [16])(uVar11 + lVar25 * 4) = auVar73;
            lVar25 = lVar25 + 4;
          }
        }
        return 0;
      }
      if (((uVar35 ^ 1) == 0 && (uVar42 ^ 1) == 0) && uVar24 == 0) {
        ncnn::Mat::create(this_02,uVar29,uVar31,uVar41,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          fVar56 = *(float *)uVar10;
          fVar122 = *(float *)(uVar10 + 4);
          fVar127 = *(float *)(uVar10 + 8);
          fVar129 = *(float *)(uVar10 + 0xc);
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            auVar77 = *(undefined1 (*) [16])(uVar21 + lVar25);
            in_XMM2 = rcpps(in_XMM2,auVar77);
            fVar121 = fVar56 * in_XMM2._0_4_;
            fVar126 = fVar122 * in_XMM2._4_4_;
            fVar128 = fVar127 * in_XMM2._8_4_;
            fVar130 = fVar129 * in_XMM2._12_4_;
            pfVar36 = (float *)(uVar11 + lVar25);
            *pfVar36 = (fVar56 - auVar77._0_4_ * fVar121) * in_XMM2._0_4_ + fVar121;
            pfVar36[1] = (fVar122 - auVar77._4_4_ * fVar126) * in_XMM2._4_4_ + fVar126;
            pfVar36[2] = (fVar127 - auVar77._8_4_ * fVar128) * in_XMM2._8_4_ + fVar128;
            pfVar36[3] = (fVar129 - auVar77._12_4_ * fVar130) * in_XMM2._12_4_ + fVar130;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      if ((((uVar29 == uVar35) && (iVar22 == 1)) && (uVar31 == uVar42)) && (uVar41 == 1)) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar30,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar30 < 1) {
          uVar30 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
          pvVar9 = this_01->data;
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            fVar56 = *(float *)((long)pvVar9 + lVar25);
            auVar77 = *(undefined1 (*) [16])(uVar10 + lVar25 * 4);
            in_XMM2 = rcpps(in_XMM2,auVar77);
            fVar122 = fVar56 * in_XMM2._0_4_;
            fVar127 = fVar56 * in_XMM2._4_4_;
            fVar129 = fVar56 * in_XMM2._8_4_;
            fVar121 = fVar56 * in_XMM2._12_4_;
            pfVar36 = (float *)(uVar11 + lVar25 * 4);
            *pfVar36 = (fVar56 - auVar77._0_4_ * fVar122) * in_XMM2._0_4_ + fVar122;
            pfVar36[1] = (fVar56 - auVar77._4_4_ * fVar127) * in_XMM2._4_4_ + fVar127;
            pfVar36[2] = (fVar56 - auVar77._8_4_ * fVar129) * in_XMM2._8_4_ + fVar129;
            pfVar36[3] = (fVar56 - auVar77._12_4_ * fVar121) * in_XMM2._12_4_ + fVar121;
            lVar25 = lVar25 + 4;
          }
        }
        return 0;
      }
      if ((((uVar29 ^ 1) == 0 && (uVar31 ^ uVar42) == 0) && uVar24 == 0) && uVar35 != 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        uVar44 = (ulong)uVar42;
        if ((int)uVar42 < 1) {
          uVar44 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar29 = 0; uVar29 != uVar41; uVar29 = uVar29 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar29);
          pfVar36 = (float *)_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar29);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar29);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            auVar77 = *(undefined1 (*) [16])(uVar10 + uVar26 * 0x10);
            in_XMM2 = rcpps(in_XMM2,auVar77);
            fVar56 = in_XMM2._0_4_;
            fVar122 = in_XMM2._4_4_;
            fVar127 = in_XMM2._8_4_;
            fVar129 = in_XMM2._12_4_;
            uVar31 = uVar35;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar88._0_4_ = *pfVar36 * ((1.0 - auVar77._0_4_ * fVar56) * fVar56 + fVar56);
              auVar88._4_4_ = pfVar36[1] * ((1.0 - auVar77._4_4_ * fVar122) * fVar122 + fVar122);
              auVar88._8_4_ = pfVar36[2] * ((1.0 - auVar77._8_4_ * fVar127) * fVar127 + fVar127);
              auVar88._12_4_ = pfVar36[3] * ((1.0 - auVar77._12_4_ * fVar129) * fVar129 + fVar129);
              *pauVar27 = auVar88;
              pfVar36 = pfVar36 + 4;
              pauVar27 = pauVar27 + 1;
            }
          }
        }
        return 0;
      }
      if ((((uVar31 ^ 1) == 0 && (uVar29 ^ uVar35) == 0) && uVar24 == 0) && uVar42 != 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar26 = (ulong)uVar35;
        if ((int)uVar35 < 1) {
          uVar26 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar44 = 0;
        }
        for (iVar22 = 0; iVar22 != (int)uVar44; iVar22 = iVar22 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,iVar22);
          lVar25 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,iVar22);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,iVar22);
          lVar34 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar35 = 0; uVar35 != uVar42; uVar35 = uVar35 + 1) {
            for (lVar32 = 0; uVar26 * 0x10 != lVar32; lVar32 = lVar32 + 0x10) {
              pfVar36 = (float *)(lVar25 + lVar32);
              fVar56 = pfVar36[1];
              fVar122 = pfVar36[2];
              fVar127 = pfVar36[3];
              auVar77 = *(undefined1 (*) [16])(uVar10 + lVar32);
              in_XMM2 = rcpps(in_XMM2,auVar77);
              fVar129 = *pfVar36 * in_XMM2._0_4_;
              fVar121 = fVar56 * in_XMM2._4_4_;
              fVar126 = fVar122 * in_XMM2._8_4_;
              fVar128 = fVar127 * in_XMM2._12_4_;
              pfVar38 = (float *)(lVar34 + lVar32);
              *pfVar38 = (*pfVar36 - auVar77._0_4_ * fVar129) * in_XMM2._0_4_ + fVar129;
              pfVar38[1] = (fVar56 - auVar77._4_4_ * fVar121) * in_XMM2._4_4_ + fVar121;
              pfVar38[2] = (fVar122 - auVar77._8_4_ * fVar126) * in_XMM2._8_4_ + fVar126;
              pfVar38[3] = (fVar127 - auVar77._12_4_ * fVar128) * in_XMM2._12_4_ + fVar128;
            }
            lVar25 = lVar25 + lVar32;
            lVar34 = lVar34 + lVar32;
          }
        }
        return 0;
      }
      if ((((uVar35 ^ 1) == 0 && (uVar31 ^ uVar42) == 0) && uVar24 == 0) && uVar29 != 1) {
        ncnn::Mat::create(this_02,uVar29,uVar42,uVar41,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        uVar44 = (ulong)uVar42;
        if ((int)uVar42 < 1) {
          uVar44 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          pfVar36 = (float *)_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            pfVar38 = (float *)(uVar10 + uVar26 * 0x10);
            fVar56 = *pfVar38;
            fVar122 = pfVar38[1];
            fVar127 = pfVar38[2];
            fVar129 = pfVar38[3];
            uVar31 = uVar29;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar77 = *pauVar27;
              in_XMM2 = rcpps(in_XMM2,auVar77);
              fVar121 = fVar56 * in_XMM2._0_4_;
              fVar126 = fVar122 * in_XMM2._4_4_;
              fVar128 = fVar127 * in_XMM2._8_4_;
              fVar130 = fVar129 * in_XMM2._12_4_;
              *pfVar36 = (fVar56 - auVar77._0_4_ * fVar121) * in_XMM2._0_4_ + fVar121;
              pfVar36[1] = (fVar122 - auVar77._4_4_ * fVar126) * in_XMM2._4_4_ + fVar126;
              pfVar36[2] = (fVar127 - auVar77._8_4_ * fVar128) * in_XMM2._8_4_ + fVar128;
              pfVar36[3] = (fVar129 - auVar77._12_4_ * fVar130) * in_XMM2._12_4_ + fVar130;
              pauVar27 = pauVar27 + 1;
              pfVar36 = pfVar36 + 4;
            }
          }
        }
        return 0;
      }
      if ((((uVar29 ^ uVar35) != 0 || (uVar42 ^ 1) != 0) || uVar24 != 0) || uVar31 == 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar10 + lVar25);
            fVar56 = pfVar36[1];
            fVar122 = pfVar36[2];
            fVar127 = pfVar36[3];
            auVar77 = *(undefined1 (*) [16])(uVar11 + lVar25);
            in_XMM2 = rcpps(in_XMM2,auVar77);
            fVar129 = *pfVar36 * in_XMM2._0_4_;
            fVar121 = fVar56 * in_XMM2._4_4_;
            fVar126 = fVar122 * in_XMM2._8_4_;
            fVar128 = fVar127 * in_XMM2._12_4_;
            pfVar38 = (float *)(uVar21 + lVar25);
            *pfVar38 = (*pfVar36 - auVar77._0_4_ * fVar129) * in_XMM2._0_4_ + fVar129;
            pfVar38[1] = (fVar56 - auVar77._4_4_ * fVar121) * in_XMM2._4_4_ + fVar121;
            pfVar38[2] = (fVar122 - auVar77._8_4_ * fVar126) * in_XMM2._8_4_ + fVar126;
            pfVar38[3] = (fVar127 - auVar77._12_4_ * fVar128) * in_XMM2._12_4_ + fVar128;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar35,uVar31,uVar41,sVar6,_elempack,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      uVar26 = (ulong)uVar35;
      if ((int)uVar35 < 1) {
        uVar26 = 0;
      }
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      if ((int)uVar41 < 1) {
        uVar44 = 0;
      }
      for (iVar22 = 0; local_e8 = (int)uVar44, iVar22 != local_e8; iVar22 = iVar22 + 1) {
        ncnn::Mat::channel((Mat *)_b0,this_01,iVar22);
        uVar10 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_00,iVar22);
        lVar25 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_02,iVar22);
        lVar34 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          for (lVar32 = 0; uVar26 * 0x10 != lVar32; lVar32 = lVar32 + 0x10) {
            pfVar36 = (float *)(uVar10 + lVar32);
            fVar56 = pfVar36[1];
            fVar122 = pfVar36[2];
            fVar127 = pfVar36[3];
            auVar77 = *(undefined1 (*) [16])(lVar25 + lVar32);
            in_XMM2 = rcpps(in_XMM2,auVar77);
            fVar129 = *pfVar36 * in_XMM2._0_4_;
            fVar121 = fVar56 * in_XMM2._4_4_;
            fVar126 = fVar122 * in_XMM2._8_4_;
            fVar128 = fVar127 * in_XMM2._12_4_;
            pfVar38 = (float *)(lVar34 + lVar32);
            *pfVar38 = (*pfVar36 - auVar77._0_4_ * fVar129) * in_XMM2._0_4_ + fVar129;
            pfVar38[1] = (fVar56 - auVar77._4_4_ * fVar121) * in_XMM2._4_4_ + fVar121;
            pfVar38[2] = (fVar122 - auVar77._8_4_ * fVar126) * in_XMM2._8_4_ + fVar126;
            pfVar38[3] = (fVar127 - auVar77._12_4_ * fVar128) * in_XMM2._12_4_ + fVar128;
          }
          lVar25 = lVar25 + lVar32;
          lVar34 = lVar34 + lVar32;
        }
      }
      return 0;
    }
    if (this_01[1].dims == 3) {
      ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      if ((int)uVar29 < 1) {
        uVar29 = 0;
      }
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      uVar44 = (ulong)uVar30;
      if ((int)uVar30 < 1) {
        uVar44 = 0;
      }
      for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
        pfVar38 = (float *)((long)this_01->w * uVar26 * this_01->elemsize + (long)this_01->data);
        ncnn::Mat::channel((Mat *)_b0,this_00,(int)uVar26);
        pauVar27 = (undefined1 (*) [16])_b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
        pfVar36 = (float *)_b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          fVar56 = *pfVar38;
          fVar122 = pfVar38[1];
          fVar127 = pfVar38[2];
          fVar129 = pfVar38[3];
          uVar30 = uVar29;
          while (bVar45 = uVar30 != 0, uVar30 = uVar30 - 1, bVar45) {
            auVar77 = *pauVar27;
            in_XMM2 = rcpps(in_XMM2,auVar77);
            fVar121 = fVar56 * in_XMM2._0_4_;
            fVar126 = fVar122 * in_XMM2._4_4_;
            fVar128 = fVar127 * in_XMM2._8_4_;
            fVar130 = fVar129 * in_XMM2._12_4_;
            *pfVar36 = (fVar56 - auVar77._0_4_ * fVar121) * in_XMM2._0_4_ + fVar121;
            pfVar36[1] = (fVar122 - auVar77._4_4_ * fVar126) * in_XMM2._4_4_ + fVar126;
            pfVar36[2] = (fVar127 - auVar77._8_4_ * fVar128) * in_XMM2._8_4_ + fVar128;
            pfVar36[3] = (fVar129 - auVar77._12_4_ * fVar130) * in_XMM2._12_4_ + fVar130;
            pauVar27 = pauVar27 + 1;
            pfVar36 = pfVar36 + 4;
          }
          pfVar38 = pfVar38 + 4;
        }
      }
      return 0;
    }
    ncnn::Mat::create(this_02,uVar35,uVar42,sVar5,iVar22,opt->blob_allocator);
    pvVar9 = this_02->data;
    if ((pvVar9 != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) {
      if (this_01[1].dims != 1) {
        if (this_01[1].dims != 2) {
          return 0;
        }
        pvVar7 = this_01->data;
        pvVar8 = this_01[1].data;
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        lVar25 = 0;
        while (bVar45 = uVar28 != 0, uVar28 = uVar28 - 1, bVar45) {
          pfVar36 = (float *)((long)pvVar7 + lVar25);
          fVar56 = pfVar36[1];
          fVar122 = pfVar36[2];
          fVar127 = pfVar36[3];
          auVar77 = *(undefined1 (*) [16])((long)pvVar8 + lVar25);
          in_XMM2 = rcpps(in_XMM2,auVar77);
          fVar129 = *pfVar36 * in_XMM2._0_4_;
          fVar121 = fVar56 * in_XMM2._4_4_;
          fVar126 = fVar122 * in_XMM2._8_4_;
          fVar128 = fVar127 * in_XMM2._12_4_;
          pfVar38 = (float *)((long)pvVar9 + lVar25);
          *pfVar38 = (*pfVar36 - auVar77._0_4_ * fVar129) * in_XMM2._0_4_ + fVar129;
          pfVar38[1] = (fVar56 - auVar77._4_4_ * fVar121) * in_XMM2._4_4_ + fVar121;
          pfVar38[2] = (fVar122 - auVar77._8_4_ * fVar126) * in_XMM2._8_4_ + fVar126;
          pfVar38[3] = (fVar127 - auVar77._12_4_ * fVar128) * in_XMM2._12_4_ + fVar128;
          lVar25 = lVar25 + 0x10;
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar35,uVar42,sVar5,iVar22,opt->blob_allocator);
      pfVar36 = (float *)this_02->data;
      if (pfVar36 != (float *)0x0) {
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (_elempack == 1 && this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar56 = 1.0 / *this_01[1].data;
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          lVar25 = 0;
          while (bVar45 = uVar28 != 0, uVar28 = uVar28 - 1, bVar45) {
            pfVar38 = (float *)((long)pvVar9 + lVar25);
            fVar122 = pfVar38[1];
            fVar127 = pfVar38[2];
            fVar129 = pfVar38[3];
            pfVar1 = (float *)((long)pfVar36 + lVar25);
            *pfVar1 = *pfVar38 * fVar56;
            pfVar1[1] = fVar122 * fVar56;
            pfVar1[2] = fVar127 * fVar56;
            pfVar1[3] = fVar129 * fVar56;
            lVar25 = lVar25 + 0x10;
          }
          return 0;
        }
        pfVar38 = (float *)this_01->data;
        pauVar27 = (undefined1 (*) [16])this_01[1].data;
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        for (uVar29 = 0; uVar29 != uVar42; uVar29 = uVar29 + 1) {
          auVar77 = *pauVar27;
          in_XMM3 = rcpps(in_XMM3,auVar77);
          fVar56 = in_XMM3._0_4_;
          fVar122 = in_XMM3._4_4_;
          fVar127 = in_XMM3._8_4_;
          fVar129 = in_XMM3._12_4_;
          uVar31 = uVar35;
          while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
            fVar121 = pfVar38[1];
            fVar126 = pfVar38[2];
            fVar128 = pfVar38[3];
            *pfVar36 = *pfVar38 * ((1.0 - auVar77._0_4_ * fVar56) * fVar56 + fVar56);
            pfVar36[1] = fVar121 * ((1.0 - auVar77._4_4_ * fVar122) * fVar122 + fVar122);
            pfVar36[2] = fVar126 * ((1.0 - auVar77._8_4_ * fVar127) * fVar127 + fVar127);
            pfVar36[3] = fVar128 * ((1.0 - auVar77._12_4_ * fVar129) * fVar129 + fVar129);
            pfVar38 = pfVar38 + 4;
            pfVar36 = pfVar36 + 4;
          }
          pauVar27 = pauVar27 + 1;
        }
        return 0;
      }
    }
    break;
  case 4:
    uVar35 = this_01->w;
    sVar5 = this_01->elemsize;
    uVar29 = this_01[1].w;
    uVar31 = this_01[1].h;
    uVar30 = this_01[1].c;
    uVar23 = uVar31 * uVar29;
    sVar6 = this_01[1].elemsize;
    iVar4 = this_01->dims;
    if (iVar4 == 1) {
      iVar4 = this_01[1].dims;
      if (iVar22 != 1 || uVar35 != 1) {
        if (iVar4 == 1) {
          ncnn::Mat::create(this_02,uVar35,sVar5,iVar22,opt->blob_allocator);
          pvVar9 = this_02->data;
          if (pvVar9 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (_elempack == 1 && this_01[1].w == 1) {
            pvVar7 = this_01->data;
            uVar3 = *this_01[1].data;
            auVar48._4_4_ = uVar3;
            auVar48._0_4_ = uVar3;
            auVar48._8_4_ = uVar3;
            auVar48._12_4_ = uVar3;
            if ((int)uVar35 < 1) {
              uVar35 = 0;
            }
            lVar25 = 0;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              auVar77 = maxps(*(undefined1 (*) [16])((long)pvVar7 + lVar25),auVar48);
              *(undefined1 (*) [16])((long)pvVar9 + lVar25) = auVar77;
              lVar25 = lVar25 + 0x10;
            }
            return 0;
          }
          pvVar7 = this_01->data;
          pvVar8 = this_01[1].data;
          if ((int)uVar35 < 1) {
            uVar35 = 0;
          }
          lVar25 = 0;
          while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
            auVar77 = maxps(*(undefined1 (*) [16])((long)pvVar8 + lVar25),
                            *(undefined1 (*) [16])((long)pvVar7 + lVar25));
            *(undefined1 (*) [16])((long)pvVar9 + lVar25) = auVar77;
            lVar25 = lVar25 + 0x10;
          }
          return 0;
        }
        if (iVar4 != 2) {
          if (iVar4 != 3) {
            return 0;
          }
          ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar23 < 1) {
            uVar23 = 0;
          }
          uVar44 = (ulong)uVar30;
          if ((int)uVar30 < 1) {
            uVar44 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            pauVar2 = (undefined1 (*) [12])((long)this_01->data + uVar26 * 0x10);
            auVar20 = *pauVar2;
            fStack_cc = (float)((ulong)*(undefined8 *)((long)*pauVar2 + 8) >> 0x20);
            ncnn::Mat::channel((Mat *)_b0,this_00,(int)uVar26);
            uVar10 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
            uVar11 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            auVar12._12_4_ = fStack_cc;
            auVar12._0_12_ = auVar20;
            lVar25 = 0;
            uVar35 = uVar23;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              auVar77 = maxps(*(undefined1 (*) [16])(uVar10 + lVar25),auVar12);
              *(undefined1 (*) [16])(uVar11 + lVar25) = auVar77;
              lVar25 = lVar25 + 0x10;
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar29,uVar31,sVar6,_elempack,opt->blob_allocator);
        pauVar27 = (undefined1 (*) [16])this_02->data;
        if (pauVar27 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pauVar40 = (undefined1 (*) [16])this_01->data;
        pauVar37 = (undefined1 (*) [16])this_01[1].data;
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        if ((int)uVar31 < 1) {
          uVar31 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          auVar77 = *pauVar40;
          uVar30 = uVar29;
          while (bVar45 = uVar30 != 0, uVar30 = uVar30 - 1, bVar45) {
            auVar70 = maxps(*pauVar37,auVar77);
            *pauVar27 = auVar70;
            pauVar37 = pauVar37 + 1;
            pauVar27 = pauVar27 + 1;
          }
          pauVar40 = pauVar40 + 1;
        }
        return 0;
      }
      if (iVar4 == 1) {
        ncnn::Mat::create(this_02,uVar29,sVar6,_elempack,opt->blob_allocator);
        pvVar9 = this_02->data;
        if (pvVar9 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar7 = this_01[1].data;
        uVar3 = *this_01->data;
        auVar47._4_4_ = uVar3;
        auVar47._0_4_ = uVar3;
        auVar47._8_4_ = uVar3;
        auVar47._12_4_ = uVar3;
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        lVar25 = 0;
        while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
          auVar77 = maxps(*(undefined1 (*) [16])((long)pvVar7 + lVar25),auVar47);
          *(undefined1 (*) [16])((long)pvVar9 + lVar25) = auVar77;
          lVar25 = lVar25 + 0x10;
        }
        return 0;
      }
      if (iVar4 != 2) {
        if (iVar4 != 3) {
          return 0;
        }
        ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar3 = *this_01->data;
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar30 < 1) {
          uVar30 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          auVar18._4_4_ = uVar3;
          auVar18._0_4_ = uVar3;
          auVar18._8_4_ = uVar3;
          auVar18._12_4_ = uVar3;
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            auVar77 = maxps(*(undefined1 (*) [16])(uVar10 + lVar25),auVar18);
            *(undefined1 (*) [16])(uVar11 + lVar25) = auVar77;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar29,uVar31,sVar6,_elempack,opt->blob_allocator);
      pvVar9 = this_02->data;
      if (pvVar9 == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      pvVar7 = this_01[1].data;
      uVar3 = *this_01->data;
      auVar46._4_4_ = uVar3;
      auVar46._0_4_ = uVar3;
      auVar46._8_4_ = uVar3;
      auVar46._12_4_ = uVar3;
      if ((int)uVar23 < 1) {
        uVar23 = 0;
      }
      lVar25 = 0;
      while (bVar45 = uVar23 != 0, uVar23 = uVar23 - 1, bVar45) {
        auVar77 = maxps(*(undefined1 (*) [16])((long)pvVar7 + lVar25),auVar46);
        *(undefined1 (*) [16])((long)pvVar9 + lVar25) = auVar77;
        lVar25 = lVar25 + 0x10;
      }
      return 0;
    }
    uVar42 = this_01->h;
    uVar28 = uVar42 * uVar35;
    if (iVar4 != 2) {
      if (iVar4 != 3) {
        return 0;
      }
      uVar41 = this_01->c;
      uVar44 = (ulong)uVar41;
      if (this_01[1].dims != 3) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims == 1) {
          if (_elempack == 1 && this_01[1].w == 1) {
            uVar3 = *this_00->data;
            if ((int)uVar28 < 1) {
              uVar28 = 0;
            }
            if ((int)uVar41 < 1) {
              uVar41 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
              ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
              uVar10 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
              uVar11 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              auVar14._4_4_ = uVar3;
              auVar14._0_4_ = uVar3;
              auVar14._8_4_ = uVar3;
              auVar14._12_4_ = uVar3;
              lVar25 = 0;
              uVar29 = uVar28;
              while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
                auVar77 = maxps(*(undefined1 (*) [16])(uVar10 + lVar25),auVar14);
                *(undefined1 (*) [16])(uVar11 + lVar25) = auVar77;
                lVar25 = lVar25 + 0x10;
              }
            }
            return 0;
          }
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          if ((int)uVar41 < 1) {
            uVar44 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            ncnn::Mat::channel((Mat *)_b0,this_01,(int)uVar26);
            uVar10 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            pauVar2 = (undefined1 (*) [12])((long)this_01[1].data + uVar26 * 0x10);
            auVar20 = *pauVar2;
            fStack_cc = (float)((ulong)*(undefined8 *)((long)*pauVar2 + 8) >> 0x20);
            ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
            uVar11 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            auVar16._12_4_ = fStack_cc;
            auVar16._0_12_ = auVar20;
            lVar25 = 0;
            uVar35 = uVar28;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              auVar77 = maxps(*(undefined1 (*) [16])(uVar10 + lVar25),auVar16);
              *(undefined1 (*) [16])(uVar11 + lVar25) = auVar77;
              lVar25 = lVar25 + 0x10;
            }
          }
          return 0;
        }
        if (this_01[1].dims != 2) {
          return 0;
        }
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar44 = 0;
        }
        for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,(int)uVar26);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          pauVar37 = (undefined1 (*) [16])
                     ((long)this_01[1].w * uVar26 * this_01[1].elemsize + (long)this_01[1].data);
          ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
          pauVar40 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar29 = 0; uVar29 != uVar42; uVar29 = uVar29 + 1) {
            auVar77 = *pauVar37;
            uVar31 = uVar35;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar70 = maxps(*pauVar27,auVar77);
              *pauVar40 = auVar70;
              pauVar27 = pauVar27 + 1;
              pauVar40 = pauVar40 + 1;
            }
            pauVar37 = pauVar37 + 1;
          }
        }
        return 0;
      }
      uVar24 = uVar30 ^ uVar41;
      if (((uVar29 ^ 1) == 0 && (uVar31 ^ 1) == 0) && uVar24 == 0) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          auVar77 = *(undefined1 (*) [16])uVar21;
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            auVar70 = maxps(*(undefined1 (*) [16])(uVar10 + lVar25),auVar77);
            *(undefined1 (*) [16])(uVar11 + lVar25) = auVar70;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      if ((uVar29 == uVar35) && (_elempack == 1 && (uVar30 == 1 && uVar31 == uVar42))) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          pvVar9 = this_01[1].data;
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            uVar3 = *(undefined4 *)((long)pvVar9 + lVar25);
            auVar71._4_4_ = uVar3;
            auVar71._0_4_ = uVar3;
            auVar71._8_4_ = uVar3;
            auVar71._12_4_ = uVar3;
            auVar77 = maxps(auVar71,*(undefined1 (*) [16])(uVar10 + lVar25 * 4));
            *(undefined1 (*) [16])(uVar11 + lVar25 * 4) = auVar77;
            lVar25 = lVar25 + 4;
          }
        }
        return 0;
      }
      if (((uVar35 ^ 1) == 0 && (uVar42 ^ 1) == 0) && uVar24 == 0) {
        ncnn::Mat::create(this_02,uVar29,uVar31,uVar41,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          auVar77 = *(undefined1 (*) [16])uVar10;
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            auVar70 = maxps(*(undefined1 (*) [16])(uVar21 + lVar25),auVar77);
            *(undefined1 (*) [16])(uVar11 + lVar25) = auVar70;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      if ((((uVar29 == uVar35) && (iVar22 == 1)) && (uVar31 == uVar42)) && (uVar41 == 1)) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar30,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar30 < 1) {
          uVar30 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
          pvVar9 = this_01->data;
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            uVar3 = *(undefined4 *)((long)pvVar9 + lVar25);
            auVar52._4_4_ = uVar3;
            auVar52._0_4_ = uVar3;
            auVar52._8_4_ = uVar3;
            auVar52._12_4_ = uVar3;
            auVar77 = maxps(*(undefined1 (*) [16])(uVar10 + lVar25 * 4),auVar52);
            *(undefined1 (*) [16])(uVar11 + lVar25 * 4) = auVar77;
            lVar25 = lVar25 + 4;
          }
        }
        return 0;
      }
      if ((((uVar29 ^ 1) == 0 && (uVar31 ^ uVar42) == 0) && uVar24 == 0) && uVar35 != 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        uVar44 = (ulong)uVar42;
        if ((int)uVar42 < 1) {
          uVar44 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar29 = 0; uVar29 != uVar41; uVar29 = uVar29 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar29);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar29);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar29);
          pauVar40 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            auVar77 = *(undefined1 (*) [16])(uVar10 + uVar26 * 0x10);
            uVar31 = uVar35;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar70 = maxps(*pauVar27,auVar77);
              *pauVar40 = auVar70;
              pauVar27 = pauVar27 + 1;
              pauVar40 = pauVar40 + 1;
            }
          }
        }
        return 0;
      }
      if ((((uVar31 ^ 1) == 0 && (uVar29 ^ uVar35) == 0) && uVar24 == 0) && uVar42 != 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar26 = (ulong)uVar35;
        if ((int)uVar35 < 1) {
          uVar26 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar44 = 0;
        }
        for (iVar22 = 0; iVar22 != (int)uVar44; iVar22 = iVar22 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,iVar22);
          lVar25 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,iVar22);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,iVar22);
          lVar34 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar35 = 0; uVar35 != uVar42; uVar35 = uVar35 + 1) {
            for (lVar32 = 0; uVar26 * 0x10 != lVar32; lVar32 = lVar32 + 0x10) {
              auVar77 = maxps(*(undefined1 (*) [16])(uVar10 + lVar32),
                              *(undefined1 (*) [16])(lVar25 + lVar32));
              *(undefined1 (*) [16])(lVar34 + lVar32) = auVar77;
            }
            lVar25 = lVar25 + lVar32;
            lVar34 = lVar34 + lVar32;
          }
        }
        return 0;
      }
      if ((((uVar35 ^ 1) == 0 && (uVar31 ^ uVar42) == 0) && uVar24 == 0) && uVar29 != 1) {
        ncnn::Mat::create(this_02,uVar29,uVar42,uVar41,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        uVar44 = (ulong)uVar42;
        if ((int)uVar42 < 1) {
          uVar44 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          pauVar40 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            auVar77 = *(undefined1 (*) [16])(uVar10 + uVar26 * 0x10);
            uVar31 = uVar29;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar70 = maxps(*pauVar27,auVar77);
              *pauVar40 = auVar70;
              pauVar27 = pauVar27 + 1;
              pauVar40 = pauVar40 + 1;
            }
          }
        }
        return 0;
      }
      if ((((uVar29 ^ uVar35) != 0 || (uVar42 ^ 1) != 0) || uVar24 != 0) || uVar31 == 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            auVar77 = maxps(*(undefined1 (*) [16])(uVar11 + lVar25),
                            *(undefined1 (*) [16])(uVar10 + lVar25));
            *(undefined1 (*) [16])(uVar21 + lVar25) = auVar77;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar35,uVar31,uVar41,sVar6,_elempack,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      uVar26 = (ulong)uVar35;
      if ((int)uVar35 < 1) {
        uVar26 = 0;
      }
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      if ((int)uVar41 < 1) {
        uVar44 = 0;
      }
      for (iVar22 = 0; local_e8 = (int)uVar44, iVar22 != local_e8; iVar22 = iVar22 + 1) {
        ncnn::Mat::channel((Mat *)_b0,this_01,iVar22);
        uVar10 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_00,iVar22);
        lVar25 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_02,iVar22);
        lVar34 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          for (lVar32 = 0; uVar26 * 0x10 != lVar32; lVar32 = lVar32 + 0x10) {
            auVar77 = maxps(*(undefined1 (*) [16])(lVar25 + lVar32),
                            *(undefined1 (*) [16])(uVar10 + lVar32));
            *(undefined1 (*) [16])(lVar34 + lVar32) = auVar77;
          }
          lVar25 = lVar25 + lVar32;
          lVar34 = lVar34 + lVar32;
        }
      }
      return 0;
    }
    if (this_01[1].dims == 3) {
      ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      if ((int)uVar29 < 1) {
        uVar29 = 0;
      }
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      uVar44 = (ulong)uVar30;
      if ((int)uVar30 < 1) {
        uVar44 = 0;
      }
      for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
        pauVar37 = (undefined1 (*) [16])
                   ((long)this_01->w * uVar26 * this_01->elemsize + (long)this_01->data);
        ncnn::Mat::channel((Mat *)_b0,this_00,(int)uVar26);
        pauVar27 = (undefined1 (*) [16])_b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
        pauVar40 = (undefined1 (*) [16])_b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          auVar77 = *pauVar37;
          uVar30 = uVar29;
          while (bVar45 = uVar30 != 0, uVar30 = uVar30 - 1, bVar45) {
            auVar70 = maxps(*pauVar27,auVar77);
            *pauVar40 = auVar70;
            pauVar27 = pauVar27 + 1;
            pauVar40 = pauVar40 + 1;
          }
          pauVar37 = pauVar37 + 1;
        }
      }
      return 0;
    }
    ncnn::Mat::create(this_02,uVar35,uVar42,sVar5,iVar22,opt->blob_allocator);
    pvVar9 = this_02->data;
    if ((pvVar9 != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) {
      if (this_01[1].dims != 1) {
        if (this_01[1].dims != 2) {
          return 0;
        }
        pvVar7 = this_01->data;
        pvVar8 = this_01[1].data;
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        lVar25 = 0;
        while (bVar45 = uVar28 != 0, uVar28 = uVar28 - 1, bVar45) {
          auVar77 = maxps(*(undefined1 (*) [16])((long)pvVar8 + lVar25),
                          *(undefined1 (*) [16])((long)pvVar7 + lVar25));
          *(undefined1 (*) [16])((long)pvVar9 + lVar25) = auVar77;
          lVar25 = lVar25 + 0x10;
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar35,uVar42,sVar5,iVar22,opt->blob_allocator);
      pauVar27 = (undefined1 (*) [16])this_02->data;
      if (pauVar27 != (undefined1 (*) [16])0x0) {
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (_elempack == 1 && this_01[1].w == 1) {
          pvVar9 = this_01->data;
          uVar3 = *this_01[1].data;
          auVar54._4_4_ = uVar3;
          auVar54._0_4_ = uVar3;
          auVar54._8_4_ = uVar3;
          auVar54._12_4_ = uVar3;
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          lVar25 = 0;
          while (bVar45 = uVar28 != 0, uVar28 = uVar28 - 1, bVar45) {
            auVar77 = maxps(*(undefined1 (*) [16])((long)pvVar9 + lVar25),auVar54);
            *(undefined1 (*) [16])((long)*pauVar27 + lVar25) = auVar77;
            lVar25 = lVar25 + 0x10;
          }
          return 0;
        }
        pauVar40 = (undefined1 (*) [16])this_01->data;
        pauVar37 = (undefined1 (*) [16])this_01[1].data;
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        for (uVar29 = 0; uVar29 != uVar42; uVar29 = uVar29 + 1) {
          auVar77 = *pauVar37;
          uVar31 = uVar35;
          while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
            auVar70 = maxps(*pauVar40,auVar77);
            *pauVar27 = auVar70;
            pauVar40 = pauVar40 + 1;
            pauVar27 = pauVar27 + 1;
          }
          pauVar37 = pauVar37 + 1;
        }
        return 0;
      }
    }
    break;
  case 5:
    uVar35 = this_01->w;
    sVar5 = this_01->elemsize;
    uVar29 = this_01[1].w;
    uVar31 = this_01[1].h;
    uVar30 = this_01[1].c;
    uVar23 = uVar31 * uVar29;
    sVar6 = this_01[1].elemsize;
    iVar4 = this_01->dims;
    if (iVar4 == 1) {
      iVar4 = this_01[1].dims;
      if (iVar22 != 1 || uVar35 != 1) {
        if (iVar4 == 1) {
          ncnn::Mat::create(this_02,uVar35,sVar5,iVar22,opt->blob_allocator);
          pvVar9 = this_02->data;
          if (pvVar9 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (_elempack == 1 && this_01[1].w == 1) {
            pvVar7 = this_01->data;
            uVar3 = *this_01[1].data;
            auVar51._4_4_ = uVar3;
            auVar51._0_4_ = uVar3;
            auVar51._8_4_ = uVar3;
            auVar51._12_4_ = uVar3;
            if ((int)uVar35 < 1) {
              uVar35 = 0;
            }
            lVar25 = 0;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              auVar77 = minps(*(undefined1 (*) [16])((long)pvVar7 + lVar25),auVar51);
              *(undefined1 (*) [16])((long)pvVar9 + lVar25) = auVar77;
              lVar25 = lVar25 + 0x10;
            }
            return 0;
          }
          pvVar7 = this_01->data;
          pvVar8 = this_01[1].data;
          if ((int)uVar35 < 1) {
            uVar35 = 0;
          }
          lVar25 = 0;
          while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
            auVar77 = minps(*(undefined1 (*) [16])((long)pvVar8 + lVar25),
                            *(undefined1 (*) [16])((long)pvVar7 + lVar25));
            *(undefined1 (*) [16])((long)pvVar9 + lVar25) = auVar77;
            lVar25 = lVar25 + 0x10;
          }
          return 0;
        }
        if (iVar4 != 2) {
          if (iVar4 != 3) {
            return 0;
          }
          ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar23 < 1) {
            uVar23 = 0;
          }
          uVar44 = (ulong)uVar30;
          if ((int)uVar30 < 1) {
            uVar44 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            pauVar2 = (undefined1 (*) [12])((long)this_01->data + uVar26 * 0x10);
            auVar20 = *pauVar2;
            fStack_cc = (float)((ulong)*(undefined8 *)((long)*pauVar2 + 8) >> 0x20);
            ncnn::Mat::channel((Mat *)_b0,this_00,(int)uVar26);
            uVar10 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
            uVar11 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            auVar13._12_4_ = fStack_cc;
            auVar13._0_12_ = auVar20;
            lVar25 = 0;
            uVar35 = uVar23;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              auVar77 = minps(*(undefined1 (*) [16])(uVar10 + lVar25),auVar13);
              *(undefined1 (*) [16])(uVar11 + lVar25) = auVar77;
              lVar25 = lVar25 + 0x10;
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar29,uVar31,sVar6,_elempack,opt->blob_allocator);
        pauVar27 = (undefined1 (*) [16])this_02->data;
        if (pauVar27 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pauVar40 = (undefined1 (*) [16])this_01->data;
        pauVar37 = (undefined1 (*) [16])this_01[1].data;
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        if ((int)uVar31 < 1) {
          uVar31 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          auVar77 = *pauVar40;
          uVar30 = uVar29;
          while (bVar45 = uVar30 != 0, uVar30 = uVar30 - 1, bVar45) {
            auVar70 = minps(*pauVar37,auVar77);
            *pauVar27 = auVar70;
            pauVar37 = pauVar37 + 1;
            pauVar27 = pauVar27 + 1;
          }
          pauVar40 = pauVar40 + 1;
        }
        return 0;
      }
      if (iVar4 == 1) {
        ncnn::Mat::create(this_02,uVar29,sVar6,_elempack,opt->blob_allocator);
        pvVar9 = this_02->data;
        if (pvVar9 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar7 = this_01[1].data;
        uVar3 = *this_01->data;
        auVar50._4_4_ = uVar3;
        auVar50._0_4_ = uVar3;
        auVar50._8_4_ = uVar3;
        auVar50._12_4_ = uVar3;
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        lVar25 = 0;
        while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
          auVar77 = minps(*(undefined1 (*) [16])((long)pvVar7 + lVar25),auVar50);
          *(undefined1 (*) [16])((long)pvVar9 + lVar25) = auVar77;
          lVar25 = lVar25 + 0x10;
        }
        return 0;
      }
      if (iVar4 != 2) {
        if (iVar4 != 3) {
          return 0;
        }
        ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar3 = *this_01->data;
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar30 < 1) {
          uVar30 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          auVar19._4_4_ = uVar3;
          auVar19._0_4_ = uVar3;
          auVar19._8_4_ = uVar3;
          auVar19._12_4_ = uVar3;
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            auVar77 = minps(*(undefined1 (*) [16])(uVar10 + lVar25),auVar19);
            *(undefined1 (*) [16])(uVar11 + lVar25) = auVar77;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar29,uVar31,sVar6,_elempack,opt->blob_allocator);
      pvVar9 = this_02->data;
      if (pvVar9 == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      pvVar7 = this_01[1].data;
      uVar3 = *this_01->data;
      auVar49._4_4_ = uVar3;
      auVar49._0_4_ = uVar3;
      auVar49._8_4_ = uVar3;
      auVar49._12_4_ = uVar3;
      if ((int)uVar23 < 1) {
        uVar23 = 0;
      }
      lVar25 = 0;
      while (bVar45 = uVar23 != 0, uVar23 = uVar23 - 1, bVar45) {
        auVar77 = minps(*(undefined1 (*) [16])((long)pvVar7 + lVar25),auVar49);
        *(undefined1 (*) [16])((long)pvVar9 + lVar25) = auVar77;
        lVar25 = lVar25 + 0x10;
      }
      return 0;
    }
    uVar42 = this_01->h;
    uVar28 = uVar42 * uVar35;
    if (iVar4 != 2) {
      if (iVar4 != 3) {
        return 0;
      }
      uVar41 = this_01->c;
      uVar44 = (ulong)uVar41;
      if (this_01[1].dims != 3) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims == 1) {
          if (_elempack == 1 && this_01[1].w == 1) {
            uVar3 = *this_00->data;
            if ((int)uVar28 < 1) {
              uVar28 = 0;
            }
            if ((int)uVar41 < 1) {
              uVar41 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
              ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
              uVar10 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
              uVar11 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              auVar15._4_4_ = uVar3;
              auVar15._0_4_ = uVar3;
              auVar15._8_4_ = uVar3;
              auVar15._12_4_ = uVar3;
              lVar25 = 0;
              uVar29 = uVar28;
              while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
                auVar77 = minps(*(undefined1 (*) [16])(uVar10 + lVar25),auVar15);
                *(undefined1 (*) [16])(uVar11 + lVar25) = auVar77;
                lVar25 = lVar25 + 0x10;
              }
            }
            return 0;
          }
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          if ((int)uVar41 < 1) {
            uVar44 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            ncnn::Mat::channel((Mat *)_b0,this_01,(int)uVar26);
            uVar10 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            pauVar2 = (undefined1 (*) [12])((long)this_01[1].data + uVar26 * 0x10);
            auVar20 = *pauVar2;
            fStack_cc = (float)((ulong)*(undefined8 *)((long)*pauVar2 + 8) >> 0x20);
            ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
            uVar11 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            auVar17._12_4_ = fStack_cc;
            auVar17._0_12_ = auVar20;
            lVar25 = 0;
            uVar35 = uVar28;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              auVar77 = minps(*(undefined1 (*) [16])(uVar10 + lVar25),auVar17);
              *(undefined1 (*) [16])(uVar11 + lVar25) = auVar77;
              lVar25 = lVar25 + 0x10;
            }
          }
          return 0;
        }
        if (this_01[1].dims != 2) {
          return 0;
        }
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar44 = 0;
        }
        for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,(int)uVar26);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          pauVar37 = (undefined1 (*) [16])
                     ((long)this_01[1].w * uVar26 * this_01[1].elemsize + (long)this_01[1].data);
          ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
          pauVar40 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar29 = 0; uVar29 != uVar42; uVar29 = uVar29 + 1) {
            auVar77 = *pauVar37;
            uVar31 = uVar35;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar70 = minps(*pauVar27,auVar77);
              *pauVar40 = auVar70;
              pauVar27 = pauVar27 + 1;
              pauVar40 = pauVar40 + 1;
            }
            pauVar37 = pauVar37 + 1;
          }
        }
        return 0;
      }
      uVar24 = uVar30 ^ uVar41;
      if (((uVar29 ^ 1) == 0 && (uVar31 ^ 1) == 0) && uVar24 == 0) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          auVar77 = *(undefined1 (*) [16])uVar21;
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            auVar70 = minps(*(undefined1 (*) [16])(uVar10 + lVar25),auVar77);
            *(undefined1 (*) [16])(uVar11 + lVar25) = auVar70;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      if ((uVar29 == uVar35) && (_elempack == 1 && (uVar30 == 1 && uVar31 == uVar42))) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          pvVar9 = this_01[1].data;
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            uVar3 = *(undefined4 *)((long)pvVar9 + lVar25);
            auVar76._4_4_ = uVar3;
            auVar76._0_4_ = uVar3;
            auVar76._8_4_ = uVar3;
            auVar76._12_4_ = uVar3;
            auVar77 = minps(auVar76,*(undefined1 (*) [16])(uVar10 + lVar25 * 4));
            *(undefined1 (*) [16])(uVar11 + lVar25 * 4) = auVar77;
            lVar25 = lVar25 + 4;
          }
        }
        return 0;
      }
      if (((uVar35 ^ 1) == 0 && (uVar42 ^ 1) == 0) && uVar24 == 0) {
        ncnn::Mat::create(this_02,uVar29,uVar31,uVar41,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          auVar77 = *(undefined1 (*) [16])uVar10;
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            auVar70 = minps(*(undefined1 (*) [16])(uVar21 + lVar25),auVar77);
            *(undefined1 (*) [16])(uVar11 + lVar25) = auVar70;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      if (((uVar29 == uVar35) && (iVar22 == 1)) && ((uVar31 == uVar42 && (uVar41 == 1)))) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar30,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar30 < 1) {
          uVar30 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
          pvVar9 = this_01->data;
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            uVar3 = *(undefined4 *)((long)pvVar9 + lVar25);
            auVar53._4_4_ = uVar3;
            auVar53._0_4_ = uVar3;
            auVar53._8_4_ = uVar3;
            auVar53._12_4_ = uVar3;
            auVar77 = minps(*(undefined1 (*) [16])(uVar10 + lVar25 * 4),auVar53);
            *(undefined1 (*) [16])(uVar11 + lVar25 * 4) = auVar77;
            lVar25 = lVar25 + 4;
          }
        }
        return 0;
      }
      if ((((uVar29 ^ 1) == 0 && (uVar31 ^ uVar42) == 0) && uVar24 == 0) && uVar35 != 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        uVar44 = (ulong)uVar42;
        if ((int)uVar42 < 1) {
          uVar44 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar29 = 0; uVar29 != uVar41; uVar29 = uVar29 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar29);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar29);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar29);
          pauVar40 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            auVar77 = *(undefined1 (*) [16])(uVar10 + uVar26 * 0x10);
            uVar31 = uVar35;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar70 = minps(*pauVar27,auVar77);
              *pauVar40 = auVar70;
              pauVar27 = pauVar27 + 1;
              pauVar40 = pauVar40 + 1;
            }
          }
        }
        return 0;
      }
      if ((((uVar31 ^ 1) == 0 && (uVar29 ^ uVar35) == 0) && uVar24 == 0) && uVar42 != 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar26 = (ulong)uVar35;
        if ((int)uVar35 < 1) {
          uVar26 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar44 = 0;
        }
        for (iVar22 = 0; iVar22 != (int)uVar44; iVar22 = iVar22 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,iVar22);
          lVar25 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,iVar22);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,iVar22);
          lVar34 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar35 = 0; uVar35 != uVar42; uVar35 = uVar35 + 1) {
            for (lVar32 = 0; uVar26 * 0x10 != lVar32; lVar32 = lVar32 + 0x10) {
              auVar77 = minps(*(undefined1 (*) [16])(uVar10 + lVar32),
                              *(undefined1 (*) [16])(lVar25 + lVar32));
              *(undefined1 (*) [16])(lVar34 + lVar32) = auVar77;
            }
            lVar25 = lVar25 + lVar32;
            lVar34 = lVar34 + lVar32;
          }
        }
        return 0;
      }
      if ((((uVar35 ^ 1) == 0 && (uVar31 ^ uVar42) == 0) && uVar24 == 0) && uVar29 != 1) {
        ncnn::Mat::create(this_02,uVar29,uVar42,uVar41,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        uVar44 = (ulong)uVar42;
        if ((int)uVar42 < 1) {
          uVar44 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          pauVar40 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            auVar77 = *(undefined1 (*) [16])(uVar10 + uVar26 * 0x10);
            uVar31 = uVar29;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar70 = minps(*pauVar27,auVar77);
              *pauVar40 = auVar70;
              pauVar27 = pauVar27 + 1;
              pauVar40 = pauVar40 + 1;
            }
          }
        }
        return 0;
      }
      if ((((uVar29 ^ uVar35) != 0 || (uVar42 ^ 1) != 0) || uVar24 != 0) || uVar31 == 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            auVar77 = minps(*(undefined1 (*) [16])(uVar11 + lVar25),
                            *(undefined1 (*) [16])(uVar10 + lVar25));
            *(undefined1 (*) [16])(uVar21 + lVar25) = auVar77;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar35,uVar31,uVar41,sVar6,_elempack,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      uVar26 = (ulong)uVar35;
      if ((int)uVar35 < 1) {
        uVar26 = 0;
      }
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      if ((int)uVar41 < 1) {
        uVar44 = 0;
      }
      for (iVar22 = 0; local_e8 = (int)uVar44, iVar22 != local_e8; iVar22 = iVar22 + 1) {
        ncnn::Mat::channel((Mat *)_b0,this_01,iVar22);
        uVar10 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_00,iVar22);
        lVar25 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_02,iVar22);
        lVar34 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          for (lVar32 = 0; uVar26 * 0x10 != lVar32; lVar32 = lVar32 + 0x10) {
            auVar77 = minps(*(undefined1 (*) [16])(lVar25 + lVar32),
                            *(undefined1 (*) [16])(uVar10 + lVar32));
            *(undefined1 (*) [16])(lVar34 + lVar32) = auVar77;
          }
          lVar25 = lVar25 + lVar32;
          lVar34 = lVar34 + lVar32;
        }
      }
      return 0;
    }
    if (this_01[1].dims == 3) {
      ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      if ((int)uVar29 < 1) {
        uVar29 = 0;
      }
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      uVar44 = (ulong)uVar30;
      if ((int)uVar30 < 1) {
        uVar44 = 0;
      }
      for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
        pauVar37 = (undefined1 (*) [16])
                   ((long)this_01->w * uVar26 * this_01->elemsize + (long)this_01->data);
        ncnn::Mat::channel((Mat *)_b0,this_00,(int)uVar26);
        pauVar27 = (undefined1 (*) [16])_b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
        pauVar40 = (undefined1 (*) [16])_b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          auVar77 = *pauVar37;
          uVar30 = uVar29;
          while (bVar45 = uVar30 != 0, uVar30 = uVar30 - 1, bVar45) {
            auVar70 = minps(*pauVar27,auVar77);
            *pauVar40 = auVar70;
            pauVar27 = pauVar27 + 1;
            pauVar40 = pauVar40 + 1;
          }
          pauVar37 = pauVar37 + 1;
        }
      }
      return 0;
    }
    ncnn::Mat::create(this_02,uVar35,uVar42,sVar5,iVar22,opt->blob_allocator);
    pvVar9 = this_02->data;
    if ((pvVar9 != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) {
      if (this_01[1].dims != 1) {
        if (this_01[1].dims != 2) {
          return 0;
        }
        pvVar7 = this_01->data;
        pvVar8 = this_01[1].data;
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        lVar25 = 0;
        while (bVar45 = uVar28 != 0, uVar28 = uVar28 - 1, bVar45) {
          auVar77 = minps(*(undefined1 (*) [16])((long)pvVar8 + lVar25),
                          *(undefined1 (*) [16])((long)pvVar7 + lVar25));
          *(undefined1 (*) [16])((long)pvVar9 + lVar25) = auVar77;
          lVar25 = lVar25 + 0x10;
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar35,uVar42,sVar5,iVar22,opt->blob_allocator);
      pauVar27 = (undefined1 (*) [16])this_02->data;
      if (pauVar27 != (undefined1 (*) [16])0x0) {
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (_elempack == 1 && this_01[1].w == 1) {
          pvVar9 = this_01->data;
          uVar3 = *this_01[1].data;
          auVar55._4_4_ = uVar3;
          auVar55._0_4_ = uVar3;
          auVar55._8_4_ = uVar3;
          auVar55._12_4_ = uVar3;
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          lVar25 = 0;
          while (bVar45 = uVar28 != 0, uVar28 = uVar28 - 1, bVar45) {
            auVar77 = minps(*(undefined1 (*) [16])((long)pvVar9 + lVar25),auVar55);
            *(undefined1 (*) [16])((long)*pauVar27 + lVar25) = auVar77;
            lVar25 = lVar25 + 0x10;
          }
          return 0;
        }
        pauVar40 = (undefined1 (*) [16])this_01->data;
        pauVar37 = (undefined1 (*) [16])this_01[1].data;
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        for (uVar29 = 0; uVar29 != uVar42; uVar29 = uVar29 + 1) {
          auVar77 = *pauVar37;
          uVar31 = uVar35;
          while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
            auVar70 = minps(*pauVar40,auVar77);
            *pauVar27 = auVar70;
            pauVar40 = pauVar40 + 1;
            pauVar27 = pauVar27 + 1;
          }
          pauVar37 = pauVar37 + 1;
        }
        return 0;
      }
    }
    break;
  case 6:
    uVar35 = this_01->w;
    uVar44 = (ulong)uVar35;
    sVar5 = this_01->elemsize;
    uVar29 = this_01[1].w;
    uVar31 = this_01[1].h;
    uVar30 = this_01[1].c;
    uVar26 = (ulong)uVar30;
    uVar23 = uVar31 * uVar29;
    sVar6 = this_01[1].elemsize;
    iVar4 = this_01->dims;
    if (iVar4 == 1) {
      iVar4 = this_01[1].dims;
      if (iVar22 == 1 && uVar35 == 1) {
        if (iVar4 == 1) {
          ncnn::Mat::create(this_02,uVar29,sVar6,_elempack,opt->blob_allocator);
          pvVar9 = this_02->data;
          if (pvVar9 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          _b0[1] = *this_01->data;
          _b0[0] = _b0[1];
          _b0[3] = _b0[1];
          _b0[2] = _b0[1];
          pvVar7 = this_01[1].data;
          uVar26 = 0;
          uVar44 = (ulong)uVar29;
          if ((int)uVar29 < 1) {
            uVar44 = uVar26;
          }
          while (iVar22 = (int)uVar44, uVar44 = (ulong)(iVar22 - 1), iVar22 != 0) {
            pfVar36 = (float *)((long)pvVar7 + uVar26);
            _p._0_8_ = *(undefined8 *)pfVar36;
            _p._8_8_ = *(undefined8 *)(pfVar36 + 2);
            afVar131 = binary_op_pow_pack4::operator()(&op,&_b0,&_p);
            puVar33 = (undefined8 *)((long)pvVar9 + uVar26);
            *puVar33 = afVar131._0_8_;
            puVar33[1] = extraout_XMM0_Qb_09;
            uVar26 = uVar26 + 0x10;
          }
        }
        else if (iVar4 == 2) {
          ncnn::Mat::create(this_02,uVar29,uVar31,sVar6,_elempack,opt->blob_allocator);
          pvVar9 = this_02->data;
          if (pvVar9 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          _b0[1] = *this_01->data;
          _b0[0] = _b0[1];
          _b0[3] = _b0[1];
          _b0[2] = _b0[1];
          pvVar7 = this_01[1].data;
          uVar26 = 0;
          uVar44 = (ulong)uVar23;
          if ((int)uVar23 < 1) {
            uVar44 = uVar26;
          }
          while (iVar22 = (int)uVar44, uVar44 = (ulong)(iVar22 - 1), iVar22 != 0) {
            pfVar36 = (float *)((long)pvVar7 + uVar26);
            _p._0_8_ = *(undefined8 *)pfVar36;
            _p._8_8_ = *(undefined8 *)(pfVar36 + 2);
            afVar131 = binary_op_pow_pack4::operator()(&op,&_b0,&_p);
            puVar33 = (undefined8 *)((long)pvVar9 + uVar26);
            *puVar33 = afVar131._0_8_;
            puVar33[1] = extraout_XMM0_Qb_07;
            uVar26 = uVar26 + 0x10;
          }
        }
        else {
          if (iVar4 != 3) {
            return 0;
          }
          ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          _p[1] = *this_01->data;
          _p[0] = _p[1];
          _p[3] = _p[1];
          _p[2] = _p[1];
          uVar35 = 0;
          if ((int)uVar23 < 1) {
            uVar23 = 0;
          }
          if ((int)uVar30 < 1) {
            uVar30 = 0;
          }
          for (; uVar35 != uVar30; uVar35 = uVar35 + 1) {
            ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
            uVar10 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
            uVar11 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            lVar25 = 0;
            uVar29 = uVar23;
            while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
              _b0._0_8_ = *(undefined8 *)(uVar10 + lVar25);
              _b0._8_8_ = *(undefined8 *)((float *)(uVar10 + lVar25) + 2);
              afVar131 = binary_op_pow_pack4::operator()(&op,&_p,&_b0);
              *(undefined8 *)(uVar11 + lVar25) = afVar131._0_8_;
              ((undefined8 *)(uVar11 + lVar25))[1] = extraout_XMM0_Qb_01;
              lVar25 = lVar25 + 0x10;
            }
          }
        }
      }
      else {
        if (iVar4 != 1) {
          if (iVar4 == 2) {
            ncnn::Mat::create(this_02,uVar29,uVar31,sVar6,_elempack,opt->blob_allocator);
            puVar33 = (undefined8 *)this_02->data;
            if (puVar33 == (undefined8 *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            pfVar36 = (float *)this_01->data;
            if ((int)uVar29 < 1) {
              uVar29 = 0;
            }
            pfVar38 = (float *)this_01[1].data;
            if ((int)uVar31 < 1) {
              uVar31 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
              _b0._0_8_ = *(undefined8 *)pfVar36;
              _b0._8_8_ = *(undefined8 *)(pfVar36 + 2);
              uVar30 = uVar29;
              while (bVar45 = uVar30 != 0, uVar30 = uVar30 - 1, bVar45) {
                _p._0_8_ = *(undefined8 *)pfVar38;
                _p._8_8_ = *(undefined8 *)(pfVar38 + 2);
                afVar131 = binary_op_pow_pack4::operator()(&op,&_b0,&_p);
                *puVar33 = afVar131._0_8_;
                puVar33[1] = extraout_XMM0_Qb_08;
                pfVar38 = pfVar38 + 4;
                puVar33 = puVar33 + 2;
              }
              pfVar36 = pfVar36 + 4;
            }
            return 0;
          }
          if (iVar4 != 3) {
            return 0;
          }
          ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar23 < 1) {
            uVar23 = 0;
          }
          if ((int)uVar30 < 1) {
            uVar26 = 0;
          }
          for (uVar44 = 0; uVar44 != uVar26; uVar44 = uVar44 + 1) {
            pfVar36 = (float *)((long)this_01->data + uVar44 * 0x10);
            _p._0_8_ = *(undefined8 *)pfVar36;
            _p._8_8_ = *(undefined8 *)(pfVar36 + 2);
            ncnn::Mat::channel((Mat *)_b0,this_00,(int)uVar44);
            uVar10 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar44);
            uVar11 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            lVar25 = 0;
            uVar35 = uVar23;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              _b0._0_8_ = *(undefined8 *)(uVar10 + lVar25);
              _b0._8_8_ = *(undefined8 *)((float *)(uVar10 + lVar25) + 2);
              afVar131 = binary_op_pow_pack4::operator()(&op,&_p,&_b0);
              *(undefined8 *)(uVar11 + lVar25) = afVar131._0_8_;
              ((undefined8 *)(uVar11 + lVar25))[1] = extraout_XMM0_Qb_03;
              lVar25 = lVar25 + 0x10;
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar35,sVar5,iVar22,opt->blob_allocator);
        pvVar9 = this_02->data;
        if (pvVar9 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (_elempack != 1 || this_01[1].w != 1) {
          pvVar7 = this_01->data;
          pvVar8 = this_01[1].data;
          if ((int)uVar35 < 1) {
            uVar44 = 0;
          }
          lVar25 = 0;
          while (iVar22 = (int)uVar44, uVar44 = (ulong)(iVar22 - 1), iVar22 != 0) {
            pfVar36 = (float *)((long)pvVar7 + lVar25);
            _b0._0_8_ = *(undefined8 *)pfVar36;
            _b0._8_8_ = *(undefined8 *)(pfVar36 + 2);
            pfVar36 = (float *)((long)pvVar8 + lVar25);
            _p._0_8_ = *(undefined8 *)pfVar36;
            _p._8_8_ = *(undefined8 *)(pfVar36 + 2);
            afVar131 = binary_op_pow_pack4::operator()(&op,&_b0,&_p);
            *(undefined8 *)((long)pvVar9 + lVar25) = afVar131._0_8_;
            ((undefined8 *)((long)pvVar9 + lVar25))[1] = extraout_XMM0_Qb_17;
            lVar25 = lVar25 + 0x10;
          }
          return 0;
        }
        _b0[1] = *this_01[1].data;
        _b0[0] = _b0[1];
        _b0[3] = _b0[1];
        _b0[2] = _b0[1];
        pvVar7 = this_01->data;
        uVar26 = 0;
        if ((int)uVar35 < 1) {
          uVar44 = uVar26;
        }
        while (iVar22 = (int)uVar44, uVar44 = (ulong)(iVar22 - 1), iVar22 != 0) {
          pfVar36 = (float *)((long)pvVar7 + uVar26);
          _p._0_8_ = *(undefined8 *)pfVar36;
          _p._8_8_ = *(undefined8 *)(pfVar36 + 2);
          afVar131 = binary_op_pow_pack4::operator()(&op,&_p,&_b0);
          *(undefined8 *)((long)pvVar9 + uVar26) = afVar131._0_8_;
          ((undefined8 *)((long)pvVar9 + uVar26))[1] = extraout_XMM0_Qb_10;
          uVar26 = uVar26 + 0x10;
        }
      }
    }
    else {
      uVar42 = this_01->h;
      uVar39 = (ulong)uVar42;
      uVar28 = uVar42 * uVar35;
      if (iVar4 == 2) {
        if (this_01[1].dims == 3) {
          ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar29 < 1) {
            uVar29 = 0;
          }
          if ((int)uVar31 < 1) {
            uVar31 = 0;
          }
          if ((int)uVar30 < 1) {
            uVar26 = 0;
          }
          for (uVar44 = 0; uVar44 != uVar26; uVar44 = uVar44 + 1) {
            pfVar36 = (float *)((long)this_01->w * uVar44 * this_01->elemsize + (long)this_01->data)
            ;
            ncnn::Mat::channel((Mat *)_b0,this_00,(int)uVar44);
            pfVar38 = (float *)_b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar44);
            puVar33 = (undefined8 *)_b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
              _b0._0_8_ = *(undefined8 *)pfVar36;
              _b0._8_8_ = *(undefined8 *)(pfVar36 + 2);
              uVar30 = uVar29;
              while (bVar45 = uVar30 != 0, uVar30 = uVar30 - 1, bVar45) {
                _p._0_8_ = *(undefined8 *)pfVar38;
                _p._8_8_ = *(undefined8 *)(pfVar38 + 2);
                afVar131 = binary_op_pow_pack4::operator()(&op,&_b0,&_p);
                *puVar33 = afVar131._0_8_;
                puVar33[1] = extraout_XMM0_Qb_00;
                pfVar38 = pfVar38 + 4;
                puVar33 = puVar33 + 2;
              }
              pfVar36 = pfVar36 + 4;
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar35,uVar42,sVar5,iVar22,opt->blob_allocator);
        pvVar9 = this_02->data;
        if ((pvVar9 == (void *)0x0) || ((long)this_02->c * this_02->cstep == 0)) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          pvVar7 = this_01->data;
          pvVar8 = this_01[1].data;
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          lVar25 = 0;
          while (bVar45 = uVar28 != 0, uVar28 = uVar28 - 1, bVar45) {
            pfVar36 = (float *)((long)pvVar7 + lVar25);
            _b0._0_8_ = *(undefined8 *)pfVar36;
            _b0._8_8_ = *(undefined8 *)(pfVar36 + 2);
            pfVar36 = (float *)((long)pvVar8 + lVar25);
            _p._0_8_ = *(undefined8 *)pfVar36;
            _p._8_8_ = *(undefined8 *)(pfVar36 + 2);
            afVar131 = binary_op_pow_pack4::operator()(&op,&_b0,&_p);
            puVar33 = (undefined8 *)((long)pvVar9 + lVar25);
            *puVar33 = afVar131._0_8_;
            puVar33[1] = extraout_XMM0_Qb_02;
            lVar25 = lVar25 + 0x10;
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar35,uVar42,sVar5,iVar22,opt->blob_allocator);
        puVar33 = (undefined8 *)this_02->data;
        if (puVar33 == (undefined8 *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (_elempack != 1 || this_01[1].w != 1) {
          pfVar36 = (float *)this_01->data;
          if ((int)uVar35 < 1) {
            uVar44 = 0;
          }
          pfVar38 = (float *)this_01[1].data;
          if ((int)uVar42 < 1) {
            uVar42 = 0;
          }
          for (uVar35 = 0; uVar35 != uVar42; uVar35 = uVar35 + 1) {
            _b0._0_8_ = *(undefined8 *)pfVar38;
            _b0._8_8_ = *(undefined8 *)(pfVar38 + 2);
            uVar26 = uVar44;
            while (iVar22 = (int)uVar26, uVar26 = (ulong)(iVar22 - 1), iVar22 != 0) {
              _p._0_8_ = *(undefined8 *)pfVar36;
              _p._8_8_ = *(undefined8 *)(pfVar36 + 2);
              afVar131 = binary_op_pow_pack4::operator()(&op,&_p,&_b0);
              *puVar33 = afVar131._0_8_;
              puVar33[1] = extraout_XMM0_Qb_19;
              pfVar36 = pfVar36 + 4;
              puVar33 = puVar33 + 2;
            }
            pfVar38 = pfVar38 + 4;
          }
          return 0;
        }
        _b0[1] = *this_01[1].data;
        _b0[0] = _b0[1];
        _b0[3] = _b0[1];
        _b0[2] = _b0[1];
        pvVar9 = this_01->data;
        uVar26 = 0;
        uVar44 = (ulong)uVar28;
        if ((int)uVar28 < 1) {
          uVar44 = uVar26;
        }
        while (iVar22 = (int)uVar44, uVar44 = (ulong)(iVar22 - 1), iVar22 != 0) {
          pfVar36 = (float *)((long)pvVar9 + uVar26);
          _p._0_8_ = *(undefined8 *)pfVar36;
          _p._8_8_ = *(undefined8 *)(pfVar36 + 2);
          afVar131 = binary_op_pow_pack4::operator()(&op,&_p,&_b0);
          *(undefined8 *)((long)puVar33 + uVar26) = afVar131._0_8_;
          ((undefined8 *)((long)puVar33 + uVar26))[1] = extraout_XMM0_Qb_13;
          uVar26 = uVar26 + 0x10;
        }
      }
      else {
        if (iVar4 != 3) {
          return 0;
        }
        uVar41 = this_01->c;
        if (this_01[1].dims == 3) {
          uVar24 = uVar30 ^ uVar41;
          if (((uVar29 ^ 1) == 0 && (uVar31 ^ 1) == 0) && uVar24 == 0) {
            ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar28 < 1) {
              uVar28 = 0;
            }
            if ((int)uVar41 < 1) {
              uVar41 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
              ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
              uVar10 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
              uVar11 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
              uVar21 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              _b0._0_8_ = *(undefined8 *)uVar21;
              _b0._8_8_ = *(undefined8 *)(uVar21 + 8);
              lVar25 = 0;
              uVar29 = uVar28;
              while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
                _p._0_8_ = *(undefined8 *)(uVar10 + lVar25);
                _p._8_8_ = *(undefined8 *)((float *)(uVar10 + lVar25) + 2);
                afVar131 = binary_op_pow_pack4::operator()(&op,&_p,&_b0);
                *(undefined8 *)(uVar11 + lVar25) = afVar131._0_8_;
                ((undefined8 *)(uVar11 + lVar25))[1] = extraout_XMM0_Qb;
                lVar25 = lVar25 + 0x10;
              }
            }
            return 0;
          }
          if ((uVar29 == uVar35) && (_elempack == 1 && (uVar30 == 1 && uVar31 == uVar42))) {
            ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar28 < 1) {
              uVar28 = 0;
            }
            if ((int)uVar41 < 1) {
              uVar41 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
              ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
              uVar10 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              pvVar9 = this_01[1].data;
              ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
              uVar11 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              lVar25 = 0;
              uVar29 = uVar28;
              while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
                pfVar36 = (float *)(uVar10 + lVar25 * 4);
                _b0._0_8_ = *(undefined8 *)pfVar36;
                _b0._8_8_ = *(undefined8 *)(pfVar36 + 2);
                _p[1] = *(float *)((long)pvVar9 + lVar25);
                _p[0] = _p[1];
                _p[3] = _p[1];
                _p[2] = _p[1];
                afVar131 = binary_op_pow_pack4::operator()(&op,&_b0,&_p);
                puVar33 = (undefined8 *)(uVar11 + lVar25 * 4);
                *puVar33 = afVar131._0_8_;
                puVar33[1] = extraout_XMM0_Qb_05;
                lVar25 = lVar25 + 4;
              }
            }
            return 0;
          }
          if (((uVar35 ^ 1) == 0 && (uVar42 ^ 1) == 0) && uVar24 == 0) {
            ncnn::Mat::create(this_02,uVar29,uVar31,uVar41,sVar6,_elempack,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar23 < 1) {
              uVar23 = 0;
            }
            if ((int)uVar41 < 1) {
              uVar41 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
              ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
              uVar10 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
              uVar11 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
              uVar21 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              _b0._0_8_ = *(undefined8 *)uVar10;
              _b0._8_8_ = *(undefined8 *)(uVar10 + 8);
              lVar25 = 0;
              uVar29 = uVar23;
              while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
                _p._0_8_ = *(undefined8 *)(uVar21 + lVar25);
                _p._8_8_ = *(undefined8 *)((float *)(uVar21 + lVar25) + 2);
                afVar131 = binary_op_pow_pack4::operator()(&op,&_b0,&_p);
                *(undefined8 *)(uVar11 + lVar25) = afVar131._0_8_;
                ((undefined8 *)(uVar11 + lVar25))[1] = extraout_XMM0_Qb_06;
                lVar25 = lVar25 + 0x10;
              }
            }
            return 0;
          }
          if ((((uVar29 == uVar35) && (iVar22 == 1)) && (uVar31 == uVar42)) && (uVar41 == 1)) {
            ncnn::Mat::create(this_02,uVar35,uVar42,uVar30,sVar6,_elempack,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar23 < 1) {
              uVar23 = 0;
            }
            if ((int)uVar30 < 1) {
              uVar30 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
              pvVar9 = this_01->data;
              ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
              uVar10 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
              uVar11 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              lVar25 = 0;
              uVar29 = uVar23;
              while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
                _b0[1] = *(float *)((long)pvVar9 + lVar25);
                _b0[0] = _b0[1];
                _b0[3] = _b0[1];
                _b0[2] = _b0[1];
                pfVar36 = (float *)(uVar10 + lVar25 * 4);
                _p._0_8_ = *(undefined8 *)pfVar36;
                _p._8_8_ = *(undefined8 *)(pfVar36 + 2);
                afVar131 = binary_op_pow_pack4::operator()(&op,&_b0,&_p);
                puVar33 = (undefined8 *)(uVar11 + lVar25 * 4);
                *puVar33 = afVar131._0_8_;
                puVar33[1] = extraout_XMM0_Qb_11;
                lVar25 = lVar25 + 4;
              }
            }
            return 0;
          }
          if ((((uVar29 ^ 1) == 0 && (uVar31 ^ uVar42) == 0) && uVar24 == 0) && uVar35 != 1) {
            ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar35 < 1) {
              uVar44 = 0;
            }
            if ((int)uVar42 < 1) {
              uVar39 = 0;
            }
            if ((int)uVar41 < 1) {
              uVar41 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
              ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
              pfVar36 = (float *)_b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
              uVar10 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
              puVar33 = (undefined8 *)_b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              for (uVar26 = 0; uVar26 != uVar39; uVar26 = uVar26 + 1) {
                pfVar38 = (float *)(uVar10 + uVar26 * 0x10);
                _b0._0_8_ = *(undefined8 *)pfVar38;
                _b0._8_8_ = *(undefined8 *)(pfVar38 + 2);
                uVar43 = uVar44;
                while (iVar22 = (int)uVar43, uVar43 = (ulong)(iVar22 - 1), iVar22 != 0) {
                  _p._0_8_ = *(undefined8 *)pfVar36;
                  _p._8_8_ = *(undefined8 *)(pfVar36 + 2);
                  afVar131 = binary_op_pow_pack4::operator()(&op,&_p,&_b0);
                  *puVar33 = afVar131._0_8_;
                  puVar33[1] = extraout_XMM0_Qb_12;
                  pfVar36 = pfVar36 + 4;
                  puVar33 = puVar33 + 2;
                }
              }
            }
            return 0;
          }
          if ((((uVar31 ^ 1) == 0 && (uVar29 ^ uVar35) == 0) && uVar24 == 0) && uVar42 != 1) {
            ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar35 < 1) {
              uVar44 = 0;
            }
            if ((int)uVar42 < 1) {
              uVar42 = 0;
            }
            if ((int)uVar41 < 1) {
              uVar41 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
              ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
              lVar25 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
              uVar10 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
              lVar34 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              for (uVar29 = 0; uVar29 != uVar42; uVar29 = uVar29 + 1) {
                for (lVar32 = 0; uVar44 * 0x10 != lVar32; lVar32 = lVar32 + 0x10) {
                  _b0._0_8_ = *(undefined8 *)(lVar25 + lVar32);
                  _b0._8_8_ = *(undefined8 *)((float *)(lVar25 + lVar32) + 2);
                  _p._0_8_ = *(undefined8 *)(uVar10 + lVar32);
                  _p._8_8_ = *(undefined8 *)((float *)(uVar10 + lVar32) + 2);
                  afVar131 = binary_op_pow_pack4::operator()(&op,&_b0,&_p);
                  *(undefined8 *)(lVar34 + lVar32) = afVar131._0_8_;
                  ((undefined8 *)(lVar34 + lVar32))[1] = extraout_XMM0_Qb_15;
                }
                lVar25 = lVar25 + lVar32;
                lVar34 = lVar34 + lVar32;
              }
            }
            return 0;
          }
          if ((((uVar35 ^ 1) == 0 && (uVar31 ^ uVar42) == 0) && uVar24 == 0) && uVar29 != 1) {
            ncnn::Mat::create(this_02,uVar29,uVar42,uVar41,sVar6,_elempack,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar29 < 1) {
              uVar29 = 0;
            }
            if ((int)uVar42 < 1) {
              uVar39 = 0;
            }
            uVar44 = (ulong)uVar41;
            if ((int)uVar41 < 1) {
              uVar44 = 0;
            }
            for (iVar22 = 0; local_58 = (int)uVar44, iVar22 != local_58; iVar22 = iVar22 + 1) {
              ncnn::Mat::channel((Mat *)_b0,this_01,iVar22);
              uVar10 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_00,iVar22);
              pfVar36 = (float *)_b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_02,iVar22);
              puVar33 = (undefined8 *)_b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              for (uVar26 = 0; uVar26 != uVar39; uVar26 = uVar26 + 1) {
                pfVar38 = (float *)(uVar10 + uVar26 * 0x10);
                _b0._0_8_ = *(undefined8 *)pfVar38;
                _b0._8_8_ = *(undefined8 *)(pfVar38 + 2);
                uVar35 = uVar29;
                while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
                  _p._0_8_ = *(undefined8 *)pfVar36;
                  _p._8_8_ = *(undefined8 *)(pfVar36 + 2);
                  afVar131 = binary_op_pow_pack4::operator()(&op,&_b0,&_p);
                  *puVar33 = afVar131._0_8_;
                  puVar33[1] = extraout_XMM0_Qb_18;
                  pfVar36 = pfVar36 + 4;
                  puVar33 = puVar33 + 2;
                }
              }
            }
            return 0;
          }
          if ((((uVar29 ^ uVar35) != 0 || (uVar42 ^ 1) != 0) || uVar24 != 0) || uVar31 == 1) {
            ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
            if (this_02->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if ((int)uVar28 < 1) {
              uVar28 = 0;
            }
            if ((int)uVar41 < 1) {
              uVar41 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
              ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
              uVar10 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
              uVar11 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
              uVar21 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              lVar25 = 0;
              uVar29 = uVar28;
              while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
                _b0._0_8_ = *(undefined8 *)(uVar10 + lVar25);
                _b0._8_8_ = *(undefined8 *)((float *)(uVar10 + lVar25) + 2);
                _p._0_8_ = *(undefined8 *)(uVar11 + lVar25);
                _p._8_8_ = *(undefined8 *)((float *)(uVar11 + lVar25) + 2);
                afVar131 = binary_op_pow_pack4::operator()(&op,&_b0,&_p);
                *(undefined8 *)(uVar21 + lVar25) = afVar131._0_8_;
                ((undefined8 *)(uVar21 + lVar25))[1] = extraout_XMM0_Qb_21;
                lVar25 = lVar25 + 0x10;
              }
            }
            return 0;
          }
          ncnn::Mat::create(this_02,uVar35,uVar31,uVar41,sVar6,_elempack,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar35 < 1) {
            uVar44 = 0;
          }
          if ((int)uVar31 < 1) {
            uVar31 = 0;
          }
          if ((int)uVar41 < 1) {
            uVar41 = 0;
          }
          for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
            ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
            uVar10 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
            lVar25 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
            lVar34 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            for (uVar29 = 0; uVar29 != uVar31; uVar29 = uVar29 + 1) {
              for (lVar32 = 0; uVar44 * 0x10 != lVar32; lVar32 = lVar32 + 0x10) {
                _b0._0_8_ = *(undefined8 *)(uVar10 + lVar32);
                _b0._8_8_ = *(undefined8 *)((float *)(uVar10 + lVar32) + 2);
                _p._0_8_ = *(undefined8 *)(lVar25 + lVar32);
                _p._8_8_ = *(undefined8 *)((float *)(lVar25 + lVar32) + 2);
                afVar131 = binary_op_pow_pack4::operator()(&op,&_b0,&_p);
                *(undefined8 *)(lVar34 + lVar32) = afVar131._0_8_;
                ((undefined8 *)(lVar34 + lVar32))[1] = extraout_XMM0_Qb_20;
              }
              lVar25 = lVar25 + lVar32;
              lVar34 = lVar34 + lVar32;
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          if ((int)uVar35 < 1) {
            uVar44 = 0;
          }
          if ((int)uVar42 < 1) {
            uVar42 = 0;
          }
          if ((int)uVar41 < 1) {
            uVar41 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar41; uVar26 = uVar26 + 1) {
            ncnn::Mat::channel((Mat *)_b0,this_01,(int)uVar26);
            pfVar36 = (float *)_b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            pfVar38 = (float *)((long)this_01[1].w * uVar26 * this_01[1].elemsize +
                               (long)this_01[1].data);
            ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
            puVar33 = (undefined8 *)_b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            for (uVar35 = 0; uVar35 != uVar42; uVar35 = uVar35 + 1) {
              _b0._0_8_ = *(undefined8 *)pfVar38;
              _b0._8_8_ = *(undefined8 *)(pfVar38 + 2);
              uVar39 = uVar44;
              while (iVar22 = (int)uVar39, uVar39 = (ulong)(iVar22 - 1), iVar22 != 0) {
                _p._0_8_ = *(undefined8 *)pfVar36;
                _p._8_8_ = *(undefined8 *)(pfVar36 + 2);
                afVar131 = binary_op_pow_pack4::operator()(&op,&_p,&_b0);
                *puVar33 = afVar131._0_8_;
                puVar33[1] = extraout_XMM0_Qb_04;
                pfVar36 = pfVar36 + 4;
                puVar33 = puVar33 + 2;
              }
              pfVar38 = pfVar38 + 4;
            }
          }
          return 0;
        }
        if (_elempack != 1 || this_01[1].w != 1) {
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          uVar44 = (ulong)uVar41;
          if ((int)uVar41 < 1) {
            uVar44 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            ncnn::Mat::channel((Mat *)_b0,this_01,(int)uVar26);
            uVar10 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            pfVar36 = (float *)((long)this_01[1].data + uVar26 * 0x10);
            _p._0_8_ = *(undefined8 *)pfVar36;
            _p._8_8_ = *(undefined8 *)(pfVar36 + 2);
            ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
            uVar11 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            lVar25 = 0;
            uVar35 = uVar28;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              _b0._0_8_ = *(undefined8 *)(uVar10 + lVar25);
              _b0._8_8_ = *(undefined8 *)((float *)(uVar10 + lVar25) + 2);
              afVar131 = binary_op_pow_pack4::operator()(&op,&_b0,&_p);
              *(undefined8 *)(uVar11 + lVar25) = afVar131._0_8_;
              ((undefined8 *)(uVar11 + lVar25))[1] = extraout_XMM0_Qb_16;
              lVar25 = lVar25 + 0x10;
            }
          }
          return 0;
        }
        _p[1] = *this_00->data;
        _p[0] = _p[1];
        _p[3] = _p[1];
        _p[2] = _p[1];
        uVar35 = 0;
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            _b0._0_8_ = *(undefined8 *)(uVar10 + lVar25);
            _b0._8_8_ = *(undefined8 *)((float *)(uVar10 + lVar25) + 2);
            afVar131 = binary_op_pow_pack4::operator()(&op,&_b0,&_p);
            *(undefined8 *)(uVar11 + lVar25) = afVar131._0_8_;
            ((undefined8 *)(uVar11 + lVar25))[1] = extraout_XMM0_Qb_14;
            lVar25 = lVar25 + 0x10;
          }
        }
      }
    }
    return 0;
  case 7:
    uVar35 = this_01->w;
    sVar5 = this_01->elemsize;
    uVar29 = this_01[1].w;
    uVar31 = this_01[1].h;
    uVar30 = this_01[1].c;
    uVar23 = uVar31 * uVar29;
    sVar6 = this_01[1].elemsize;
    iVar4 = this_01->dims;
    if (iVar4 == 1) {
      iVar4 = this_01[1].dims;
      if (iVar22 != 1 || uVar35 != 1) {
        if (iVar4 == 1) {
          ncnn::Mat::create(this_02,uVar35,sVar5,iVar22,opt->blob_allocator);
          pvVar9 = this_02->data;
          if (pvVar9 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (_elempack == 1 && this_01[1].w == 1) {
            pvVar7 = this_01->data;
            fVar56 = *this_01[1].data;
            if ((int)uVar35 < 1) {
              uVar35 = 0;
            }
            lVar25 = 0;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              pfVar36 = (float *)((long)pvVar7 + lVar25);
              fVar122 = pfVar36[1];
              fVar127 = pfVar36[2];
              fVar129 = pfVar36[3];
              pfVar38 = (float *)((long)pvVar9 + lVar25);
              *pfVar38 = fVar56 - *pfVar36;
              pfVar38[1] = fVar56 - fVar122;
              pfVar38[2] = fVar56 - fVar127;
              pfVar38[3] = fVar56 - fVar129;
              lVar25 = lVar25 + 0x10;
            }
            return 0;
          }
          pvVar7 = this_01->data;
          pvVar8 = this_01[1].data;
          if ((int)uVar35 < 1) {
            uVar35 = 0;
          }
          lVar25 = 0;
          while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
            pfVar36 = (float *)((long)pvVar7 + lVar25);
            fVar56 = pfVar36[1];
            fVar122 = pfVar36[2];
            fVar127 = pfVar36[3];
            pfVar38 = (float *)((long)pvVar8 + lVar25);
            fVar129 = pfVar38[1];
            fVar121 = pfVar38[2];
            fVar126 = pfVar38[3];
            pfVar1 = (float *)((long)pvVar9 + lVar25);
            *pfVar1 = *pfVar38 - *pfVar36;
            pfVar1[1] = fVar129 - fVar56;
            pfVar1[2] = fVar121 - fVar122;
            pfVar1[3] = fVar126 - fVar127;
            lVar25 = lVar25 + 0x10;
          }
          return 0;
        }
        if (iVar4 != 2) {
          if (iVar4 != 3) {
            return 0;
          }
          ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar23 < 1) {
            uVar23 = 0;
          }
          uVar44 = (ulong)uVar30;
          if ((int)uVar30 < 1) {
            uVar44 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            puVar33 = (undefined8 *)((long)this_01->data + uVar26 * 0x10);
            uVar10 = *puVar33;
            uVar11 = puVar33[1];
            local_d8 = (float)uVar10;
            fStack_d4 = (float)((ulong)uVar10 >> 0x20);
            fStack_d0 = (float)uVar11;
            fStack_cc = (float)((ulong)uVar11 >> 0x20);
            ncnn::Mat::channel((Mat *)_b0,this_00,(int)uVar26);
            uVar10 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
            uVar11 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            lVar25 = 0;
            uVar35 = uVar23;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              pfVar36 = (float *)(uVar10 + lVar25);
              fVar56 = pfVar36[1];
              fVar122 = pfVar36[2];
              fVar127 = pfVar36[3];
              pfVar38 = (float *)(uVar11 + lVar25);
              *pfVar38 = *pfVar36 - local_d8;
              pfVar38[1] = fVar56 - fStack_d4;
              pfVar38[2] = fVar122 - fStack_d0;
              pfVar38[3] = fVar127 - fStack_cc;
              lVar25 = lVar25 + 0x10;
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar29,uVar31,sVar6,_elempack,opt->blob_allocator);
        pauVar27 = (undefined1 (*) [16])this_02->data;
        if (pauVar27 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pfVar36 = (float *)this_01->data;
        pfVar38 = (float *)this_01[1].data;
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        if ((int)uVar31 < 1) {
          uVar31 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          fVar56 = *pfVar36;
          fVar122 = pfVar36[1];
          fVar127 = pfVar36[2];
          fVar129 = pfVar36[3];
          uVar30 = uVar29;
          while (bVar45 = uVar30 != 0, uVar30 = uVar30 - 1, bVar45) {
            auVar82._0_4_ = *pfVar38 - fVar56;
            auVar82._4_4_ = pfVar38[1] - fVar122;
            auVar82._8_4_ = pfVar38[2] - fVar127;
            auVar82._12_4_ = pfVar38[3] - fVar129;
            *pauVar27 = auVar82;
            pfVar38 = pfVar38 + 4;
            pauVar27 = pauVar27 + 1;
          }
          pfVar36 = pfVar36 + 4;
        }
        return 0;
      }
      if (iVar4 == 1) {
        ncnn::Mat::create(this_02,uVar29,sVar6,_elempack,opt->blob_allocator);
        pvVar9 = this_02->data;
        if (pvVar9 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar7 = this_01[1].data;
        fVar56 = *this_01->data;
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        lVar25 = 0;
        while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
          pfVar36 = (float *)((long)pvVar7 + lVar25);
          fVar122 = pfVar36[1];
          fVar127 = pfVar36[2];
          fVar129 = pfVar36[3];
          pfVar38 = (float *)((long)pvVar9 + lVar25);
          *pfVar38 = *pfVar36 - fVar56;
          pfVar38[1] = fVar122 - fVar56;
          pfVar38[2] = fVar127 - fVar56;
          pfVar38[3] = fVar129 - fVar56;
          lVar25 = lVar25 + 0x10;
        }
        return 0;
      }
      if (iVar4 != 2) {
        if (iVar4 != 3) {
          return 0;
        }
        ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        fVar56 = *this_01->data;
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar30 < 1) {
          uVar30 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar10 + lVar25);
            fVar122 = pfVar36[1];
            fVar127 = pfVar36[2];
            fVar129 = pfVar36[3];
            pfVar38 = (float *)(uVar11 + lVar25);
            *pfVar38 = *pfVar36 - fVar56;
            pfVar38[1] = fVar122 - fVar56;
            pfVar38[2] = fVar127 - fVar56;
            pfVar38[3] = fVar129 - fVar56;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar29,uVar31,sVar6,_elempack,opt->blob_allocator);
      pvVar9 = this_02->data;
      if (pvVar9 == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      pvVar7 = this_01[1].data;
      fVar56 = *this_01->data;
      if ((int)uVar23 < 1) {
        uVar23 = 0;
      }
      lVar25 = 0;
      while (bVar45 = uVar23 != 0, uVar23 = uVar23 - 1, bVar45) {
        pfVar36 = (float *)((long)pvVar7 + lVar25);
        fVar122 = pfVar36[1];
        fVar127 = pfVar36[2];
        fVar129 = pfVar36[3];
        pfVar38 = (float *)((long)pvVar9 + lVar25);
        *pfVar38 = *pfVar36 - fVar56;
        pfVar38[1] = fVar122 - fVar56;
        pfVar38[2] = fVar127 - fVar56;
        pfVar38[3] = fVar129 - fVar56;
        lVar25 = lVar25 + 0x10;
      }
      return 0;
    }
    uVar42 = this_01->h;
    uVar28 = uVar42 * uVar35;
    if (iVar4 != 2) {
      if (iVar4 != 3) {
        return 0;
      }
      uVar41 = this_01->c;
      uVar44 = (ulong)uVar41;
      if (this_01[1].dims != 3) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims == 1) {
          if (_elempack == 1 && this_01[1].w == 1) {
            fVar56 = *this_00->data;
            if ((int)uVar28 < 1) {
              uVar28 = 0;
            }
            if ((int)uVar41 < 1) {
              uVar41 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
              ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
              uVar10 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
              uVar11 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              lVar25 = 0;
              uVar29 = uVar28;
              while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
                pfVar36 = (float *)(uVar10 + lVar25);
                auVar91._0_4_ = fVar56 - *pfVar36;
                auVar91._4_4_ = fVar56 - pfVar36[1];
                auVar91._8_4_ = fVar56 - pfVar36[2];
                auVar91._12_4_ = fVar56 - pfVar36[3];
                *(undefined1 (*) [16])(uVar11 + lVar25) = auVar91;
                lVar25 = lVar25 + 0x10;
              }
            }
            return 0;
          }
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          if ((int)uVar41 < 1) {
            uVar44 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            ncnn::Mat::channel((Mat *)_b0,this_01,(int)uVar26);
            uVar21 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            puVar33 = (undefined8 *)((long)this_01[1].data + uVar26 * 0x10);
            uVar10 = *puVar33;
            uVar11 = puVar33[1];
            local_d8 = (float)uVar10;
            fStack_d4 = (float)((ulong)uVar10 >> 0x20);
            fStack_d0 = (float)uVar11;
            fStack_cc = (float)((ulong)uVar11 >> 0x20);
            ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
            uVar10 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            lVar25 = 0;
            uVar35 = uVar28;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              pfVar36 = (float *)(uVar21 + lVar25);
              auVar95._0_4_ = local_d8 - *pfVar36;
              auVar95._4_4_ = fStack_d4 - pfVar36[1];
              auVar95._8_4_ = fStack_d0 - pfVar36[2];
              auVar95._12_4_ = fStack_cc - pfVar36[3];
              *(undefined1 (*) [16])(uVar10 + lVar25) = auVar95;
              lVar25 = lVar25 + 0x10;
            }
          }
          return 0;
        }
        if (this_01[1].dims != 2) {
          return 0;
        }
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar44 = 0;
        }
        for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,(int)uVar26);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          pfVar36 = (float *)((long)this_01[1].w * uVar26 * this_01[1].elemsize +
                             (long)this_01[1].data);
          ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
          pauVar40 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar29 = 0; uVar29 != uVar42; uVar29 = uVar29 + 1) {
            fVar56 = *pfVar36;
            fVar122 = pfVar36[1];
            fVar127 = pfVar36[2];
            fVar129 = pfVar36[3];
            uVar31 = uVar35;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar77 = *pauVar27;
              auVar111._0_4_ = fVar56 - auVar77._0_4_;
              auVar111._4_4_ = fVar122 - auVar77._4_4_;
              auVar111._8_4_ = fVar127 - auVar77._8_4_;
              auVar111._12_4_ = fVar129 - auVar77._12_4_;
              *pauVar40 = auVar111;
              pauVar27 = pauVar27 + 1;
              pauVar40 = pauVar40 + 1;
            }
            pfVar36 = pfVar36 + 4;
          }
        }
        return 0;
      }
      uVar24 = uVar30 ^ uVar41;
      if (((uVar29 ^ 1) == 0 && (uVar31 ^ 1) == 0) && uVar24 == 0) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          fVar56 = *(float *)uVar21;
          fVar122 = *(float *)(uVar21 + 4);
          fVar127 = *(float *)(uVar21 + 8);
          fVar129 = *(float *)(uVar21 + 0xc);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            auVar77 = *(undefined1 (*) [16])(uVar10 + lVar25);
            auVar109._0_4_ = fVar56 - auVar77._0_4_;
            auVar109._4_4_ = fVar122 - auVar77._4_4_;
            auVar109._8_4_ = fVar127 - auVar77._8_4_;
            auVar109._12_4_ = fVar129 - auVar77._12_4_;
            *(undefined1 (*) [16])(uVar11 + lVar25) = auVar109;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      if ((uVar29 == uVar35) && (_elempack == 1 && (uVar30 == 1 && uVar31 == uVar42))) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          pvVar9 = this_01[1].data;
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar10 + lVar25 * 4);
            fVar56 = *(float *)((long)pvVar9 + lVar25);
            auVar74._0_4_ = fVar56 - *pfVar36;
            auVar74._4_4_ = fVar56 - pfVar36[1];
            auVar74._8_4_ = fVar56 - pfVar36[2];
            auVar74._12_4_ = fVar56 - pfVar36[3];
            *(undefined1 (*) [16])(uVar11 + lVar25 * 4) = auVar74;
            lVar25 = lVar25 + 4;
          }
        }
        return 0;
      }
      if (((uVar35 ^ 1) == 0 && (uVar42 ^ 1) == 0) && uVar24 == 0) {
        ncnn::Mat::create(this_02,uVar29,uVar31,uVar41,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          fVar56 = *(float *)uVar10;
          fVar122 = *(float *)(uVar10 + 4);
          fVar127 = *(float *)(uVar10 + 8);
          fVar129 = *(float *)(uVar10 + 0xc);
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar21 + lVar25);
            auVar79._0_4_ = *pfVar36 - fVar56;
            auVar79._4_4_ = pfVar36[1] - fVar122;
            auVar79._8_4_ = pfVar36[2] - fVar127;
            auVar79._12_4_ = pfVar36[3] - fVar129;
            *(undefined1 (*) [16])(uVar11 + lVar25) = auVar79;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      if ((((uVar29 == uVar35) && (iVar22 == 1)) && (uVar31 == uVar42)) && (uVar41 == 1)) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar30,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar30 < 1) {
          uVar30 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
          pvVar9 = this_01->data;
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            fVar56 = *(float *)((long)pvVar9 + lVar25);
            pfVar36 = (float *)(uVar10 + lVar25 * 4);
            auVar85._0_4_ = *pfVar36 - fVar56;
            auVar85._4_4_ = pfVar36[1] - fVar56;
            auVar85._8_4_ = pfVar36[2] - fVar56;
            auVar85._12_4_ = pfVar36[3] - fVar56;
            *(undefined1 (*) [16])(uVar11 + lVar25 * 4) = auVar85;
            lVar25 = lVar25 + 4;
          }
        }
        return 0;
      }
      if ((((uVar29 ^ 1) == 0 && (uVar31 ^ uVar42) == 0) && uVar24 == 0) && uVar35 != 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        uVar44 = (ulong)uVar42;
        if ((int)uVar42 < 1) {
          uVar44 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar29 = 0; uVar29 != uVar41; uVar29 = uVar29 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar29);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar29);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar29);
          pauVar40 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            pfVar36 = (float *)(uVar10 + uVar26 * 0x10);
            fVar56 = *pfVar36;
            fVar122 = pfVar36[1];
            fVar127 = pfVar36[2];
            fVar129 = pfVar36[3];
            uVar31 = uVar35;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar77 = *pauVar27;
              auVar115._0_4_ = fVar56 - auVar77._0_4_;
              auVar115._4_4_ = fVar122 - auVar77._4_4_;
              auVar115._8_4_ = fVar127 - auVar77._8_4_;
              auVar115._12_4_ = fVar129 - auVar77._12_4_;
              *pauVar40 = auVar115;
              pauVar27 = pauVar27 + 1;
              pauVar40 = pauVar40 + 1;
            }
          }
        }
        return 0;
      }
      if ((((uVar31 ^ 1) == 0 && (uVar29 ^ uVar35) == 0) && uVar24 == 0) && uVar42 != 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar26 = (ulong)uVar35;
        if ((int)uVar35 < 1) {
          uVar26 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar44 = 0;
        }
        for (iVar22 = 0; iVar22 != (int)uVar44; iVar22 = iVar22 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,iVar22);
          lVar25 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,iVar22);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,iVar22);
          lVar34 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar35 = 0; uVar35 != uVar42; uVar35 = uVar35 + 1) {
            for (lVar32 = 0; uVar26 * 0x10 != lVar32; lVar32 = lVar32 + 0x10) {
              pfVar36 = (float *)(lVar25 + lVar32);
              pfVar38 = (float *)(uVar10 + lVar32);
              auVar93._0_4_ = *pfVar38 - *pfVar36;
              auVar93._4_4_ = pfVar38[1] - pfVar36[1];
              auVar93._8_4_ = pfVar38[2] - pfVar36[2];
              auVar93._12_4_ = pfVar38[3] - pfVar36[3];
              *(undefined1 (*) [16])(lVar34 + lVar32) = auVar93;
            }
            lVar25 = lVar25 + lVar32;
            lVar34 = lVar34 + lVar32;
          }
        }
        return 0;
      }
      if ((((uVar35 ^ 1) == 0 && (uVar31 ^ uVar42) == 0) && uVar24 == 0) && uVar29 != 1) {
        ncnn::Mat::create(this_02,uVar29,uVar42,uVar41,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        uVar44 = (ulong)uVar42;
        if ((int)uVar42 < 1) {
          uVar44 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          pfVar36 = (float *)_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            pfVar38 = (float *)(uVar10 + uVar26 * 0x10);
            fVar56 = *pfVar38;
            fVar122 = pfVar38[1];
            fVar127 = pfVar38[2];
            fVar129 = pfVar38[3];
            uVar31 = uVar29;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar97._0_4_ = *pfVar36 - fVar56;
              auVar97._4_4_ = pfVar36[1] - fVar122;
              auVar97._8_4_ = pfVar36[2] - fVar127;
              auVar97._12_4_ = pfVar36[3] - fVar129;
              *pauVar27 = auVar97;
              pfVar36 = pfVar36 + 4;
              pauVar27 = pauVar27 + 1;
            }
          }
        }
        return 0;
      }
      if ((((uVar29 ^ uVar35) != 0 || (uVar42 ^ 1) != 0) || uVar24 != 0) || uVar31 == 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar10 + lVar25);
            pfVar38 = (float *)(uVar11 + lVar25);
            auVar107._0_4_ = *pfVar38 - *pfVar36;
            auVar107._4_4_ = pfVar38[1] - pfVar36[1];
            auVar107._8_4_ = pfVar38[2] - pfVar36[2];
            auVar107._12_4_ = pfVar38[3] - pfVar36[3];
            *(undefined1 (*) [16])(uVar21 + lVar25) = auVar107;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar35,uVar31,uVar41,sVar6,_elempack,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      uVar26 = (ulong)uVar35;
      if ((int)uVar35 < 1) {
        uVar26 = 0;
      }
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      if ((int)uVar41 < 1) {
        uVar44 = 0;
      }
      for (iVar22 = 0; local_e8 = (int)uVar44, iVar22 != local_e8; iVar22 = iVar22 + 1) {
        ncnn::Mat::channel((Mat *)_b0,this_01,iVar22);
        uVar10 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_00,iVar22);
        lVar25 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_02,iVar22);
        lVar34 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          for (lVar32 = 0; uVar26 * 0x10 != lVar32; lVar32 = lVar32 + 0x10) {
            pfVar36 = (float *)(uVar10 + lVar32);
            pfVar38 = (float *)(lVar25 + lVar32);
            auVar104._0_4_ = *pfVar38 - *pfVar36;
            auVar104._4_4_ = pfVar38[1] - pfVar36[1];
            auVar104._8_4_ = pfVar38[2] - pfVar36[2];
            auVar104._12_4_ = pfVar38[3] - pfVar36[3];
            *(undefined1 (*) [16])(lVar34 + lVar32) = auVar104;
          }
          lVar25 = lVar25 + lVar32;
          lVar34 = lVar34 + lVar32;
        }
      }
      return 0;
    }
    if (this_01[1].dims == 3) {
      ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      if ((int)uVar29 < 1) {
        uVar29 = 0;
      }
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      uVar44 = (ulong)uVar30;
      if ((int)uVar30 < 1) {
        uVar44 = 0;
      }
      for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
        pfVar38 = (float *)((long)this_01->w * uVar26 * this_01->elemsize + (long)this_01->data);
        ncnn::Mat::channel((Mat *)_b0,this_00,(int)uVar26);
        pfVar36 = (float *)_b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
        pauVar27 = (undefined1 (*) [16])_b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          fVar56 = *pfVar38;
          fVar122 = pfVar38[1];
          fVar127 = pfVar38[2];
          fVar129 = pfVar38[3];
          uVar30 = uVar29;
          while (bVar45 = uVar30 != 0, uVar30 = uVar30 - 1, bVar45) {
            auVar61._0_4_ = *pfVar36 - fVar56;
            auVar61._4_4_ = pfVar36[1] - fVar122;
            auVar61._8_4_ = pfVar36[2] - fVar127;
            auVar61._12_4_ = pfVar36[3] - fVar129;
            *pauVar27 = auVar61;
            pfVar36 = pfVar36 + 4;
            pauVar27 = pauVar27 + 1;
          }
          pfVar38 = pfVar38 + 4;
        }
      }
      return 0;
    }
    ncnn::Mat::create(this_02,uVar35,uVar42,sVar5,iVar22,opt->blob_allocator);
    pvVar9 = this_02->data;
    if ((pvVar9 != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) {
      if (this_01[1].dims != 1) {
        if (this_01[1].dims != 2) {
          return 0;
        }
        pvVar7 = this_01->data;
        pvVar8 = this_01[1].data;
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        lVar25 = 0;
        while (bVar45 = uVar28 != 0, uVar28 = uVar28 - 1, bVar45) {
          pfVar36 = (float *)((long)pvVar7 + lVar25);
          fVar56 = pfVar36[1];
          fVar122 = pfVar36[2];
          fVar127 = pfVar36[3];
          pfVar38 = (float *)((long)pvVar8 + lVar25);
          fVar129 = pfVar38[1];
          fVar121 = pfVar38[2];
          fVar126 = pfVar38[3];
          pfVar1 = (float *)((long)pvVar9 + lVar25);
          *pfVar1 = *pfVar38 - *pfVar36;
          pfVar1[1] = fVar129 - fVar56;
          pfVar1[2] = fVar121 - fVar122;
          pfVar1[3] = fVar126 - fVar127;
          lVar25 = lVar25 + 0x10;
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar35,uVar42,sVar5,iVar22,opt->blob_allocator);
      pauVar27 = (undefined1 (*) [16])this_02->data;
      if (pauVar27 != (undefined1 (*) [16])0x0) {
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (_elempack == 1 && this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar56 = *this_01[1].data;
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          lVar25 = 0;
          while (bVar45 = uVar28 != 0, uVar28 = uVar28 - 1, bVar45) {
            pfVar36 = (float *)((long)pvVar9 + lVar25);
            fVar122 = pfVar36[1];
            fVar127 = pfVar36[2];
            fVar129 = pfVar36[3];
            pfVar38 = (float *)((long)*pauVar27 + lVar25);
            *pfVar38 = fVar56 - *pfVar36;
            pfVar38[1] = fVar56 - fVar122;
            pfVar38[2] = fVar56 - fVar127;
            pfVar38[3] = fVar56 - fVar129;
            lVar25 = lVar25 + 0x10;
          }
          return 0;
        }
        pauVar40 = (undefined1 (*) [16])this_01->data;
        pfVar36 = (float *)this_01[1].data;
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        for (uVar29 = 0; uVar29 != uVar42; uVar29 = uVar29 + 1) {
          fVar56 = *pfVar36;
          fVar122 = pfVar36[1];
          fVar127 = pfVar36[2];
          fVar129 = pfVar36[3];
          uVar31 = uVar35;
          while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
            auVar77 = *pauVar40;
            auVar118._0_4_ = fVar56 - auVar77._0_4_;
            auVar118._4_4_ = fVar122 - auVar77._4_4_;
            auVar118._8_4_ = fVar127 - auVar77._8_4_;
            auVar118._12_4_ = fVar129 - auVar77._12_4_;
            *pauVar27 = auVar118;
            pauVar40 = pauVar40 + 1;
            pauVar27 = pauVar27 + 1;
          }
          pfVar36 = pfVar36 + 4;
        }
        return 0;
      }
    }
    break;
  case 8:
    uVar35 = this_01->w;
    sVar5 = this_01->elemsize;
    uVar29 = this_01[1].w;
    uVar31 = this_01[1].h;
    uVar30 = this_01[1].c;
    uVar23 = uVar31 * uVar29;
    sVar6 = this_01[1].elemsize;
    iVar4 = this_01->dims;
    if (iVar4 == 1) {
      iVar4 = this_01[1].dims;
      if (iVar22 != 1 || uVar35 != 1) {
        if (iVar4 == 1) {
          ncnn::Mat::create(this_02,uVar35,sVar5,iVar22,opt->blob_allocator);
          pvVar9 = this_02->data;
          if (pvVar9 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (_elempack == 1 && this_01[1].w == 1) {
            pvVar7 = this_01->data;
            fVar56 = *this_01[1].data;
            if ((int)uVar35 < 1) {
              uVar35 = 0;
            }
            lVar25 = 0;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              auVar77 = *(undefined1 (*) [16])((long)pvVar7 + lVar25);
              in_XMM2 = rcpps(in_XMM2,auVar77);
              fVar122 = fVar56 * in_XMM2._0_4_;
              fVar127 = fVar56 * in_XMM2._4_4_;
              fVar129 = fVar56 * in_XMM2._8_4_;
              fVar121 = fVar56 * in_XMM2._12_4_;
              pfVar36 = (float *)((long)pvVar9 + lVar25);
              *pfVar36 = (fVar56 - auVar77._0_4_ * fVar122) * in_XMM2._0_4_ + fVar122;
              pfVar36[1] = (fVar56 - auVar77._4_4_ * fVar127) * in_XMM2._4_4_ + fVar127;
              pfVar36[2] = (fVar56 - auVar77._8_4_ * fVar129) * in_XMM2._8_4_ + fVar129;
              pfVar36[3] = (fVar56 - auVar77._12_4_ * fVar121) * in_XMM2._12_4_ + fVar121;
              lVar25 = lVar25 + 0x10;
            }
            return 0;
          }
          pvVar7 = this_01->data;
          pvVar8 = this_01[1].data;
          if ((int)uVar35 < 1) {
            uVar35 = 0;
          }
          lVar25 = 0;
          while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
            auVar77 = *(undefined1 (*) [16])((long)pvVar7 + lVar25);
            in_XMM1 = rcpps(in_XMM1,auVar77);
            pfVar36 = (float *)((long)pvVar8 + lVar25);
            fVar56 = pfVar36[1];
            fVar122 = pfVar36[2];
            fVar127 = pfVar36[3];
            fVar129 = *pfVar36 * in_XMM1._0_4_;
            fVar121 = fVar56 * in_XMM1._4_4_;
            fVar126 = fVar122 * in_XMM1._8_4_;
            fVar128 = fVar127 * in_XMM1._12_4_;
            pfVar38 = (float *)((long)pvVar9 + lVar25);
            *pfVar38 = (*pfVar36 - auVar77._0_4_ * fVar129) * in_XMM1._0_4_ + fVar129;
            pfVar38[1] = (fVar56 - auVar77._4_4_ * fVar121) * in_XMM1._4_4_ + fVar121;
            pfVar38[2] = (fVar122 - auVar77._8_4_ * fVar126) * in_XMM1._8_4_ + fVar126;
            pfVar38[3] = (fVar127 - auVar77._12_4_ * fVar128) * in_XMM1._12_4_ + fVar128;
            lVar25 = lVar25 + 0x10;
          }
          return 0;
        }
        if (iVar4 != 2) {
          if (iVar4 != 3) {
            return 0;
          }
          ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar23 < 1) {
            uVar23 = 0;
          }
          uVar44 = (ulong)uVar30;
          if ((int)uVar30 < 1) {
            uVar44 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            auVar77 = *(undefined1 (*) [16])((long)this_01->data + uVar26 * 0x10);
            auVar70 = rcpps(in_XMM1,auVar77);
            fVar56 = auVar70._0_4_;
            fVar122 = auVar70._4_4_;
            fVar127 = auVar70._8_4_;
            fVar129 = auVar70._12_4_;
            fVar56 = (1.0 - auVar77._0_4_ * fVar56) * fVar56 + fVar56;
            fVar122 = (1.0 - auVar77._4_4_ * fVar122) * fVar122 + fVar122;
            fVar127 = (1.0 - auVar77._8_4_ * fVar127) * fVar127 + fVar127;
            fVar129 = (1.0 - auVar77._12_4_ * fVar129) * fVar129 + fVar129;
            ncnn::Mat::channel((Mat *)_b0,this_00,(int)uVar26);
            uVar10 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
            uVar11 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            in_XMM1._4_4_ = fVar122;
            in_XMM1._0_4_ = fVar56;
            in_XMM1._8_4_ = fVar127;
            in_XMM1._12_4_ = fVar129;
            lVar25 = 0;
            uVar35 = uVar23;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              pfVar36 = (float *)(uVar10 + lVar25);
              fVar121 = pfVar36[1];
              fVar126 = pfVar36[2];
              fVar128 = pfVar36[3];
              pfVar38 = (float *)(uVar11 + lVar25);
              *pfVar38 = *pfVar36 * fVar56;
              pfVar38[1] = fVar121 * fVar122;
              pfVar38[2] = fVar126 * fVar127;
              pfVar38[3] = fVar128 * fVar129;
              lVar25 = lVar25 + 0x10;
            }
          }
          return 0;
        }
        ncnn::Mat::create(this_02,uVar29,uVar31,sVar6,_elempack,opt->blob_allocator);
        pfVar36 = (float *)this_02->data;
        if (pfVar36 == (float *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pauVar27 = (undefined1 (*) [16])this_01->data;
        pfVar38 = (float *)this_01[1].data;
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        if ((int)uVar31 < 1) {
          uVar31 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          auVar77 = *pauVar27;
          in_XMM3 = rcpps(in_XMM3,auVar77);
          fVar56 = in_XMM3._0_4_;
          fVar122 = in_XMM3._4_4_;
          fVar127 = in_XMM3._8_4_;
          fVar129 = in_XMM3._12_4_;
          uVar30 = uVar29;
          while (bVar45 = uVar30 != 0, uVar30 = uVar30 - 1, bVar45) {
            fVar121 = pfVar38[1];
            fVar126 = pfVar38[2];
            fVar128 = pfVar38[3];
            *pfVar36 = *pfVar38 * ((1.0 - auVar77._0_4_ * fVar56) * fVar56 + fVar56);
            pfVar36[1] = fVar121 * ((1.0 - auVar77._4_4_ * fVar122) * fVar122 + fVar122);
            pfVar36[2] = fVar126 * ((1.0 - auVar77._8_4_ * fVar127) * fVar127 + fVar127);
            pfVar36[3] = fVar128 * ((1.0 - auVar77._12_4_ * fVar129) * fVar129 + fVar129);
            pfVar38 = pfVar38 + 4;
            pfVar36 = pfVar36 + 4;
          }
          pauVar27 = pauVar27 + 1;
        }
        return 0;
      }
      if (iVar4 == 1) {
        ncnn::Mat::create(this_02,uVar29,sVar6,_elempack,opt->blob_allocator);
        pvVar9 = this_02->data;
        if (pvVar9 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar7 = this_01[1].data;
        fVar56 = 1.0 / *this_01->data;
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        lVar25 = 0;
        while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
          pfVar36 = (float *)((long)pvVar7 + lVar25);
          fVar122 = pfVar36[1];
          fVar127 = pfVar36[2];
          fVar129 = pfVar36[3];
          pfVar38 = (float *)((long)pvVar9 + lVar25);
          *pfVar38 = *pfVar36 * fVar56;
          pfVar38[1] = fVar122 * fVar56;
          pfVar38[2] = fVar127 * fVar56;
          pfVar38[3] = fVar129 * fVar56;
          lVar25 = lVar25 + 0x10;
        }
        return 0;
      }
      if (iVar4 != 2) {
        if (iVar4 != 3) {
          return 0;
        }
        ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        fVar56 = 1.0 / *this_01->data;
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar30 < 1) {
          uVar30 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar10 + lVar25);
            fVar122 = pfVar36[1];
            fVar127 = pfVar36[2];
            fVar129 = pfVar36[3];
            pfVar38 = (float *)(uVar11 + lVar25);
            *pfVar38 = *pfVar36 * fVar56;
            pfVar38[1] = fVar122 * fVar56;
            pfVar38[2] = fVar127 * fVar56;
            pfVar38[3] = fVar129 * fVar56;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar29,uVar31,sVar6,_elempack,opt->blob_allocator);
      pvVar9 = this_02->data;
      if (pvVar9 == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      pvVar7 = this_01[1].data;
      fVar56 = 1.0 / *this_01->data;
      if ((int)uVar23 < 1) {
        uVar23 = 0;
      }
      lVar25 = 0;
      while (bVar45 = uVar23 != 0, uVar23 = uVar23 - 1, bVar45) {
        pfVar36 = (float *)((long)pvVar7 + lVar25);
        fVar122 = pfVar36[1];
        fVar127 = pfVar36[2];
        fVar129 = pfVar36[3];
        pfVar38 = (float *)((long)pvVar9 + lVar25);
        *pfVar38 = *pfVar36 * fVar56;
        pfVar38[1] = fVar122 * fVar56;
        pfVar38[2] = fVar127 * fVar56;
        pfVar38[3] = fVar129 * fVar56;
        lVar25 = lVar25 + 0x10;
      }
      return 0;
    }
    uVar42 = this_01->h;
    uVar28 = uVar42 * uVar35;
    if (iVar4 != 2) {
      if (iVar4 != 3) {
        return 0;
      }
      uVar41 = this_01->c;
      uVar44 = (ulong)uVar41;
      if (this_01[1].dims != 3) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims == 1) {
          if (_elempack == 1 && this_01[1].w == 1) {
            fVar56 = *this_00->data;
            if ((int)uVar28 < 1) {
              uVar28 = 0;
            }
            if ((int)uVar41 < 1) {
              uVar41 = 0;
            }
            for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
              ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
              uVar10 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
              uVar11 = _b0._0_8_;
              ncnn::Mat::~Mat((Mat *)_b0);
              lVar25 = 0;
              uVar29 = uVar28;
              while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
                auVar77 = *(undefined1 (*) [16])(uVar10 + lVar25);
                in_XMM1 = rcpps(in_XMM1,auVar77);
                fVar122 = fVar56 * in_XMM1._0_4_;
                fVar127 = fVar56 * in_XMM1._4_4_;
                fVar129 = fVar56 * in_XMM1._8_4_;
                fVar121 = fVar56 * in_XMM1._12_4_;
                auVar125._0_4_ = (fVar56 - auVar77._0_4_ * fVar122) * in_XMM1._0_4_ + fVar122;
                auVar125._4_4_ = (fVar56 - auVar77._4_4_ * fVar127) * in_XMM1._4_4_ + fVar127;
                auVar125._8_4_ = (fVar56 - auVar77._8_4_ * fVar129) * in_XMM1._8_4_ + fVar129;
                auVar125._12_4_ = (fVar56 - auVar77._12_4_ * fVar121) * in_XMM1._12_4_ + fVar121;
                *(undefined1 (*) [16])(uVar11 + lVar25) = auVar125;
                lVar25 = lVar25 + 0x10;
              }
            }
            return 0;
          }
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          if ((int)uVar41 < 1) {
            uVar44 = 0;
          }
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            ncnn::Mat::channel((Mat *)_b0,this_01,(int)uVar26);
            uVar21 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            puVar33 = (undefined8 *)((long)this_01[1].data + uVar26 * 0x10);
            uVar10 = *puVar33;
            uVar11 = puVar33[1];
            local_d8 = (float)uVar10;
            fStack_d4 = (float)((ulong)uVar10 >> 0x20);
            fStack_d0 = (float)uVar11;
            fStack_cc = (float)((ulong)uVar11 >> 0x20);
            ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
            uVar10 = _b0._0_8_;
            ncnn::Mat::~Mat((Mat *)_b0);
            lVar25 = 0;
            uVar35 = uVar28;
            while (bVar45 = uVar35 != 0, uVar35 = uVar35 - 1, bVar45) {
              auVar77 = *(undefined1 (*) [16])(uVar21 + lVar25);
              in_XMM1 = rcpps(in_XMM1,auVar77);
              fVar56 = local_d8 * in_XMM1._0_4_;
              fVar122 = fStack_d4 * in_XMM1._4_4_;
              fVar127 = fStack_d0 * in_XMM1._8_4_;
              fVar129 = fStack_cc * in_XMM1._12_4_;
              auVar70._0_4_ = (local_d8 - auVar77._0_4_ * fVar56) * in_XMM1._0_4_ + fVar56;
              auVar70._4_4_ = (fStack_d4 - auVar77._4_4_ * fVar122) * in_XMM1._4_4_ + fVar122;
              auVar70._8_4_ = (fStack_d0 - auVar77._8_4_ * fVar127) * in_XMM1._8_4_ + fVar127;
              auVar70._12_4_ = (fStack_cc - auVar77._12_4_ * fVar129) * in_XMM1._12_4_ + fVar129;
              *(undefined1 (*) [16])(uVar10 + lVar25) = auVar70;
              lVar25 = lVar25 + 0x10;
            }
          }
          return 0;
        }
        if (this_01[1].dims != 2) {
          return 0;
        }
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar44 = 0;
        }
        for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,(int)uVar26);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          pfVar38 = (float *)((long)this_01[1].w * uVar26 * this_01[1].elemsize +
                             (long)this_01[1].data);
          ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
          pfVar36 = (float *)_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar29 = 0; uVar29 != uVar42; uVar29 = uVar29 + 1) {
            fVar56 = *pfVar38;
            fVar122 = pfVar38[1];
            fVar127 = pfVar38[2];
            fVar129 = pfVar38[3];
            uVar31 = uVar35;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar77 = *pauVar27;
              in_XMM2 = rcpps(in_XMM2,auVar77);
              fVar121 = fVar56 * in_XMM2._0_4_;
              fVar126 = fVar122 * in_XMM2._4_4_;
              fVar128 = fVar127 * in_XMM2._8_4_;
              fVar130 = fVar129 * in_XMM2._12_4_;
              *pfVar36 = (fVar56 - auVar77._0_4_ * fVar121) * in_XMM2._0_4_ + fVar121;
              pfVar36[1] = (fVar122 - auVar77._4_4_ * fVar126) * in_XMM2._4_4_ + fVar126;
              pfVar36[2] = (fVar127 - auVar77._8_4_ * fVar128) * in_XMM2._8_4_ + fVar128;
              pfVar36[3] = (fVar129 - auVar77._12_4_ * fVar130) * in_XMM2._12_4_ + fVar130;
              pauVar27 = pauVar27 + 1;
              pfVar36 = pfVar36 + 4;
            }
            pfVar38 = pfVar38 + 4;
          }
        }
        return 0;
      }
      uVar24 = uVar30 ^ uVar41;
      if (((uVar29 ^ 1) == 0 && (uVar31 ^ 1) == 0) && uVar24 == 0) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          fVar56 = *(float *)uVar21;
          fVar122 = *(float *)(uVar21 + 4);
          fVar127 = *(float *)(uVar21 + 8);
          fVar129 = *(float *)(uVar21 + 0xc);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            auVar77 = *(undefined1 (*) [16])(uVar10 + lVar25);
            in_XMM2 = rcpps(in_XMM2,auVar77);
            fVar121 = fVar56 * in_XMM2._0_4_;
            fVar126 = fVar122 * in_XMM2._4_4_;
            fVar128 = fVar127 * in_XMM2._8_4_;
            fVar130 = fVar129 * in_XMM2._12_4_;
            pfVar36 = (float *)(uVar11 + lVar25);
            *pfVar36 = (fVar56 - auVar77._0_4_ * fVar121) * in_XMM2._0_4_ + fVar121;
            pfVar36[1] = (fVar122 - auVar77._4_4_ * fVar126) * in_XMM2._4_4_ + fVar126;
            pfVar36[2] = (fVar127 - auVar77._8_4_ * fVar128) * in_XMM2._8_4_ + fVar128;
            pfVar36[3] = (fVar129 - auVar77._12_4_ * fVar130) * in_XMM2._12_4_ + fVar130;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      if ((uVar29 == uVar35) && (_elempack == 1 && (uVar30 == 1 && uVar31 == uVar42))) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          pvVar9 = this_01[1].data;
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            auVar77 = *(undefined1 (*) [16])(uVar10 + lVar25 * 4);
            in_XMM1 = rcpps(in_XMM1,auVar77);
            fVar56 = *(float *)((long)pvVar9 + lVar25);
            fVar122 = fVar56 * in_XMM1._0_4_;
            fVar127 = fVar56 * in_XMM1._4_4_;
            fVar129 = fVar56 * in_XMM1._8_4_;
            fVar121 = fVar56 * in_XMM1._12_4_;
            auVar112._0_4_ = (fVar56 - auVar77._0_4_ * fVar122) * in_XMM1._0_4_ + fVar122;
            auVar112._4_4_ = (fVar56 - auVar77._4_4_ * fVar127) * in_XMM1._4_4_ + fVar127;
            auVar112._8_4_ = (fVar56 - auVar77._8_4_ * fVar129) * in_XMM1._8_4_ + fVar129;
            auVar112._12_4_ = (fVar56 - auVar77._12_4_ * fVar121) * in_XMM1._12_4_ + fVar121;
            *(undefined1 (*) [16])(uVar11 + lVar25 * 4) = auVar112;
            lVar25 = lVar25 + 4;
          }
        }
        return 0;
      }
      if (((uVar35 ^ 1) == 0 && (uVar42 ^ 1) == 0) && uVar24 == 0) {
        ncnn::Mat::create(this_02,uVar29,uVar31,uVar41,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          auVar77 = *(undefined1 (*) [16])uVar10;
          in_XMM2 = rcpps(in_XMM2,auVar77);
          fVar56 = in_XMM2._0_4_;
          fVar122 = in_XMM2._4_4_;
          fVar127 = in_XMM2._8_4_;
          fVar129 = in_XMM2._12_4_;
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar21 + lVar25);
            fVar121 = pfVar36[1];
            fVar126 = pfVar36[2];
            fVar128 = pfVar36[3];
            pfVar38 = (float *)(uVar11 + lVar25);
            *pfVar38 = *pfVar36 * ((1.0 - auVar77._0_4_ * fVar56) * fVar56 + fVar56);
            pfVar38[1] = fVar121 * ((1.0 - auVar77._4_4_ * fVar122) * fVar122 + fVar122);
            pfVar38[2] = fVar126 * ((1.0 - auVar77._8_4_ * fVar127) * fVar127 + fVar127);
            pfVar38[3] = fVar128 * ((1.0 - auVar77._12_4_ * fVar129) * fVar129 + fVar129);
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      if ((((uVar29 == uVar35) && (iVar22 == 1)) && (uVar31 == uVar42)) && (uVar41 == 1)) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar30,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar23 < 1) {
          uVar23 = 0;
        }
        if ((int)uVar30 < 1) {
          uVar30 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar30; uVar35 = uVar35 + 1) {
          pvVar9 = this_01->data;
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar23;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            pfVar36 = (float *)(uVar10 + lVar25 * 4);
            fVar56 = 1.0 / *(float *)((long)pvVar9 + lVar25);
            auVar77._0_4_ = fVar56 * *pfVar36;
            auVar77._4_4_ = fVar56 * pfVar36[1];
            auVar77._8_4_ = fVar56 * pfVar36[2];
            auVar77._12_4_ = fVar56 * pfVar36[3];
            *(undefined1 (*) [16])(uVar11 + lVar25 * 4) = auVar77;
            lVar25 = lVar25 + 4;
          }
        }
        return 0;
      }
      if ((((uVar29 ^ 1) == 0 && (uVar31 ^ uVar42) == 0) && uVar24 == 0) && uVar35 != 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        uVar44 = (ulong)uVar42;
        if ((int)uVar42 < 1) {
          uVar44 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar29 = 0; uVar29 != uVar41; uVar29 = uVar29 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar29);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar29);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar29);
          pfVar36 = (float *)_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            pfVar38 = (float *)(uVar10 + uVar26 * 0x10);
            fVar56 = *pfVar38;
            fVar122 = pfVar38[1];
            fVar127 = pfVar38[2];
            fVar129 = pfVar38[3];
            uVar31 = uVar35;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar77 = *pauVar27;
              in_XMM2 = rcpps(in_XMM2,auVar77);
              fVar121 = fVar56 * in_XMM2._0_4_;
              fVar126 = fVar122 * in_XMM2._4_4_;
              fVar128 = fVar127 * in_XMM2._8_4_;
              fVar130 = fVar129 * in_XMM2._12_4_;
              *pfVar36 = (fVar56 - auVar77._0_4_ * fVar121) * in_XMM2._0_4_ + fVar121;
              pfVar36[1] = (fVar122 - auVar77._4_4_ * fVar126) * in_XMM2._4_4_ + fVar126;
              pfVar36[2] = (fVar127 - auVar77._8_4_ * fVar128) * in_XMM2._8_4_ + fVar128;
              pfVar36[3] = (fVar129 - auVar77._12_4_ * fVar130) * in_XMM2._12_4_ + fVar130;
              pauVar27 = pauVar27 + 1;
              pfVar36 = pfVar36 + 4;
            }
          }
        }
        return 0;
      }
      if ((((uVar31 ^ 1) == 0 && (uVar29 ^ uVar35) == 0) && uVar24 == 0) && uVar42 != 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar26 = (ulong)uVar35;
        if ((int)uVar35 < 1) {
          uVar26 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar44 = 0;
        }
        for (iVar22 = 0; iVar22 != (int)uVar44; iVar22 = iVar22 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,iVar22);
          lVar25 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,iVar22);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,iVar22);
          lVar34 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar35 = 0; uVar35 != uVar42; uVar35 = uVar35 + 1) {
            for (lVar32 = 0; uVar26 * 0x10 != lVar32; lVar32 = lVar32 + 0x10) {
              auVar77 = *(undefined1 (*) [16])(lVar25 + lVar32);
              in_XMM1 = rcpps(in_XMM1,auVar77);
              pfVar36 = (float *)(uVar10 + lVar32);
              fVar56 = *pfVar36 * in_XMM1._0_4_;
              fVar122 = pfVar36[1] * in_XMM1._4_4_;
              fVar127 = pfVar36[2] * in_XMM1._8_4_;
              fVar129 = pfVar36[3] * in_XMM1._12_4_;
              auVar116._0_4_ = (*pfVar36 - auVar77._0_4_ * fVar56) * in_XMM1._0_4_ + fVar56;
              auVar116._4_4_ = (pfVar36[1] - auVar77._4_4_ * fVar122) * in_XMM1._4_4_ + fVar122;
              auVar116._8_4_ = (pfVar36[2] - auVar77._8_4_ * fVar127) * in_XMM1._8_4_ + fVar127;
              auVar116._12_4_ = (pfVar36[3] - auVar77._12_4_ * fVar129) * in_XMM1._12_4_ + fVar129;
              *(undefined1 (*) [16])(lVar34 + lVar32) = auVar116;
            }
            lVar25 = lVar25 + lVar32;
            lVar34 = lVar34 + lVar32;
          }
        }
        return 0;
      }
      if ((((uVar35 ^ 1) == 0 && (uVar31 ^ uVar42) == 0) && uVar24 == 0) && uVar29 != 1) {
        ncnn::Mat::create(this_02,uVar29,uVar42,uVar41,sVar6,_elempack,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        uVar44 = (ulong)uVar42;
        if ((int)uVar42 < 1) {
          uVar44 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          pfVar36 = (float *)_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          pauVar27 = (undefined1 (*) [16])_b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
            auVar77 = *(undefined1 (*) [16])(uVar10 + uVar26 * 0x10);
            in_XMM2 = rcpps(in_XMM2,auVar77);
            fVar56 = in_XMM2._0_4_;
            fVar122 = in_XMM2._4_4_;
            fVar127 = in_XMM2._8_4_;
            fVar129 = in_XMM2._12_4_;
            uVar31 = uVar29;
            while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
              auVar99._0_4_ = *pfVar36 * ((1.0 - auVar77._0_4_ * fVar56) * fVar56 + fVar56);
              auVar99._4_4_ = pfVar36[1] * ((1.0 - auVar77._4_4_ * fVar122) * fVar122 + fVar122);
              auVar99._8_4_ = pfVar36[2] * ((1.0 - auVar77._8_4_ * fVar127) * fVar127 + fVar127);
              auVar99._12_4_ = pfVar36[3] * ((1.0 - auVar77._12_4_ * fVar129) * fVar129 + fVar129);
              *pauVar27 = auVar99;
              pfVar36 = pfVar36 + 4;
              pauVar27 = pauVar27 + 1;
            }
          }
        }
        return 0;
      }
      if ((((uVar29 ^ uVar35) != 0 || (uVar42 ^ 1) != 0) || uVar24 != 0) || uVar31 == 1) {
        ncnn::Mat::create(this_02,uVar35,uVar42,uVar41,sVar5,iVar22,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (uVar35 = 0; uVar35 != uVar41; uVar35 = uVar35 + 1) {
          ncnn::Mat::channel((Mat *)_b0,this_01,uVar35);
          uVar10 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_00,uVar35);
          uVar11 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          ncnn::Mat::channel((Mat *)_b0,this_02,uVar35);
          uVar21 = _b0._0_8_;
          ncnn::Mat::~Mat((Mat *)_b0);
          lVar25 = 0;
          uVar29 = uVar28;
          while (bVar45 = uVar29 != 0, uVar29 = uVar29 - 1, bVar45) {
            auVar77 = *(undefined1 (*) [16])(uVar10 + lVar25);
            in_XMM1 = rcpps(in_XMM1,auVar77);
            pfVar36 = (float *)(uVar11 + lVar25);
            fVar56 = *pfVar36 * in_XMM1._0_4_;
            fVar122 = pfVar36[1] * in_XMM1._4_4_;
            fVar127 = pfVar36[2] * in_XMM1._8_4_;
            fVar129 = pfVar36[3] * in_XMM1._12_4_;
            auVar120._0_4_ = (*pfVar36 - auVar77._0_4_ * fVar56) * in_XMM1._0_4_ + fVar56;
            auVar120._4_4_ = (pfVar36[1] - auVar77._4_4_ * fVar122) * in_XMM1._4_4_ + fVar122;
            auVar120._8_4_ = (pfVar36[2] - auVar77._8_4_ * fVar127) * in_XMM1._8_4_ + fVar127;
            auVar120._12_4_ = (pfVar36[3] - auVar77._12_4_ * fVar129) * in_XMM1._12_4_ + fVar129;
            *(undefined1 (*) [16])(uVar21 + lVar25) = auVar120;
            lVar25 = lVar25 + 0x10;
          }
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar35,uVar31,uVar41,sVar6,_elempack,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      uVar26 = (ulong)uVar35;
      if ((int)uVar35 < 1) {
        uVar26 = 0;
      }
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      if ((int)uVar41 < 1) {
        uVar44 = 0;
      }
      for (iVar22 = 0; local_e8 = (int)uVar44, iVar22 != local_e8; iVar22 = iVar22 + 1) {
        ncnn::Mat::channel((Mat *)_b0,this_01,iVar22);
        uVar10 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_00,iVar22);
        lVar25 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_02,iVar22);
        lVar34 = _b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          for (lVar32 = 0; uVar26 * 0x10 != lVar32; lVar32 = lVar32 + 0x10) {
            auVar77 = *(undefined1 (*) [16])(uVar10 + lVar32);
            in_XMM1 = rcpps(in_XMM1,auVar77);
            pfVar36 = (float *)(lVar25 + lVar32);
            fVar56 = *pfVar36 * in_XMM1._0_4_;
            fVar122 = pfVar36[1] * in_XMM1._4_4_;
            fVar127 = pfVar36[2] * in_XMM1._8_4_;
            fVar129 = pfVar36[3] * in_XMM1._12_4_;
            auVar119._0_4_ = (*pfVar36 - auVar77._0_4_ * fVar56) * in_XMM1._0_4_ + fVar56;
            auVar119._4_4_ = (pfVar36[1] - auVar77._4_4_ * fVar122) * in_XMM1._4_4_ + fVar122;
            auVar119._8_4_ = (pfVar36[2] - auVar77._8_4_ * fVar127) * in_XMM1._8_4_ + fVar127;
            auVar119._12_4_ = (pfVar36[3] - auVar77._12_4_ * fVar129) * in_XMM1._12_4_ + fVar129;
            *(undefined1 (*) [16])(lVar34 + lVar32) = auVar119;
          }
          lVar25 = lVar25 + lVar32;
          lVar34 = lVar34 + lVar32;
        }
      }
      return 0;
    }
    if (this_01[1].dims == 3) {
      ncnn::Mat::create(this_02,uVar29,uVar31,uVar30,sVar6,_elempack,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      if ((int)uVar29 < 1) {
        uVar29 = 0;
      }
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      uVar44 = (ulong)uVar30;
      if ((int)uVar30 < 1) {
        uVar44 = 0;
      }
      for (uVar26 = 0; uVar26 != uVar44; uVar26 = uVar26 + 1) {
        pauVar40 = (undefined1 (*) [16])
                   ((long)this_01->w * uVar26 * this_01->elemsize + (long)this_01->data);
        ncnn::Mat::channel((Mat *)_b0,this_00,(int)uVar26);
        pfVar36 = (float *)_b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        ncnn::Mat::channel((Mat *)_b0,this_02,(int)uVar26);
        pauVar27 = (undefined1 (*) [16])_b0._0_8_;
        ncnn::Mat::~Mat((Mat *)_b0);
        for (uVar35 = 0; uVar35 != uVar31; uVar35 = uVar35 + 1) {
          auVar77 = *pauVar40;
          in_XMM2 = rcpps(in_XMM2,auVar77);
          fVar56 = in_XMM2._0_4_;
          fVar122 = in_XMM2._4_4_;
          fVar127 = in_XMM2._8_4_;
          fVar129 = in_XMM2._12_4_;
          uVar30 = uVar29;
          while (bVar45 = uVar30 != 0, uVar30 = uVar30 - 1, bVar45) {
            auVar64._0_4_ = *pfVar36 * ((1.0 - auVar77._0_4_ * fVar56) * fVar56 + fVar56);
            auVar64._4_4_ = pfVar36[1] * ((1.0 - auVar77._4_4_ * fVar122) * fVar122 + fVar122);
            auVar64._8_4_ = pfVar36[2] * ((1.0 - auVar77._8_4_ * fVar127) * fVar127 + fVar127);
            auVar64._12_4_ = pfVar36[3] * ((1.0 - auVar77._12_4_ * fVar129) * fVar129 + fVar129);
            *pauVar27 = auVar64;
            pfVar36 = pfVar36 + 4;
            pauVar27 = pauVar27 + 1;
          }
          pauVar40 = pauVar40 + 1;
        }
      }
      return 0;
    }
    ncnn::Mat::create(this_02,uVar35,uVar42,sVar5,iVar22,opt->blob_allocator);
    pvVar9 = this_02->data;
    if ((pvVar9 != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) {
      if (this_01[1].dims != 1) {
        if (this_01[1].dims != 2) {
          return 0;
        }
        pvVar7 = this_01->data;
        pvVar8 = this_01[1].data;
        if ((int)uVar28 < 1) {
          uVar28 = 0;
        }
        lVar25 = 0;
        while (bVar45 = uVar28 != 0, uVar28 = uVar28 - 1, bVar45) {
          auVar77 = *(undefined1 (*) [16])((long)pvVar7 + lVar25);
          in_XMM1 = rcpps(in_XMM1,auVar77);
          pfVar36 = (float *)((long)pvVar8 + lVar25);
          fVar56 = pfVar36[1];
          fVar122 = pfVar36[2];
          fVar127 = pfVar36[3];
          fVar129 = *pfVar36 * in_XMM1._0_4_;
          fVar121 = fVar56 * in_XMM1._4_4_;
          fVar126 = fVar122 * in_XMM1._8_4_;
          fVar128 = fVar127 * in_XMM1._12_4_;
          pfVar38 = (float *)((long)pvVar9 + lVar25);
          *pfVar38 = (*pfVar36 - auVar77._0_4_ * fVar129) * in_XMM1._0_4_ + fVar129;
          pfVar38[1] = (fVar56 - auVar77._4_4_ * fVar121) * in_XMM1._4_4_ + fVar121;
          pfVar38[2] = (fVar122 - auVar77._8_4_ * fVar126) * in_XMM1._8_4_ + fVar126;
          pfVar38[3] = (fVar127 - auVar77._12_4_ * fVar128) * in_XMM1._12_4_ + fVar128;
          lVar25 = lVar25 + 0x10;
        }
        return 0;
      }
      ncnn::Mat::create(this_02,uVar35,uVar42,sVar5,iVar22,opt->blob_allocator);
      pfVar36 = (float *)this_02->data;
      if (pfVar36 != (float *)0x0) {
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (_elempack == 1 && this_01[1].w == 1) {
          pvVar9 = this_01->data;
          fVar56 = *this_01[1].data;
          if ((int)uVar28 < 1) {
            uVar28 = 0;
          }
          lVar25 = 0;
          while (bVar45 = uVar28 != 0, uVar28 = uVar28 - 1, bVar45) {
            auVar77 = *(undefined1 (*) [16])((long)pvVar9 + lVar25);
            in_XMM2 = rcpps(in_XMM2,auVar77);
            fVar122 = fVar56 * in_XMM2._0_4_;
            fVar127 = fVar56 * in_XMM2._4_4_;
            fVar129 = fVar56 * in_XMM2._8_4_;
            fVar121 = fVar56 * in_XMM2._12_4_;
            pfVar38 = (float *)((long)pfVar36 + lVar25);
            *pfVar38 = (fVar56 - auVar77._0_4_ * fVar122) * in_XMM2._0_4_ + fVar122;
            pfVar38[1] = (fVar56 - auVar77._4_4_ * fVar127) * in_XMM2._4_4_ + fVar127;
            pfVar38[2] = (fVar56 - auVar77._8_4_ * fVar129) * in_XMM2._8_4_ + fVar129;
            pfVar38[3] = (fVar56 - auVar77._12_4_ * fVar121) * in_XMM2._12_4_ + fVar121;
            lVar25 = lVar25 + 0x10;
          }
          return 0;
        }
        pauVar27 = (undefined1 (*) [16])this_01->data;
        pfVar38 = (float *)this_01[1].data;
        if ((int)uVar35 < 1) {
          uVar35 = 0;
        }
        if ((int)uVar42 < 1) {
          uVar42 = 0;
        }
        for (uVar29 = 0; uVar29 != uVar42; uVar29 = uVar29 + 1) {
          fVar56 = *pfVar38;
          fVar122 = pfVar38[1];
          fVar127 = pfVar38[2];
          fVar129 = pfVar38[3];
          uVar31 = uVar35;
          while (bVar45 = uVar31 != 0, uVar31 = uVar31 - 1, bVar45) {
            auVar77 = *pauVar27;
            in_XMM2 = rcpps(in_XMM2,auVar77);
            fVar121 = fVar56 * in_XMM2._0_4_;
            fVar126 = fVar122 * in_XMM2._4_4_;
            fVar128 = fVar127 * in_XMM2._8_4_;
            fVar130 = fVar129 * in_XMM2._12_4_;
            *pfVar36 = (fVar56 - auVar77._0_4_ * fVar121) * in_XMM2._0_4_ + fVar121;
            pfVar36[1] = (fVar122 - auVar77._4_4_ * fVar126) * in_XMM2._4_4_ + fVar126;
            pfVar36[2] = (fVar127 - auVar77._8_4_ * fVar128) * in_XMM2._8_4_ + fVar128;
            pfVar36[3] = (fVar129 - auVar77._12_4_ * fVar130) * in_XMM2._12_4_ + fVar130;
            pauVar27 = pauVar27 + 1;
            pfVar36 = pfVar36 + 4;
          }
          pfVar38 = pfVar38 + 4;
        }
        return 0;
      }
    }
  }
  return -100;
}

Assistant:

int BinaryOp_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if __SSE2__
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int elempack = bottom_blob.elempack;
    int elempack1 = bottom_blob1.elempack;

#if __AVX__
    if (elempack == 8 || elempack1 == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack8<binary_op_add_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack8<binary_op_sub_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack8<binary_op_mul_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack8<binary_op_div_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack8<binary_op_max_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack8<binary_op_min_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack8<binary_op_pow_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack8<binary_op_rsub_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack8<binary_op_rdiv_pack8>(bottom_blob, bottom_blob1, top_blob, opt);
    }
#endif // __AVX__

    if (elempack == 4 || elempack1 == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack4<binary_op_add_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack4<binary_op_sub_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack4<binary_op_mul_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack4<binary_op_div_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack4<binary_op_max_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack4<binary_op_min_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack4<binary_op_pow_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack4<binary_op_rsub_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack4<binary_op_rdiv_pack4>(bottom_blob, bottom_blob1, top_blob, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward(bottom_blobs, top_blobs, opt);
}